

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvodePreconditioner.cpp
# Opt level: O2

int pele::physics::reactions::cvode::Precond_custom
              (Real param_1,N_Vector u,N_Vector param_3,int jok,int *jcurPtr,Real gamma,
              void *user_data)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  double *pdVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  double dVar49;
  double dVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined8 uVar84;
  undefined8 uVar85;
  Real RVar86;
  Real RVar87;
  Real RVar88;
  int i;
  realtype *prVar89;
  long lVar90;
  double *pdVar91;
  double *pdVar92;
  double *pdVar93;
  Real *pRVar94;
  uint uVar95;
  long lVar96;
  long lVar97;
  int tid;
  ulong uVar98;
  long lVar99;
  int iVar100;
  int iVar101;
  ulong uVar102;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dc_13;
  undefined4 extraout_XMM0_Dc_14;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined4 extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  uint extraout_XMM0_Dd_11;
  undefined4 extraout_XMM0_Dd_12;
  undefined4 uVar103;
  uint extraout_XMM0_Dd_13;
  undefined4 extraout_XMM0_Dd_14;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined4 uVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  Real T_1;
  Real invT;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dStack_b20;
  double dStack_b10;
  double dStack_b00;
  double local_ae8;
  double dStack_ae0;
  double local_ac8;
  double dStack_aa0;
  double local_a98;
  double dStack_a80;
  undefined8 uStack_a60;
  double dStack_a50;
  double local_a48;
  double dStack_a40;
  double local_a08;
  double dStack_a00;
  double local_9d8;
  double dStack_9d0;
  double dStack_9b0;
  double dStack_9a0;
  double local_978 [13];
  undefined1 auStack_910 [16];
  double dStack_900;
  undefined1 local_8f8 [16];
  double local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  double local_8a0;
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  double local_858 [22];
  undefined1 local_7a8 [16];
  undefined1 local_798 [16];
  undefined1 local_788 [16];
  Real h_RT [21];
  double local_698;
  double dStack_690;
  Real T;
  double local_678;
  double dStack_670;
  double local_648 [4];
  undefined1 auStack_628 [16];
  double local_618;
  double dStack_610;
  double local_608;
  double dStack_600;
  double local_5f8;
  double dStack_5f0;
  double local_5e8;
  double dStack_5e0;
  double local_5d8;
  double dStack_5d0;
  double local_5c8;
  double dStack_5c0;
  double local_5b8;
  double dStack_5b0;
  double local_5a8;
  undefined1 local_598 [16];
  undefined1 local_588 [16];
  undefined1 local_578 [16];
  double local_560;
  undefined1 local_558 [16];
  undefined1 local_548 [16];
  undefined1 local_538 [16];
  double local_520;
  double local_518;
  int local_50c;
  double local_508;
  undefined8 uStack_500;
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  double local_4d8;
  undefined8 uStack_4d0;
  realtype *local_4c8;
  long *local_4c0;
  Real c_R [21];
  Real dcRdT [21];
  undefined1 local_2e8 [16];
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  double dStack_2c0;
  double local_2b8;
  double dStack_2b0;
  double local_2a8;
  double dStack_2a0;
  double local_298;
  double dStack_290;
  double local_288;
  double dStack_280;
  double local_278;
  double dStack_270;
  double local_268;
  double dStack_260;
  double local_258;
  double local_250;
  double local_248;
  double local_238 [22];
  Real massfrac [21];
  Real activity [21];
  
  local_4e8._8_4_ = in_XMM1_Dc;
  local_4e8._0_8_ = gamma;
  local_4e8._12_4_ = in_XMM1_Dd;
  prVar89 = N_VGetArrayPointer(u);
  uVar1 = *(uint *)((long)user_data + 8);
  local_50c = *(int *)((long)user_data + 0x14);
  lVar3 = *(long *)((long)user_data + 0xa0);
  local_4c0 = *(long **)((long)user_data + 0x80);
  plVar4 = *(long **)((long)user_data + 0x90);
  lVar5 = *(long *)((long)user_data + 0x68);
  local_238[0] = 2.016;
  local_238[1] = 1.008;
  local_238[2] = 15.999;
  local_238[3] = 31.998;
  local_238[4] = 17.007;
  local_238[5] = 18.015;
  local_238[6] = 33.006;
  local_238[7] = 14.027;
  local_238[8] = 14.027;
  local_238[9] = 15.035;
  local_238[10] = 16.043;
  local_238[0xb] = 28.01;
  local_238[0xc] = 44.009;
  local_238[0xd] = 29.018;
  local_238[0xe] = 30.026;
  local_238[0xf] = 31.034;
  local_238[0x10] = 28.054;
  local_238[0x11] = 29.062;
  local_238[0x12] = 30.07;
  local_238[0x13] = 28.014;
  local_238[0x14] = 39.95;
  dVar121 = (double)local_4e8._0_8_;
  if (jok == 0) {
    uVar98 = 0;
    uVar102 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar102 = uVar98;
    }
    local_a98 = 0.0;
    local_4c8 = prVar89;
    for (; uVar98 != uVar102; uVar98 = uVar98 + 1) {
      dVar121 = 0.0;
      for (lVar90 = 0; lVar90 != 0x15; lVar90 = lVar90 + 1) {
        dVar121 = dVar121 + local_4c8[lVar90];
      }
      memset(massfrac,0,0xa8);
      for (lVar90 = 0; lVar90 != 0x15; lVar90 = lVar90 + 1) {
        massfrac[lVar90] = local_4c8[lVar90] * (1.0 / dVar121);
      }
      dVar49 = prVar89[uVar98 * 0x16 + 0x15];
      memset(activity,0,0xa8);
      local_978[0] = 0.49603174603174605;
      local_978[1] = 0.9920634920634921;
      local_978[2] = 0.06250390649415588;
      local_978[3] = 0.03125195324707794;
      local_978[4] = 0.05879931792791203;
      local_978[5] = 0.055509297807382736;
      local_978[6] = 0.030297521662727988;
      local_978[7] = 0.07129108148570615;
      local_978[8] = 0.07129108148570615;
      local_978[9] = 0.06651147322913202;
      local_978[10] = 0.06233248145608677;
      local_978[0xb] = 0.035701535166012134;
      local_978[0xc] = 0.022722624917630486;
      auStack_910._8_8_ = 0x3fa10d488e47ecc4;
      auStack_910._0_8_ = 0x3fa1a4eba7fd99b3;
      dStack_900 = 0.032222723464587225;
      local_8f8._8_8_ = 0x3fa19e14f6ff5920;
      local_8f8._0_8_ = 0x3fa24021df7a429e;
      local_8e8 = 0.03325573661456601;
      uStack_8e0 = 0x3fa246cdaf410bdd;
      local_8d8 = 0x3f99a1cd6070c7ee;
      for (lVar90 = 0; lVar90 != 0x15; lVar90 = lVar90 + 1) {
        activity[lVar90] = massfrac[lVar90] * dVar121 * local_978[lVar90];
      }
      if (ABS(dVar49 - local_a98) <= 1.0) {
        lVar90 = *(long *)(lVar3 + -8 + uVar98 * 8);
        lVar97 = *(long *)(lVar3 + uVar98 * 8);
        for (lVar96 = 0; lVar96 != 0x16; lVar96 = lVar96 + 1) {
          for (lVar99 = 0; lVar99 != 0xf20; lVar99 = lVar99 + 0xb0) {
            *(undefined8 *)(lVar97 + lVar99) = *(undefined8 *)(lVar90 + lVar99);
          }
          lVar97 = lVar97 + 8;
          lVar90 = lVar90 + 8;
        }
      }
      else {
        pdVar6 = *(double **)(lVar3 + uVar98 * 8);
        for (lVar90 = 0; lVar90 != 0x15; lVar90 = lVar90 + 1) {
          local_858[lVar90] = activity[lVar90] * 1000000.0;
        }
        for (lVar90 = 0; lVar90 != 0x1e4; lVar90 = lVar90 + 1) {
          pdVar6[lVar90] = 0.0;
        }
        for (lVar90 = 0; lVar90 != 0x15; lVar90 = lVar90 + 1) {
          local_978[lVar90] = 0.0;
        }
        dVar121 = log(dVar49);
        dVar131 = local_858[7];
        dVar137 = dVar49 * dVar49;
        dVar136 = dVar49 * dVar137;
        dVar135 = 1.0 / dVar49;
        dVar117 = 12186.6002121605 / dVar49;
        dVar123 = 0.0;
        for (lVar90 = 0; lVar90 != 0x15; lVar90 = lVar90 + 1) {
          dVar123 = dVar123 + local_858[lVar90];
        }
        local_508 = dVar49 * dVar136;
        uStack_500 = 0;
        if (1000.0 <= dVar49) {
          local_ac8 = local_508 * -1.00127688e-15 +
                      dVar136 * 1.496386616666667e-11 +
                      dVar137 * -8.324279633333333e-08 +
                      dVar49 * 2.470123655e-05 +
                      dVar121 * -3.3372792 + dVar135 * -950.158922 + 6.54230251;
          dStack_9d0 = local_508 * 2.33577197e-15 +
                       dVar136 * -4.9640387e-11 +
                       dVar137 * 4.978572466666667e-07 +
                       dVar49 * -0.003619950185 +
                       dVar121 * -2.28571772 + dVar135 * 16775.5843 + -6.19435407;
          local_9d8 = local_508 * -2.490986785e-23 +
                      dVar136 * 3.945960291666667e-19 +
                      dVar137 * -2.692699133333334e-15 +
                      dVar49 * 1.154214865e-11 +
                      dVar121 * -2.50000001 + dVar135 * 25473.6599 + 2.946682924;
          dStack_a40 = local_508 * 2.667543555e-15 +
                       dVar136 * -4.909681483333334e-11 +
                       dVar137 * 4.140760216666667e-07 +
                       dVar49 * -0.00247847763 +
                       dVar121 * -2.77217438 + dVar135 * 4011.91815 + -7.02617054;
          local_a48 = local_508 * -5.8706188e-16 +
                      dVar136 * 7.3288463e-12 +
                      dVar137 * -2.108420466666667e-08 +
                      dVar49 * -0.000274214858 +
                      dVar121 * -3.09288767 + dVar135 * 3858.657 + -1.38380843;
          local_678 = local_508 * 4.419278200000001e-15 +
                      dVar136 * -8.386767666666666e-11 +
                      dVar137 * 7.370980216666666e-07 +
                      dVar49 * -0.00460000041 +
                      dVar121 * -1.76069008 + dVar135 * -13995.8323 + -11.89563292;
          dStack_670 = local_508 * 1.01823858e-15 +
                       dVar136 * -1.9171084e-11 +
                       dVar137 * 1.664709618333334e-07 +
                       dVar49 * -0.001031263715 +
                       dVar121 * -2.71518561 + dVar135 * -14151.8724 + -5.10350211;
          local_878._0_8_ =
               local_508 * 9.38637835e-16 +
               dVar136 * -2.168162908333333e-11 +
               dVar137 * 2.348243283333333e-07 +
               dVar49 * -0.00182819646 + dVar121 * -2.87410113 + dVar135 * 46263.604 + -3.29709211;
          local_878._8_8_ =
               local_508 * 1.08358897e-15 +
               dVar136 * -1.745587958333333e-11 +
               dVar137 * 1.263277781666667e-07 +
               dVar49 * -0.00074154377 + dVar121 * -3.28253784 + dVar135 * -1088.45772 + -2.17069345
          ;
          dStack_ae0 = local_508 * 1.698581825e-15 +
                       dVar136 * -3.48255e-11 +
                       dVar137 * 3.353199116666667e-07 +
                       dVar49 * -0.002327943185 +
                       dVar121 * -2.29203842 + dVar135 * 50925.9997 + -6.33446327;
          local_ae8 = local_508 * -6.141684549999999e-17 +
                      dVar136 * 8.348149916666666e-13 +
                      dVar137 * -6.991409816666667e-09 +
                      dVar49 * 4.298705685e-05 +
                      dVar121 * -2.56942078 + dVar135 * 29217.5791 + -2.214917859999999;
          local_a08 = local_508 * 5.39542675e-16 +
                      dVar136 * -9.520530833333334e-12 +
                      dVar137 * 1.056096916666667e-07 +
                      dVar49 * -0.001119910065 +
                      dVar121 * -4.0172109 + dVar135 * 111.856713 + 0.2321087500000001;
          dStack_a00 = local_508 * -8.4100496e-16 +
                       dVar136 * 8.08683225e-12 +
                       dVar137 * 2.734541966666666e-08 +
                       dVar49 * -0.00108845902 +
                       dVar121 * -3.03399249 + dVar135 * -30004.2971 + -1.93277761;
          local_698 = local_508 * 2.36042082e-15 +
                      dVar136 * -4.362418233333334e-11 +
                      dVar137 * 3.691356733333334e-07 +
                      dVar49 * -0.00220718513 +
                      dVar121 * -3.85746029 + dVar135 * -48759.166 + 1.58582223;
          dStack_690 = local_508 * 5.0907615e-15 +
                       dVar136 * -1.019104458333333e-10 +
                       dVar137 * 9.554763483333333e-07 +
                       dVar49 * -0.00669547335 +
                       dVar121 * -0.074851495 + dVar135 * -9468.34459 + -18.362466505;
          dVar50 = local_508 * 1.056308e-15 +
                   dVar136 * -3.287025833333333e-11 +
                   dVar137 * 4.427306666666667e-07 +
                   dVar49 * -0.0039357485 + dVar121 * -3.770799 + dVar135 * 127.83252 + 0.841224;
          local_558._8_4_ = SUB84(dVar50,0);
          local_558._0_8_ =
               local_508 * 6.28530305e-15 +
               dVar136 * -1.226857691666667e-10 +
               dVar137 * 1.118463191666667e-06 +
               dVar49 * -0.00732270755 +
               dVar121 * -2.03611116 + dVar135 * 4939.88614 + -8.269258140000002;
          local_558._12_4_ = (int)((ulong)dVar50 >> 0x20);
          local_588._0_8_ =
               local_508 * 7.4820788e-15 +
               dVar136 * -1.460147408333333e-10 +
               dVar137 * 1.330344446666667e-06 +
               dVar49 * -0.0086986361 + dVar121 * -1.95465642 + dVar135 * 12857.52 + -11.50777788;
          local_578._0_8_ =
               local_508 * 9.5001445e-15 +
               dVar136 * -1.845100008333333e-10 +
               dVar137 * 1.67093445e-06 +
               dVar49 * -0.01084263385 + dVar121 * -1.0718815 + dVar135 * -11426.3932 + -14.0437292;
          dVar50 = dVar136 * -8.414198333333333e-12 +
                   dVar137 * 9.474600000000001e-08 +
                   dVar49 * -0.0007439884 + dVar121 * -2.92664 + dVar135 * -922.7977 + -3.053888;
          dVar120 = local_508 * 3.3766755e-16;
        }
        else {
          local_ac8 = local_508 * 3.688058805e-13 +
                      dVar136 * -1.67976745e-09 +
                      dVar137 * 3.2463585e-06 +
                      dVar49 * -0.003990260375 +
                      dVar121 * -2.34433112 + dVar135 * -917.935173 + 1.661320882;
          dStack_9d0 = local_508 * -1.27192867e-13 +
                       dVar136 * 5.725978541666666e-10 +
                       dVar137 * -9.550364266666668e-07 +
                       dVar49 * -0.001005475875 +
                       dVar121 * -3.6735904 + dVar135 * 16444.9988 + 2.06902607;
          local_9d8 = local_508 * 4.63866166e-23 +
                      dVar136 * -1.917346933333333e-19 +
                      dVar137 * 3.326532733333333e-16 +
                      dVar49 * -3.526664095e-13 +
                      dVar121 * -2.5 + dVar135 * 25473.6599 + 2.946682853;
          dStack_a40 = local_508 * -2.168844325e-13 +
                       dVar136 * 1.109534108333333e-09 +
                       dVar137 * -2.296657433333333e-06 +
                       dVar49 * 0.00162196266 +
                       dVar121 * -4.22118584 + dVar135 * 3839.56496 + 0.8268134100000002;
          local_a48 = local_508 * -6.8205735e-14 +
                      dVar136 * 3.234277775e-10 +
                      dVar137 * -7.696564016666666e-07 +
                      dVar49 * 0.00120065876 +
                      dVar121 * -3.99201543 + dVar135 * 3615.08056 + 4.095940888;
          local_678 = local_508 * -6.5886326e-13 +
                      dVar136 * 3.160710508333333e-09 +
                      dVar137 * -6.220333466666666e-06 +
                      dVar49 * 0.004954166845 +
                      dVar121 * -4.79372315 + dVar135 * -14308.9567 + 4.19091025;
          dStack_670 = local_508 * 4.522122495e-14 +
                       dVar136 * -7.558382366666667e-11 +
                       dVar137 * -1.69469055e-07 +
                       dVar49 * 0.00030517684 +
                       dVar121 * -3.57953347 + dVar135 * -14344.086 + 0.07112418999999992;
          local_878._0_8_ =
               local_508 * -8.43708595e-14 +
               dVar136 * 3.209092941666667e-10 +
               dVar137 * -4.658164016666667e-07 +
               dVar49 * -0.0004844360715 + dVar121 * -3.76267867 + dVar135 * 46004.0401 + 2.20014682
          ;
          local_878._8_8_ =
               local_508 * -1.621864185e-13 +
               dVar136 * 8.067745908333334e-10 +
               dVar137 * -1.641217001666667e-06 +
               dVar49 * 0.00149836708 +
               dVar121 * -3.78245636 + dVar135 * -1063.94356 + 0.1247806300000001;
          dStack_ae0 = local_508 * -9.71573685e-14 +
                       dVar136 * 5.573466508333334e-10 +
                       dVar137 * -1.372160366666667e-06 +
                       dVar49 * 0.001183307095 +
                       dVar121 * -4.19860411 + dVar135 * 50496.8163 + 4.967723077;
          local_ae8 = local_508 * -1.056329855e-13 +
                      dVar136 * 5.106721866666666e-10 +
                      dVar137 * -1.107177326666667e-06 +
                      dVar49 * 0.00163965942 +
                      dVar121 * -3.1682671 + dVar135 * 29122.2592 + 1.11633364;
          local_a08 = local_508 * -4.646125620000001e-13 +
                      dVar136 * 2.02303245e-09 +
                      dVar137 * -3.526381516666666e-06 +
                      dVar49 * 0.002374560255 +
                      dVar121 * -4.30179801 + dVar135 * 294.80804 + 0.5851355599999999;
          dStack_a00 = local_508 * -8.85989085e-14 +
                       dVar136 * 4.57330885e-10 +
                       dVar137 * -1.086733685e-06 +
                       dVar49 * 0.00101821705 +
                       dVar121 * -4.19864056 + dVar135 * -30293.7267 + 5.047672768;
          local_698 = local_508 * 7.184977399999999e-15 +
                      dVar136 * -2.049325183333333e-10 +
                      dVar137 * 1.187260448333333e-06 +
                      dVar49 * -0.004492298385 +
                      dVar121 * -2.35677352 + dVar135 * -48371.9697 + -7.5442787;
          dStack_690 = local_508 * -8.3346978e-13 +
                       dVar136 * 4.039525216666667e-09 +
                       dVar137 * -8.19667665e-06 +
                       dVar49 * 0.0068354894 +
                       dVar121 * -5.14987613 + dVar135 * -10246.6476 + 9.791179889999999;
          dVar50 = local_508 * -1.037805e-13 +
                   dVar136 * 6.14803e-10 +
                   dVar137 * -8.897453333333333e-07 +
                   dVar49 * -0.0036082975 + dVar121 * -2.106204 + dVar135 * 978.6011 + -11.045973;
          local_558._8_4_ = SUB84(dVar50,0);
          local_558._0_8_ =
               local_508 * -1.349421865e-12 +
               dVar136 * 5.763239608333333e-09 +
               dVar137 * -9.516504866666667e-06 +
               dVar49 * 0.003785261235 +
               dVar121 * -3.95920148 + dVar135 * 5089.77593 + -0.1381294799999999;
          local_558._12_4_ = (int)((ulong)dVar50 >> 0x20);
          local_588._0_8_ =
               local_508 * -1.15254502e-12 +
               dVar136 * 4.992721716666666e-09 +
               dVar137 * -8.28571345e-06 +
               dVar49 * 0.00209329446 +
               dVar121 * -4.30646568 + dVar135 * 12841.6265 + -0.4007435600000004;
          local_578._0_8_ =
               local_508 * -1.343428855e-12 +
               dVar136 * 5.903885708333334e-09 +
               dVar137 * -9.990638133333334e-06 +
               dVar49 * 0.00275077135 + dVar121 * -4.29142492 + dVar135 * -11522.2055 + 1.62460176;
          dVar50 = dVar136 * -4.701262500000001e-10 +
                   dVar137 * 6.605369999999999e-07 +
                   dVar49 * -0.0007041202 +
                   dVar121 * -3.298677 + dVar135 * -1020.8999 + -0.6516950000000001;
          dVar120 = local_508 * 1.222427e-13;
        }
        dVar118 = dStack_a00;
        local_578._8_8_ = 0;
        local_588._8_8_ = 0;
        local_548._8_8_ = 0;
        local_548._0_8_ = dVar120 + dVar50;
        dVar50 = dVar135 * dVar135;
        dVar120 = 1.0 / dVar117;
        if (1000.0 <= dVar49) {
          h_RT[0] = dVar135 * -950.158922 +
                    local_508 * 4.00510752e-15 +
                    dVar136 * -4.48915985e-11 +
                    dVar137 * 1.66485593e-07 + dVar49 * -2.47012365e-05 + 3.3372792;
          h_RT[1] = dVar135 * 25473.6599 +
                    local_508 * 9.96394714e-23 +
                    dVar136 * -1.18378809e-18 +
                    dVar137 * 5.38539827e-15 + dVar49 * -1.15421486e-11 + 2.50000001;
          h_RT[2] = dVar135 * 29217.5791 +
                    local_508 * 2.45667382e-16 +
                    dVar136 * -2.50444497e-12 +
                    dVar137 * 1.39828196e-08 + dVar49 * -4.29870569e-05 + 2.56942078;
          h_RT[3] = dVar135 * -1088.45772 +
                    local_508 * -4.33435588e-15 +
                    dVar136 * 5.23676387e-11 +
                    dVar137 * -2.52655556e-07 + dVar49 * 0.00074154377 + 3.28253784;
          h_RT[4] = dVar135 * 3858.657 +
                    local_508 * 2.34824752e-15 +
                    dVar136 * -2.19865389e-11 +
                    dVar137 * 4.21684093e-08 + dVar49 * 0.000274214858 + 3.09288767;
          h_RT[5] = dVar135 * -30004.2971 +
                    local_508 * 3.36401984e-15 +
                    dVar136 * -2.42604967e-11 +
                    dVar137 * -5.46908393e-08 + dVar49 * 0.00108845902 + 3.03399249;
          h_RT[6] = dVar135 * 111.856713 +
                    local_508 * -2.1581707e-15 +
                    dVar136 * 2.85615925e-11 +
                    dVar137 * -2.11219383e-07 + dVar49 * 0.00111991006 + 4.0172109;
          h_RT[7] = dVar135 * 46263.604 +
                    local_508 * -3.75455134e-15 +
                    dVar136 * 6.50448872e-11 +
                    dVar137 * -4.69648657e-07 + dVar49 * 0.00182819646 + 2.87410113;
          h_RT[8] = dVar135 * 50925.9997 +
                    local_508 * -6.7943273e-15 +
                    dVar136 * 1.044765e-10 +
                    dVar137 * -6.70639823e-07 + dVar49 * 0.00232794318 + 2.29203842;
          h_RT[10] = dVar135 * -9468.34459 +
                     local_508 * -2.0363046e-14 +
                     dVar136 * 3.05731338e-10 +
                     dVar137 * -1.9109527e-06 + dVar49 * 0.00669547335 + 0.074851495;
          h_RT[0xb] = dVar135 * -14151.8724 +
                      local_508 * -4.07295432e-15 +
                      dVar136 * 5.7513252e-11 +
                      dVar137 * -3.32941924e-07 + dVar49 * 0.00103126372 + 2.71518561;
          h_RT[0xc] = dVar135 * -48759.166 +
                      local_508 * -9.44168328e-15 +
                      dVar136 * 1.30872547e-10 +
                      dVar137 * -7.38271347e-07 + dVar49 * 0.00220718513 + 3.85746029;
          h_RT[0xd] = dVar135 * 4011.91815 +
                      local_508 * -1.06701742e-14 +
                      dVar136 * 1.47290445e-10 +
                      dVar137 * -8.28152043e-07 + dVar49 * 0.00247847763 + 2.77217438;
          h_RT[0xe] = dVar135 * -13995.8323 +
                      local_508 * -1.76771128e-14 +
                      dVar136 * 2.5160303e-10 +
                      dVar137 * -1.47419604e-06 + dVar49 * 0.00460000041 + 1.76069008;
          h_RT[0xf] = dVar135 * 127.83252 +
                      local_508 * -4.225232e-15 +
                      dVar136 * 9.8610775e-11 +
                      dVar137 * -8.85461333e-07 + dVar49 * 0.0039357485 + 3.770799;
          h_RT[0x10] = dVar135 * 4939.88614 +
                       local_508 * -2.51412122e-14 +
                       dVar136 * 3.68057308e-10 +
                       dVar137 * -2.23692638e-06 + dVar49 * 0.00732270755 + 2.03611116;
          h_RT[0x11] = dVar135 * 12857.52 +
                       local_508 * -2.99283152e-14 +
                       dVar136 * 4.38044223e-10 +
                       dVar137 * -2.66068889e-06 + dVar49 * 0.0086986361 + 1.95465642;
          h_RT[0x12] = dVar135 * -11426.3932 +
                       local_508 * -3.8000578e-14 +
                       dVar136 * 5.53530003e-10 +
                       dVar137 * -3.3418689e-06 + dVar49 * 0.0108426339 + 1.0718815;
          dVar105 = local_508 * -1.3506702e-15 +
                    dVar136 * 2.5242595e-11 +
                    dVar137 * -1.89492e-07 + dVar49 * 0.0007439884 + 2.92664;
          dVar119 = local_508 * -9.34308788e-15 +
                    dVar136 * 1.48921161e-10 +
                    dVar137 * -9.95714493e-07 + dVar49 * 0.00361995018 + 2.28571772;
          dVar19 = -922.7977;
          dVar122 = 16775.5843;
        }
        else {
          h_RT[0] = dVar135 * -917.935173 +
                    local_508 * -1.47522352e-12 +
                    dVar136 * 5.03930235e-09 +
                    dVar137 * -6.492717e-06 + dVar49 * 0.00399026037 + 2.34433112;
          h_RT[1] = dVar135 * 25473.6599 +
                    local_508 * -1.85546466e-22 +
                    dVar136 * 5.7520408e-19 +
                    dVar137 * -6.65306547e-16 + dVar49 * 3.52666409e-13 + 2.5;
          h_RT[2] = dVar135 * 29122.2592 +
                    local_508 * 4.22531942e-13 +
                    dVar136 * -1.53201656e-09 +
                    dVar137 * 2.21435465e-06 + dVar49 * -0.00163965942 + 3.1682671;
          h_RT[3] = dVar135 * -1063.94356 +
                    local_508 * 6.48745674e-13 +
                    dVar136 * -2.42032377e-09 +
                    dVar137 * 3.282434e-06 + dVar49 * -0.00149836708 + 3.78245636;
          h_RT[4] = dVar135 * 3615.08056 +
                    local_508 * 2.7282294e-13 +
                    dVar136 * -9.70283332e-10 +
                    dVar137 * 1.5393128e-06 + dVar49 * -0.00120065876 + 3.99201543;
          h_RT[5] = dVar135 * -30293.7267 +
                    local_508 * 3.54395634e-13 +
                    dVar136 * -1.37199266e-09 +
                    dVar137 * 2.17346737e-06 + dVar49 * -0.00101821705 + 4.19864056;
          h_RT[6] = dVar135 * 294.80804 +
                    local_508 * 1.85845025e-12 +
                    dVar136 * -6.06909735e-09 +
                    dVar137 * 7.05276303e-06 + dVar49 * -0.00237456025 + 4.30179801;
          h_RT[7] = dVar135 * 46004.0401 +
                    local_508 * 3.37483438e-13 +
                    dVar136 * -9.62727883e-10 +
                    dVar137 * 9.31632803e-07 + dVar49 * 0.000484436072 + 3.76267867;
          h_RT[8] = dVar135 * 50496.8163 +
                    local_508 * 3.88629474e-13 +
                    dVar136 * -1.67203995e-09 +
                    dVar137 * 2.74432073e-06 + dVar49 * -0.0011833071 + 4.19860411;
          h_RT[10] = dVar135 * -10246.6476 +
                     local_508 * 3.33387912e-12 +
                     dVar136 * -1.21185757e-08 +
                     dVar137 * 1.63933533e-05 + dVar49 * -0.0068354894 + 5.14987613;
          h_RT[0xb] = dVar135 * -14344.086 +
                      local_508 * -1.808849e-13 +
                      dVar136 * 2.26751471e-10 +
                      dVar137 * 3.3893811e-07 + dVar49 * -0.00030517684 + 3.57953347;
          h_RT[0xc] = dVar135 * -48371.9697 +
                      local_508 * -2.87399096e-14 +
                      dVar136 * 6.14797555e-10 +
                      dVar137 * -2.3745209e-06 + dVar49 * 0.00449229839 + 2.35677352;
          h_RT[0xd] = dVar135 * 3839.56496 +
                      local_508 * 8.6753773e-13 +
                      dVar136 * -3.32860233e-09 +
                      dVar137 * 4.59331487e-06 + dVar49 * -0.00162196266 + 4.22118584;
          h_RT[0xe] = dVar135 * -14308.9567 +
                      local_508 * 2.63545304e-12 +
                      dVar136 * -9.48213152e-09 +
                      dVar137 * 1.24406669e-05 + dVar49 * -0.00495416684 + 4.79372315;
          h_RT[0xf] = dVar135 * 978.6011 +
                      local_508 * 4.15122e-13 +
                      dVar136 * -1.844409e-09 +
                      dVar137 * 1.77949067e-06 + dVar49 * 0.0036082975 + 2.106204;
          h_RT[0x10] = dVar135 * 5089.77593 +
                       local_508 * 5.39768746e-12 +
                       dVar136 * -1.72897188e-08 +
                       dVar137 * 1.90330097e-05 + dVar49 * -0.00378526124 + 3.95920148;
          h_RT[0x11] = dVar135 * 12841.6265 +
                       local_508 * 4.61018008e-12 +
                       dVar136 * -1.49781651e-08 +
                       dVar137 * 1.65714269e-05 + dVar49 * -0.00209329446 + 4.30646568;
          h_RT[0x12] = dVar135 * -11522.2055 +
                       local_508 * 5.37371542e-12 +
                       dVar136 * -1.77116571e-08 +
                       dVar137 * 1.99812763e-05 + dVar49 * -0.00275077135 + 4.29142492;
          dVar105 = local_508 * -4.889708e-13 +
                    dVar136 * 1.41037875e-09 +
                    dVar137 * -1.321074e-06 + dVar49 * 0.0007041202 + 3.298677;
          dVar119 = local_508 * 5.08771468e-13 +
                    dVar136 * -1.71779356e-09 +
                    dVar137 * 1.91007285e-06 + dVar49 * 0.00100547588 + 3.6735904;
          dVar19 = -1020.8999;
          dVar122 = 16444.9988;
        }
        h_RT[0x13] = dVar135 * dVar19 + dVar105;
        dVar119 = dVar135 * dVar122 + dVar119;
        local_4f8._8_8_ = 0;
        local_4f8._0_8_ =
             local_508 * -0.0 +
             dVar136 * -0.0 +
             dVar137 * -0.0 + dVar49 * -0.0 + dVar121 * -2.5 + dVar135 * -745.375 + -1.866;
        dVar19 = dVar49 * 0.0;
        dVar138 = dVar137 * 0.0;
        local_4d8 = dVar136 * 0.0;
        uStack_4d0 = 0;
        dVar139 = local_508 * 0.0;
        h_RT[0x14] = dVar135 * -745.375 + dVar19 + 2.5 + dVar138 + local_4d8 + dVar139;
        dVar122 = local_858[1] * local_858[7];
        dVar129 = dVar135 * -0.0;
        dVar105 = dVar121 * -0.8 + dVar129;
        local_538._8_4_ = extraout_XMM0_Dc;
        local_538._0_8_ = dVar105;
        local_538._12_4_ = extraout_XMM0_Dd;
        h_RT[9] = dVar119;
        local_868._0_8_ =
             local_858[0x14] * -0.30000000000000004 +
             local_858[0x12] + local_858[0x12] +
             local_858[0xb] * 0.5 + local_858[5] * 5.0 + local_858[0] + dVar123 + local_858[10] +
             local_858[0xc];
        local_888._0_8_ = h_RT[7];
        local_888._8_8_ = h_RT[7];
        dVar105 = exp(dVar105);
        dVar105 = dVar105 * 25000000000.0;
        dVar20 = dVar50 * 0.0;
        local_788._8_8_ = 0;
        local_788._0_8_ = dVar135 * -0.8 + dVar20;
        dVar108 = exp(dVar121 * -3.14 + dVar135 * -618.9564989398057);
        dVar108 = dVar108 * 3.2e+27 * (((double)local_868._0_8_ * 1e-12) / dVar105);
        dVar106 = ((dVar135 * -3.14 + dVar50 * 618.9564989398057) - (double)local_788._0_8_) *
                  0.43429448190325176;
        dVar134 = log10(dVar108);
        local_598._0_8_ = dVar134;
        dVar134 = exp(dVar49 / -78.0);
        local_868._0_8_ = dVar134 * 0.31999999999999995;
        dVar134 = exp(dVar49 / -1995.0);
        dVar124 = exp(dVar135 * -5590.0);
        dVar111 = (double)local_868._0_8_ + dVar134 * 0.68 + dVar124;
        local_798._0_8_ = dVar111;
        dVar111 = log10(dVar111);
        dVar114 = dVar111 * -1.27 + 0.75;
        dVar132 = dVar111 * -0.67 + -0.4 + (double)local_598._0_8_;
        dVar107 = 1.0 / (dVar132 * -0.14 + dVar114);
        dVar132 = dVar132 * dVar107;
        dVar130 = 1.0 / (dVar132 * dVar132 + 1.0);
        local_7a8._0_8_ = dVar111;
        local_898._0_8_ = dVar132;
        local_598._0_8_ = pow(10.0,dVar111 * dVar130);
        dVar132 = local_858[9];
        dVar111 = ((double)local_7a8._0_8_ + (double)local_7a8._0_8_) * dVar130 * dVar130 *
                  (double)local_898._0_8_ * dVar107;
        dVar107 = -dVar114 * dVar111 * dVar107;
        local_7a8._0_8_ =
             (dVar111 * (double)local_898._0_8_ * -1.27 + dVar107 * -0.67 + dVar130) *
             (dVar124 * 5590.0 * dVar50 +
             (dVar134 * 0.68) / -1995.0 + (double)local_868._0_8_ / -78.0) *
             (0.43429448190325176 / (double)local_798._0_8_) + dVar106 * dVar107 +
             dVar106 / (dVar108 + 1.0);
        dVar124 = local_9d8;
        local_868._8_4_ = local_9d8._8_4_;
        local_868._0_8_ = local_9d8._8_8_;
        local_868._12_4_ = local_9d8._12_4_;
        dVar134 = exp(((double)local_878._0_8_ + dVar124) - local_9d8._8_8_);
        dVar114 = local_858[10];
        dVar111 = local_858[9];
        dVar134 = dVar105 / (dVar134 * dVar120);
        dVar130 = (double)local_598._0_8_ * (dVar108 / (dVar108 + 1.0));
        dVar108 = (dVar105 * dVar122 - dVar132 * dVar134) * dVar130;
        local_978[1] = local_978[1] - dVar108;
        local_978[7] = local_978[7] - dVar108;
        local_978[9] = dVar108 + local_978[9];
        local_648[0] = 0.0;
        local_648[1] = dVar131 * dVar105 * dVar130 + 0.0;
        local_618 = 0.0;
        auStack_628 = ZEXT816(0);
        local_648[2] = 0.0;
        local_648[3] = 0.0;
        dStack_610 = dVar105 * dVar130 * local_858[1] + 0.0;
        local_608 = 0.0;
        dStack_600 = 0.0 - dVar134 * dVar130;
        local_5f8 = 0.0;
        dStack_5f0 = 0.0;
        local_5e8 = 0.0;
        dStack_5e0 = 0.0;
        local_5d8 = 0.0;
        dStack_5d0 = 0.0;
        local_5c8 = 0.0;
        dStack_5c0 = 0.0;
        local_5a8 = 0.0;
        local_5b8 = 0.0;
        dStack_5b0 = 0.0;
        pdVar93 = pdVar6 + 9;
        pdVar92 = pdVar93;
        for (lVar90 = 0; lVar90 != 0x15; lVar90 = lVar90 + 1) {
          pdVar92[-8] = pdVar92[-8] - local_648[lVar90];
          pdVar92[-2] = pdVar92[-2] - local_648[lVar90];
          *pdVar92 = local_648[lVar90] + *pdVar92;
          pdVar92 = pdVar92 + 0x16;
        }
        dVar131 = dVar130 * (dVar105 * (double)local_788._0_8_ * dVar122 +
                            -((double)local_788._0_8_ -
                             ((dVar119 - ((double)local_888._0_8_ + h_RT[1])) + 1.0) * dVar135) *
                            dVar134 * dVar132) +
                  (double)local_7a8._0_8_ * 2.302585092994046 * dVar108;
        pdVar6[0x1cf] = pdVar6[0x1cf] - dVar131;
        pdVar6[0x1d5] = pdVar6[0x1d5] - dVar131;
        pdVar6[0x1d7] = dVar131 + pdVar6[0x1d7];
        local_7a8._0_8_ =
             local_858[0x14] * -0.30000000000000004 +
             local_858[0x12] + local_858[0x12] +
             local_858[0xb] * 0.5 + local_858[5] * 5.0 + local_858[0] + dVar123 + local_858[10] +
             local_858[0xc];
        dVar131 = local_858[1] * local_858[9];
        dVar122 = exp(dVar121 * -0.63 + dVar135 * -192.73198300320777);
        dVar122 = dVar122 * 12700000000.0;
        dVar130 = dVar135 * -0.63 + dVar50 * 192.73198300320777;
        dVar105 = exp(dVar121 * -4.76 + dVar135 * -1227.8486645635169);
        dVar105 = dVar105 * 2.477e+33 * (((double)local_7a8._0_8_ * 1e-12) / dVar122);
        dVar109 = ((dVar135 * -4.76 + dVar50 * 1227.8486645635169) - dVar130) * 0.43429448190325176;
        local_598._8_8_ = 0;
        local_598._0_8_ = dVar109;
        dVar119 = log10(dVar105);
        dVar108 = exp(dVar49 / -74.0);
        local_888._0_8_ = dVar108 * 0.21699999999999997;
        dVar108 = exp(dVar49 / -2941.0);
        dVar134 = exp(dVar135 * -6964.0);
        local_898._0_8_ = (double)local_888._0_8_ + dVar108 * 0.783 + dVar134;
        local_7a8._0_8_ = log10((double)local_898._0_8_);
        dVar106 = (double)local_7a8._0_8_ * -1.27 + 0.75;
        dVar119 = (double)local_7a8._0_8_ * -0.67 + -0.4 + dVar119;
        local_798._0_8_ = 1.0 / (dVar119 * -0.14 + dVar106);
        dVar119 = dVar119 * (double)local_798._0_8_;
        dVar110 = 1.0 / (dVar119 * dVar119 + 1.0);
        dVar132 = pow(10.0,(double)local_7a8._0_8_ * dVar110);
        dVar107 = ((double)local_7a8._0_8_ + (double)local_7a8._0_8_) * dVar110 * dVar110 * dVar119
                  * (double)local_798._0_8_;
        dVar106 = -dVar106 * dVar107 * (double)local_798._0_8_;
        local_7a8._0_8_ =
             (dVar107 * dVar119 * -1.27 + dVar106 * -0.67 + dVar110) *
             (dVar134 * 6964.0 * dVar50 +
             (dVar108 * 0.783) / -2941.0 + (double)local_888._0_8_ / -74.0) *
             (0.43429448190325176 / (double)local_898._0_8_) + (double)local_598._0_8_ * dVar106 +
             dVar109 / (dVar105 + 1.0);
        dVar119 = exp(((double)local_868._0_8_ + dVar124) - dStack_690);
        dVar119 = dVar122 / (dVar119 * dVar120);
        dVar132 = dVar132 * (dVar105 / (dVar105 + 1.0));
        dVar105 = (dVar122 * dVar131 - dVar114 * dVar119) * dVar132;
        local_978[1] = local_978[1] - dVar105;
        local_978[9] = local_978[9] - dVar105;
        local_978[10] = dVar105 + local_978[10];
        local_648[0] = 0.0;
        local_648[1] = dVar111 * dVar122 * dVar132 + 0.0;
        local_618 = 0.0;
        dStack_610 = 0.0;
        auStack_628 = ZEXT816(0);
        local_608 = 0.0;
        local_648[2] = 0.0;
        local_648[3] = 0.0;
        dStack_600 = dVar122 * dVar132 * local_858[1] + 0.0;
        local_5f8 = 0.0 - dVar119 * dVar132;
        dStack_5b0 = 0.0;
        local_5a8 = 0.0;
        dStack_5c0 = 0.0;
        local_5b8 = 0.0;
        dStack_5d0 = 0.0;
        local_5c8 = 0.0;
        dStack_5e0 = 0.0;
        local_5d8 = 0.0;
        dStack_5f0 = 0.0;
        local_5e8 = 0.0;
        pdVar92 = pdVar6 + 10;
        for (lVar90 = 0; lVar90 != 0x15; lVar90 = lVar90 + 1) {
          pdVar92[-9] = pdVar92[-9] - local_648[lVar90];
          pdVar92[-1] = pdVar92[-1] - local_648[lVar90];
          *pdVar92 = local_648[lVar90] + *pdVar92;
          pdVar92 = pdVar92 + 0x16;
        }
        dVar131 = dVar132 * (dVar130 * dVar122 * dVar131 +
                            -(dVar130 - ((h_RT[10] - (h_RT[1] + h_RT[9])) + 1.0) * dVar135) *
                            dVar119 * dVar114) +
                  (double)local_7a8._0_8_ * 2.302585092994046 * dVar105;
        pdVar6[0x1cf] = pdVar6[0x1cf] - dVar131;
        pdVar6[0x1d7] = pdVar6[0x1d7] - dVar131;
        pdVar6[0x1d8] = dVar131 + pdVar6[0x1d8];
        local_7a8._0_8_ =
             local_858[0x14] * -0.30000000000000004 +
             local_858[0x12] + local_858[0x12] +
             local_858[0xb] * 0.5 + local_858[5] * 5.0 + local_858[0] + dVar123 + local_858[10] +
             local_858[0xc];
        dVar130 = local_858[1] * local_858[0xd];
        dVar131 = exp(dVar121 * 0.48 + dVar135 * 130.8363331092272);
        dVar131 = dVar131 * 1090000.0;
        local_888._8_8_ = 0;
        local_888._0_8_ = dVar135 * 0.48 + dVar50 * -130.8363331092272;
        dVar122 = exp(dVar121 * -2.57 + dVar135 * -717.083748771726);
        dVar122 = dVar122 * 1.35e+24 * (((double)local_7a8._0_8_ * 1e-12) / dVar131);
        dVar110 = ((dVar135 * -2.57 + dVar50 * 717.083748771726) - (double)local_888._0_8_) *
                  0.43429448190325176;
        dVar105 = log10(dVar122);
        local_598._0_8_ = dVar105;
        dVar105 = exp(dVar49 / -271.0);
        local_7a8._0_8_ = dVar105 * 0.21760000000000002;
        dVar105 = exp(dVar49 / -2755.0);
        dVar119 = exp(dVar135 * -6570.0);
        local_798._0_8_ = (double)local_7a8._0_8_ + dVar105 * 0.7824 + dVar119;
        dVar108 = log10((double)local_798._0_8_);
        dVar111 = dVar108 * -1.27 + 0.75;
        local_898._0_8_ = dVar108 * -0.67 + -0.4 + (double)local_598._0_8_;
        dVar109 = 1.0 / ((double)local_898._0_8_ * -0.14 + dVar111);
        local_898._0_8_ = (double)local_898._0_8_ * dVar109;
        dVar106 = 1.0 / ((double)local_898._0_8_ * (double)local_898._0_8_ + 1.0);
        local_598._0_8_ = pow(10.0,dVar108 * dVar106);
        dVar107 = local_858[0xe];
        dVar134 = 0.43429448190325176 / (double)local_798._0_8_;
        dVar114 = (double)local_7a8._0_8_ / -271.0;
        dVar132 = (dVar108 + dVar108) * dVar106 * dVar106 * (double)local_898._0_8_ * dVar109;
        dVar109 = -dVar111 * dVar132 * dVar109;
        dVar132 = dVar132 * (double)local_898._0_8_;
        local_7a8._8_4_ = local_a48._8_4_;
        local_7a8._0_8_ = local_a48._8_8_;
        local_7a8._12_4_ = local_a48._12_4_;
        dVar108 = exp((local_a48._8_8_ + dVar124) - local_678);
        dVar108 = dVar131 / (dVar108 * dVar120);
        dVar133 = (double)local_598._0_8_ * (dVar122 / (dVar122 + 1.0));
        dVar111 = (dVar131 * dVar130 - dVar107 * dVar108) * dVar133;
        local_978[1] = local_978[1] - dVar111;
        auStack_910._0_8_ = (double)auStack_910._0_8_ - dVar111;
        auStack_910._8_8_ = dVar111 + (double)auStack_910._8_8_;
        local_648[0] = 0.0;
        local_648[1] = local_858[0xd] * dVar131 * dVar133 + 0.0;
        local_5f8 = 0.0;
        dStack_5f0 = 0.0;
        local_608 = 0.0;
        dStack_600 = 0.0;
        local_5e8 = 0.0;
        local_618 = 0.0;
        dStack_610 = 0.0;
        auStack_628 = ZEXT816(0);
        local_648[2] = 0.0;
        local_648[3] = 0.0;
        dStack_5e0 = dVar131 * dVar133 * local_858[1] + 0.0;
        local_5d8 = 0.0 - dVar108 * dVar133;
        dStack_5b0 = 0.0;
        local_5a8 = 0.0;
        dStack_5c0 = 0.0;
        local_5b8 = 0.0;
        dStack_5d0 = 0.0;
        local_5c8 = 0.0;
        pdVar92 = pdVar6 + 0xe;
        pdVar91 = pdVar92;
        for (lVar90 = 0; lVar90 != 0x15; lVar90 = lVar90 + 1) {
          pdVar91[-0xd] = pdVar91[-0xd] - local_648[lVar90];
          pdVar91[-1] = pdVar91[-1] - local_648[lVar90];
          *pdVar91 = local_648[lVar90] + *pdVar91;
          pdVar91 = pdVar91 + 0x16;
        }
        dVar131 = dVar133 * ((double)local_888._0_8_ * dVar131 * dVar130 +
                            -((double)local_888._0_8_ -
                             ((h_RT[0xe] - (h_RT[1] + h_RT[0xd])) + 1.0) * dVar135) * dVar108 *
                            dVar107) +
                  ((dVar132 * -1.27 + dVar109 * -0.67 + dVar106) *
                   (dVar119 * 6570.0 * dVar50 + (dVar105 * 0.7824) / -2755.0 + dVar114) * dVar134 +
                   dVar110 * dVar109 + dVar110 / (dVar122 + 1.0)) * 2.302585092994046 * dVar111;
        pdVar6[0x1cf] = pdVar6[0x1cf] - dVar131;
        pdVar6[0x1db] = pdVar6[0x1db] - dVar131;
        pdVar6[0x1dc] = dVar131 + pdVar6[0x1dc];
        dVar131 = local_858[0xb] * 0.5 + local_858[5] * 5.0 + local_858[0] + dVar123 + local_858[10]
                  + local_858[0xc];
        dVar105 = local_858[0x12] + local_858[0x12];
        dVar132 = local_858[1] * local_858[0xe];
        dVar122 = exp(dVar135 * -1308.3633310922721 + dVar121 * 0.454);
        dVar111 = dVar50 * 1308.3633310922721 + dVar135 * 0.454;
        local_888._0_8_ = dVar122 * 540000.0;
        dVar122 = exp(dVar121 * -4.8 + dVar135 * -2797.884661874243);
        dVar131 = dVar122 * 2.2e+30 * (((dVar105 + dVar131) * 1e-12) / (double)local_888._0_8_);
        dVar107 = ((dVar135 * -4.8 + dVar50 * 2797.884661874243) - dVar111) * 0.43429448190325176;
        local_598._8_8_ = 0;
        local_598._0_8_ = dVar107 / (dVar131 + 1.0);
        dVar122 = log10(dVar131);
        dVar105 = exp(dVar49 / -94.0);
        dVar119 = exp(dVar49 / -1555.0);
        local_798._0_8_ = exp(dVar135 * -4200.0);
        dVar114 = dVar105 * 0.242 + dVar119 * 0.758 + (double)local_798._0_8_;
        dVar108 = log10(dVar114);
        dVar134 = dVar108 * -1.27 + 0.75;
        local_898._8_4_ = extraout_XMM0_Dc_00;
        local_898._0_8_ = dVar134;
        local_898._12_4_ = extraout_XMM0_Dd_00;
        dVar122 = dVar108 * -0.67 + -0.4 + dVar122;
        dVar110 = 1.0 / (dVar122 * -0.14 + dVar134);
        dVar122 = dVar122 * dVar110;
        dVar130 = 1.0 / (dVar122 * dVar122 + 1.0);
        dVar134 = pow(10.0,dVar108 * dVar130);
        dVar106 = local_858[0xf];
        dVar108 = (dVar108 + dVar108) * dVar130 * dVar130 * dVar122 * dVar110;
        dVar110 = -(double)local_898._0_8_ * dVar108 * dVar110;
        dVar105 = (dVar108 * dVar122 * -1.27 + dVar110 * -0.67 + dVar130) *
                  ((double)local_798._0_8_ * 4200.0 * dVar50 +
                  (dVar119 * 0.758) / -1555.0 + (dVar105 * 0.242) / -94.0) *
                  (0.43429448190325176 / dVar114) + dVar107 * dVar110 + (double)local_598._0_8_;
        local_598._8_4_ = local_558._8_4_;
        local_598._0_8_ = local_558._8_8_;
        local_598._12_4_ = local_558._12_4_;
        dVar122 = exp((local_678 + dVar124) - local_558._8_8_);
        dVar122 = (double)local_888._0_8_ / (dVar122 * dVar120);
        dVar134 = dVar134 * (dVar131 / (dVar131 + 1.0));
        dVar131 = ((double)local_888._0_8_ * dVar132 - dVar106 * dVar122) * dVar134;
        local_978[1] = local_978[1] - dVar131;
        auStack_910._8_8_ = (double)auStack_910._8_8_ - dVar131;
        dStack_900 = dVar131 + dStack_900;
        local_648[0] = 0.0;
        local_648[1] = local_858[0xe] * (double)local_888._0_8_ * dVar134 + 0.0;
        local_5e8 = 0.0;
        dStack_5e0 = 0.0;
        local_5f8 = 0.0;
        dStack_5f0 = 0.0;
        local_608 = 0.0;
        dStack_600 = 0.0;
        local_618 = 0.0;
        dStack_610 = 0.0;
        auStack_628 = ZEXT816(0);
        local_648[2] = 0.0;
        local_648[3] = 0.0;
        local_5d8 = (double)local_888._0_8_ * dVar134 * local_858[1] + 0.0;
        dStack_5d0 = 0.0 - dVar122 * dVar134;
        local_5a8 = 0.0;
        local_5b8 = 0.0;
        dStack_5b0 = 0.0;
        local_5c8 = 0.0;
        dStack_5c0 = 0.0;
        pdVar91 = pdVar6 + 0xf;
        for (lVar90 = 0; lVar90 != 0x15; lVar90 = lVar90 + 1) {
          pdVar91[-0xe] = pdVar91[-0xe] - local_648[lVar90];
          pdVar91[-1] = pdVar91[-1] - local_648[lVar90];
          *pdVar91 = local_648[lVar90] + *pdVar91;
          pdVar91 = pdVar91 + 0x16;
        }
        dVar131 = dVar134 * (dVar111 * (double)local_888._0_8_ * dVar132 +
                            -(dVar111 - ((h_RT[0xf] - (h_RT[1] + h_RT[0xe])) + 1.0) * dVar135) *
                            dVar122 * dVar106) + dVar105 * 2.302585092994046 * dVar131;
        pdVar6[0x1cf] = pdVar6[0x1cf] - dVar131;
        pdVar6[0x1dc] = pdVar6[0x1dc] - dVar131;
        pdVar6[0x1dd] = dVar131 + pdVar6[0x1dd];
        dVar131 = local_858[0xb] * 0.5 + local_858[5] * 5.0 + local_858[0] + dVar123 + local_858[10]
                  + local_858[0xc];
        dVar119 = local_858[0x12] + local_858[0x12];
        dVar122 = local_858[0x14] * -0.30000000000000004;
        dVar106 = local_858[1] * local_858[0x10];
        dVar105 = exp(dVar121 * 0.454 + dVar135 * -915.8543317645905);
        local_888._0_8_ = dVar105 * 1080000.0;
        dVar114 = dVar135 * 0.454 + dVar50 * 915.8543317645905;
        dVar105 = exp(dVar121 * -7.62 + dVar135 * -3507.4201606588986);
        dVar131 = dVar105 * 1.2e+42 *
                  (((dVar122 + dVar119 + dVar131) * 1e-12) / (double)local_888._0_8_);
        dVar112 = ((dVar135 * -7.62 + dVar50 * 3507.4201606588986) - dVar114) * 0.43429448190325176;
        dVar122 = log10(dVar131);
        dVar105 = exp(dVar49 / -210.0);
        dVar119 = exp(dVar49 / -984.0);
        dVar108 = exp(dVar135 * -4374.0);
        dVar132 = dVar105 * 0.024700000000000055 + dVar119 * 0.9753 + dVar108;
        dVar134 = log10(dVar132);
        dVar111 = dVar134 * -1.27 + 0.75;
        local_798._8_4_ = extraout_XMM0_Dc_01;
        local_798._0_8_ = dVar111;
        local_798._12_4_ = extraout_XMM0_Dd_01;
        dVar122 = dVar134 * -0.67 + -0.4 + dVar122;
        dVar111 = 1.0 / (dVar122 * -0.14 + dVar111);
        dVar122 = dVar122 * dVar111;
        dVar107 = 1.0 / (dVar122 * dVar122 + 1.0);
        local_898._0_8_ = dVar111;
        dVar111 = pow(10.0,dVar134 * dVar107);
        dVar109 = local_858[0x11];
        dVar130 = (dVar134 + dVar134) * dVar107 * dVar107 * dVar122 * (double)local_898._0_8_;
        dVar113 = -(double)local_798._0_8_ * dVar130 * (double)local_898._0_8_;
        dVar134 = exp(((double)local_558._0_8_ + dVar124) - (double)local_588._0_8_);
        dVar115 = local_858[0x12];
        dVar133 = local_858[0x11];
        dVar134 = (double)local_888._0_8_ / (dVar134 * dVar120);
        dVar111 = dVar111 * (dVar131 / (dVar131 + 1.0));
        dVar110 = ((double)local_888._0_8_ * dVar106 - dVar109 * dVar134) * dVar111;
        local_978[1] = local_978[1] - dVar110;
        local_648[0] = 0.0;
        local_648[1] = local_858[0x10] * (double)local_888._0_8_ * dVar111 + 0.0;
        local_5d8 = 0.0;
        dStack_5d0 = 0.0;
        local_5e8 = 0.0;
        dStack_5e0 = 0.0;
        local_5f8 = 0.0;
        dStack_5f0 = 0.0;
        local_608 = 0.0;
        dStack_600 = 0.0;
        local_618 = 0.0;
        dStack_610 = 0.0;
        auStack_628 = ZEXT816(0);
        local_648[2] = 0.0;
        local_648[3] = 0.0;
        local_5c8 = (double)local_888._0_8_ * dVar111 * local_858[1] + 0.0;
        dStack_5c0 = 0.0 - dVar134 * dVar111;
        local_5a8 = 0.0;
        local_8f8._0_8_ = (double)local_8f8._0_8_ - dVar110;
        local_8f8._8_8_ = dVar110 + (double)local_8f8._8_8_;
        local_5b8 = 0.0;
        dStack_5b0 = 0.0;
        pdVar91 = pdVar6 + 0x11;
        for (lVar90 = 0; lVar90 != 0x15; lVar90 = lVar90 + 1) {
          pdVar91[-0x10] = pdVar91[-0x10] - local_648[lVar90];
          pdVar91[-1] = pdVar91[-1] - local_648[lVar90];
          *pdVar91 = local_648[lVar90] + *pdVar91;
          pdVar91 = pdVar91 + 0x16;
        }
        dVar131 = dVar111 * (dVar114 * (double)local_888._0_8_ * dVar106 +
                            -(dVar114 - ((h_RT[0x11] - (h_RT[1] + h_RT[0x10])) + 1.0) * dVar135) *
                            dVar134 * dVar109) +
                  ((dVar130 * dVar122 * -1.27 + dVar113 * -0.67 + dVar107) *
                   (dVar108 * 4374.0 * dVar50 +
                   (dVar119 * 0.9753) / -984.0 + (dVar105 * 0.024700000000000055) / -210.0) *
                   (0.43429448190325176 / dVar132) + dVar112 * dVar113 + dVar112 / (dVar131 + 1.0))
                  * 2.302585092994046 * dVar110;
        pdVar6[0x1cf] = pdVar6[0x1cf] - dVar131;
        pdVar6[0x1de] = pdVar6[0x1de] - dVar131;
        pdVar6[0x1df] = dVar131 + pdVar6[0x1df];
        dVar131 = local_858[0xb] * 0.5 + local_858[5] * 5.0 + local_858[0] + dVar123 + local_858[10]
                  + local_858[0xc];
        dVar108 = local_858[0x12] + local_858[0x12];
        dVar122 = local_858[0x14] * -0.30000000000000004;
        dVar134 = local_858[1] * local_858[0x11];
        dVar105 = exp(dVar121 * -0.99 + dVar135 * -795.0823319714576);
        dVar105 = dVar105 * 521000000000.0;
        local_888._8_8_ = 0;
        local_888._0_8_ = dVar135 * -0.99 + dVar50 * 795.0823319714576;
        dVar119 = exp(dVar121 * -7.08 + dVar135 * -3364.003410904553);
        dVar131 = dVar119 * 1.99e+41 * (((dVar122 + dVar108 + dVar131) * 1e-12) / dVar105);
        dVar110 = ((dVar135 * -7.08 + dVar50 * 3364.003410904553) - (double)local_888._0_8_) *
                  0.43429448190325176;
        dVar122 = log10(dVar131);
        local_798._0_8_ = dVar122;
        dVar122 = exp(dVar49 / -125.0);
        dVar119 = exp(dVar49 / -2219.0);
        local_898._0_8_ = exp(dVar135 * -6882.0);
        dVar111 = dVar122 * 0.15780000000000005 + dVar119 * 0.8422 + (double)local_898._0_8_;
        dVar108 = log10(dVar111);
        dVar114 = dVar108 * -1.27 + 0.75;
        dVar106 = dVar108 * -0.67 + -0.4 + (double)local_798._0_8_;
        dVar109 = 1.0 / (dVar106 * -0.14 + dVar114);
        dVar106 = dVar106 * dVar109;
        dVar107 = 1.0 / (dVar106 * dVar106 + 1.0);
        local_798._0_8_ = pow(10.0,dVar108 * dVar107);
        dVar132 = (double)local_898._0_8_ * 6882.0;
        dVar130 = (dVar108 + dVar108) * dVar107 * dVar107 * dVar106 * dVar109;
        dVar109 = -dVar114 * dVar130 * dVar109;
        dVar108 = exp((dVar124 + (double)local_588._0_8_) - (double)local_578._0_8_);
        dVar108 = dVar105 / (dVar108 * dVar120);
        dVar112 = (double)local_798._0_8_ * (dVar131 / (dVar131 + 1.0));
        dVar114 = (dVar105 * dVar134 - dVar115 * dVar108) * dVar112;
        local_978[1] = local_978[1] - dVar114;
        local_8f8._8_8_ = (double)local_8f8._8_8_ - dVar114;
        local_8e8 = dVar114 + local_8e8;
        local_648[0] = 0.0;
        local_648[1] = dVar133 * dVar105 * dVar112 + 0.0;
        local_5d8 = 0.0;
        dStack_5d0 = 0.0;
        local_5e8 = 0.0;
        dStack_5e0 = 0.0;
        local_5f8 = 0.0;
        dStack_5f0 = 0.0;
        local_608 = 0.0;
        dStack_600 = 0.0;
        local_618 = 0.0;
        dStack_610 = 0.0;
        auStack_628 = ZEXT816(0);
        local_5c8 = 0.0;
        local_648[2] = 0.0;
        local_648[3] = 0.0;
        dStack_5c0 = dVar105 * dVar112 * local_858[1] + 0.0;
        local_5b8 = 0.0 - dVar108 * dVar112;
        dStack_5b0 = 0.0;
        local_5a8 = 0.0;
        pdVar91 = pdVar6 + 0x12;
        for (lVar90 = 0; lVar90 != 0x15; lVar90 = lVar90 + 1) {
          pdVar91[-0x11] = pdVar91[-0x11] - local_648[lVar90];
          pdVar91[-1] = pdVar91[-1] - local_648[lVar90];
          *pdVar91 = local_648[lVar90] + *pdVar91;
          pdVar91 = pdVar91 + 0x16;
        }
        dVar131 = dVar112 * ((double)local_888._0_8_ * dVar105 * dVar134 +
                            -((double)local_888._0_8_ -
                             ((h_RT[0x12] - (h_RT[1] + h_RT[0x11])) + 1.0) * dVar135) * dVar108 *
                            dVar115) +
                  ((dVar130 * dVar106 * -1.27 + dVar109 * -0.67 + dVar107) *
                   (dVar132 * dVar50 +
                   (dVar119 * 0.8422) / -2219.0 + (dVar122 * 0.15780000000000005) / -125.0) *
                   (0.43429448190325176 / dVar111) + dVar110 * dVar109 + dVar110 / (dVar131 + 1.0))
                  * 2.302585092994046 * dVar114;
        pdVar6[0x1cf] = pdVar6[0x1cf] - dVar131;
        pdVar6[0x1df] = pdVar6[0x1df] - dVar131;
        pdVar6[0x1e0] = dVar131 + pdVar6[0x1e0];
        dVar108 = local_858[0xb] * 0.5 + local_858[5] * 5.0 + dVar123 + local_858[0] + local_858[10]
                  + local_858[0xc];
        dVar133 = local_858[0] * local_858[0xb];
        dVar131 = local_858[0x12] + local_858[0x12];
        dVar119 = local_858[0x14] * -0.30000000000000004;
        dVar122 = exp(dVar135 * -40056.04659805571 + dVar121 * 1.5);
        dVar122 = dVar122 * 43.0;
        dVar111 = dVar50 * 40056.04659805571 + dVar135 * 1.5;
        dVar105 = exp(dVar121 * -3.42 + dVar135 * -42446.32576062813);
        dVar131 = dVar105 * 5.07e+27 * (((dVar119 + dVar131 + dVar108) * 1e-12) / dVar122);
        dVar115 = ((dVar135 * -3.42 + dVar50 * 42446.32576062813) - dVar111) * 0.43429448190325176;
        dVar105 = log10(dVar131);
        dVar119 = exp(dVar49 / -197.0);
        local_888._0_8_ = dVar119 * 0.06799999999999995;
        dVar119 = exp(dVar49 / -1540.0);
        local_798._0_8_ = exp(dVar135 * -10300.0);
        dVar114 = (double)local_888._0_8_ + dVar119 * 0.932 + (double)local_798._0_8_;
        dVar108 = log10(dVar114);
        dVar134 = dVar108 * -1.27 + 0.75;
        local_898._8_4_ = extraout_XMM0_Dc_02;
        local_898._0_8_ = dVar134;
        local_898._12_4_ = extraout_XMM0_Dd_02;
        dVar105 = dVar108 * -0.67 + -0.4 + dVar105;
        dVar112 = 1.0 / (dVar105 * -0.14 + dVar134);
        dVar105 = dVar105 * dVar112;
        dVar107 = 1.0 / (dVar105 * dVar105 + 1.0);
        dVar134 = pow(10.0,dVar108 * dVar107);
        dVar110 = local_858[0xe];
        dVar132 = (double)local_888._0_8_ / -197.0;
        dVar130 = (double)local_798._0_8_ * 10300.0;
        dVar106 = (dVar108 + dVar108) * dVar107 * dVar107 * dVar105 * dVar112;
        dVar112 = -(double)local_898._0_8_ * dVar106 * dVar112;
        local_888._8_4_ = SUB84(dStack_670,0);
        local_888._0_8_ = dStack_670;
        local_888._12_4_ = (int)((ulong)dStack_670 >> 0x20);
        dVar108 = exp((dStack_670 + local_ac8) - local_678);
        dVar109 = local_858[0x12];
        dVar108 = dVar122 / (dVar108 * dVar120);
        dVar134 = dVar134 * (dVar131 / (dVar131 + 1.0));
        dVar113 = (dVar122 * dVar133 - dVar110 * dVar108) * dVar134;
        local_978[0] = local_978[0] - dVar113;
        local_978[0xb] = local_978[0xb] - dVar113;
        auStack_910._8_8_ = dVar113 + (double)auStack_910._8_8_;
        local_648[0] = local_858[0xb] * dVar122 * dVar134 + 0.0;
        local_648[1] = 0.0;
        local_648[2] = 0.0;
        local_648[3] = 0.0;
        auStack_628 = ZEXT816(0);
        local_618 = 0.0;
        dStack_610 = 0.0;
        local_608 = 0.0;
        dStack_600 = 0.0;
        local_5f8 = 0.0;
        dStack_5f0 = dVar122 * dVar134 * local_858[0] + 0.0;
        local_5e8 = 0.0;
        dStack_5e0 = 0.0;
        local_5d8 = 0.0 - dVar108 * dVar134;
        dStack_5b0 = 0.0;
        local_5a8 = 0.0;
        dStack_5c0 = 0.0;
        local_5b8 = 0.0;
        dStack_5d0 = 0.0;
        local_5c8 = 0.0;
        for (lVar90 = 0; lVar90 != 0x15; lVar90 = lVar90 + 1) {
          pdVar92[-0xe] = pdVar92[-0xe] - local_648[lVar90];
          pdVar92[-3] = pdVar92[-3] - local_648[lVar90];
          *pdVar92 = local_648[lVar90] + *pdVar92;
          pdVar92 = pdVar92 + 0x16;
        }
        dVar131 = dVar134 * (dVar111 * dVar122 * dVar133 +
                            -(dVar111 - ((h_RT[0xe] - (h_RT[0] + h_RT[0xb])) + 1.0) * dVar135) *
                            dVar108 * dVar110) +
                  ((dVar106 * dVar105 * -1.27 + dVar112 * -0.67 + dVar107) *
                   (dVar130 * dVar50 + (dVar119 * 0.932) / -1540.0 + dVar132) *
                   (0.43429448190325176 / dVar114) + dVar115 * dVar112 + dVar115 / (dVar131 + 1.0))
                  * 2.302585092994046 * dVar113;
        pdVar6[0x1ce] = pdVar6[0x1ce] - dVar131;
        pdVar6[0x1d9] = pdVar6[0x1d9] - dVar131;
        pdVar6[0x1dc] = dVar131 + pdVar6[0x1dc];
        dVar131 = local_858[0xb] * 0.5 + local_858[5] * 5.0 + local_858[0] + dVar123 + local_858[10]
                  + local_858[0xc];
        dVar108 = local_858[0x12] + local_858[0x12];
        dVar122 = local_858[0x14] * -0.30000000000000004;
        dVar107 = local_858[9] * local_858[9];
        dVar105 = exp(dVar121 * -0.97 + dVar135 * -311.9943327989264);
        dVar105 = dVar105 * 21200000000.0;
        dVar132 = dVar135 * -0.97 + dVar50 * 311.9943327989264;
        dVar119 = exp(dVar121 * -9.67 + dVar135 * -3130.0076613053584);
        dVar131 = dVar119 * 1.77e+50 * (((dVar122 + dVar108 + dVar131) * 1e-12) / dVar105);
        dVar112 = ((dVar135 * -9.67 + dVar50 * 3130.0076613053584) - dVar132) * 0.43429448190325176;
        local_798._8_8_ = 0;
        local_798._0_8_ = dVar112;
        dVar122 = log10(dVar131);
        local_898._0_8_ = dVar122;
        dVar122 = exp(dVar49 / -151.0);
        dVar119 = exp(dVar49 / -1038.0);
        dVar108 = exp(dVar135 * -4970.0);
        dVar130 = dVar122 * 0.4675 + dVar119 * 0.5325 + dVar108;
        dVar134 = log10(dVar130);
        dVar111 = dVar134 * -1.27 + 0.75;
        dVar110 = dVar134 * -0.67 + -0.4 + (double)local_898._0_8_;
        dVar113 = 1.0 / (dVar110 * -0.14 + dVar111);
        dVar110 = dVar110 * dVar113;
        dVar133 = 1.0 / (dVar110 * dVar110 + 1.0);
        local_898._0_8_ = pow(10.0,dVar134 * dVar133);
        dVar106 = (dVar134 + dVar134) * dVar133 * dVar133 * dVar110 * dVar113;
        dVar113 = -dVar111 * dVar106 * dVar113;
        dVar134 = (double)local_798._0_8_ * dVar113;
        dVar111 = (double)local_868._0_8_ + (double)local_868._0_8_;
        dVar114 = exp(dVar111 - (double)local_578._0_8_);
        dVar115 = local_858[0x14];
        dVar114 = dVar105 / (dVar114 * dVar120);
        dVar127 = (double)local_898._0_8_ * (dVar131 / (dVar131 + 1.0));
        dVar116 = (dVar105 * dVar107 - dVar109 * dVar114) * dVar127;
        local_978[9] = local_978[9] - (dVar116 + dVar116);
        local_8e8 = dVar116 + local_8e8;
        local_648[0] = 0.0;
        local_648[1] = 0.0;
        local_648[2] = 0.0;
        local_648[3] = 0.0;
        local_608 = 0.0;
        auStack_628 = ZEXT816(0);
        local_618 = 0.0;
        dStack_610 = 0.0;
        dStack_600 = (dVar105 * dVar127 + dVar105 * dVar127) * local_858[9] + 0.0;
        local_5c8 = 0.0;
        dStack_5c0 = 0.0;
        local_5d8 = 0.0;
        dStack_5d0 = 0.0;
        local_5e8 = 0.0;
        dStack_5e0 = 0.0;
        local_5f8 = 0.0;
        dStack_5f0 = 0.0;
        local_5b8 = 0.0 - dVar114 * dVar127;
        dStack_5b0 = 0.0;
        local_5a8 = 0.0;
        for (lVar90 = 0; lVar90 != 0x15; lVar90 = lVar90 + 1) {
          *pdVar93 = *pdVar93 - (local_648[lVar90] + local_648[lVar90]);
          pdVar93[9] = local_648[lVar90] + pdVar93[9];
          pdVar93 = pdVar93 + 0x16;
        }
        dVar131 = dVar127 * (dVar132 * dVar105 * dVar107 +
                            -(dVar132 - ((h_RT[0x12] - (h_RT[9] + h_RT[9])) + 1.0) * dVar135) *
                            dVar114 * dVar109) +
                  ((dVar106 * dVar110 * -1.27 + dVar113 * -0.67 + dVar133) *
                   (dVar108 * 4970.0 * dVar50 +
                   (dVar119 * 0.5325) / -1038.0 + (dVar122 * 0.4675) / -151.0) *
                   (0.43429448190325176 / dVar130) + dVar134 + dVar112 / (dVar131 + 1.0)) *
                  2.302585092994046 * dVar116;
        pdVar6[0x1d7] = pdVar6[0x1d7] - (dVar131 + dVar131);
        pdVar6[0x1e0] = dVar131 + pdVar6[0x1e0];
        dVar131 = local_858[0xb] * 0.5 + local_858[5] * 5.0 + local_858[0] + dVar123 + local_858[10]
                  + local_858[0xc];
        dVar119 = local_858[0x12] + local_858[0x12];
        dVar122 = exp(dVar129 - dVar121);
        dVar134 = local_858[4];
        dVar122 = dVar122 * 500000.0;
        local_798._8_8_ = 0;
        local_798._0_8_ = dVar20 - dVar135;
        dVar105 = exp((local_ae8 + dVar124) - local_a48);
        dVar132 = local_858[0xc];
        dVar114 = local_858[0xb];
        dVar108 = local_858[2];
        dVar105 = dVar122 / (dVar105 * dVar120);
        dVar131 = dVar115 * -0.30000000000000004 + dVar119 + dVar131;
        local_648[3] = local_858[2] * local_858[1] * dVar122 + -dVar105 * dVar134;
        dVar119 = dVar131 * local_648[3];
        local_978[1] = local_978[1] - dVar119;
        local_978[2] = local_978[2] - dVar119;
        local_978[4] = dVar119 + local_978[4];
        local_648[1] = dVar122 * dVar131 * local_858[2] + local_648[3];
        local_648[2] = dVar122 * dVar131 * local_858[1] + local_648[3];
        auStack_628._0_8_ = local_648[3] - dVar105 * dVar131;
        auStack_628._8_8_ = local_648[3] * 6.0;
        local_608 = local_648[3];
        dStack_600 = local_648[3];
        local_618 = local_648[3];
        dStack_610 = local_648[3];
        local_648[0] = local_648[3] * 2.0;
        auVar51._8_4_ = SUB84(local_648[3] * 1.5,0);
        auVar51._0_8_ = local_648[0];
        auVar51._12_4_ = (int)((ulong)(local_648[3] * 1.5) >> 0x20);
        local_5f8 = local_648[0];
        dStack_5f0 = auVar51._8_8_;
        local_5e8 = local_648[0];
        dStack_5d0 = local_648[3];
        local_5c8 = local_648[3];
        dStack_5e0 = local_648[3];
        local_5d8 = local_648[3];
        dStack_5c0 = local_648[3];
        local_5b8 = local_648[3] * 3.0;
        dStack_5b0 = local_648[3];
        local_5a8 = local_648[3] * 0.7;
        pdVar93 = pdVar6 + 1;
        pdVar92 = pdVar93;
        for (lVar90 = 0; lVar90 != 0x15; lVar90 = lVar90 + 1) {
          *pdVar92 = *pdVar92 - local_648[lVar90];
          pdVar92[1] = pdVar92[1] - local_648[lVar90];
          pdVar92[3] = local_648[lVar90] + pdVar92[3];
          pdVar92 = pdVar92 + 0x16;
        }
        dVar131 = (local_858[2] * local_858[1] * (double)local_798._0_8_ * dVar122 -
                  ((double)local_798._0_8_ - ((h_RT[4] - (h_RT[1] + h_RT[2])) + 1.0) * dVar135) *
                  dVar105 * dVar134) * dVar131;
        auVar21._8_4_ = SUB84(pdVar6[0x1d0] - dVar131,0);
        auVar21._0_8_ = pdVar6[0x1cf] - dVar131;
        auVar21._12_4_ = (int)((ulong)(pdVar6[0x1d0] - dVar131) >> 0x20);
        *(undefined1 (*) [16])(pdVar6 + 0x1cf) = auVar21;
        pdVar6[0x1d2] = dVar131 + pdVar6[0x1d2];
        dVar131 = local_858[0x14] * -0.5 +
                  local_858[0x12] + local_858[0x12] +
                  local_858[0xc] * 2.5 +
                  local_858[0xb] * 0.5 +
                  local_858[5] * 5.0 + local_858[3] * 5.0 + local_858[0] + dVar123 + local_858[10];
        dVar110 = local_858[0xb] * local_858[2];
        dVar119 = dVar121 * 0.0;
        dVar122 = exp(dVar135 * -1509.64999741416 + dVar119);
        local_898._8_4_ = extraout_XMM0_Dc_03;
        local_898._0_8_ = dVar122 * 602.0;
        local_898._12_4_ = extraout_XMM0_Dd_03;
        dVar122 = dVar135 * 0.0;
        dVar134 = dVar50 * 1509.64999741416 + dVar122;
        dVar105 = exp(((double)local_888._0_8_ + local_ae8) - local_698);
        dVar107 = local_858[3];
        dVar106 = local_858[1];
        dVar105 = (double)local_898._0_8_ / (dVar105 * dVar120);
        local_648[1] = (double)local_898._0_8_ * dVar110 - dVar132 * dVar105;
        dVar130 = dVar131 * local_648[1];
        local_978[2] = local_978[2] - dVar130;
        local_978[0xb] = local_978[0xb] - dVar130;
        local_978[0xc] = dVar130 + local_978[0xc];
        local_648[0] = local_648[1] + local_648[1];
        local_648[2] = dVar114 * (double)local_898._0_8_ * dVar131 + local_648[1];
        local_648[3] = local_648[1] * 6.0;
        auStack_628._0_8_ = local_648[1];
        auStack_628._8_8_ = local_648[1] * 6.0;
        local_608 = local_648[1];
        dStack_600 = local_648[1];
        local_618 = local_648[1];
        dStack_610 = local_648[1];
        local_5f8 = local_648[1] + local_648[1];
        dStack_5f0 = local_648[1] * 1.5 + dVar108 * (double)local_898._0_8_ * dVar131;
        dVar108 = local_648[1] * 3.5 + -dVar105 * dVar131;
        auVar22._8_4_ = SUB84(dVar108,0);
        auVar22._0_8_ = dStack_5f0;
        auVar22._12_4_ = (int)((ulong)dVar108 >> 0x20);
        local_5e8 = auVar22._8_8_;
        dStack_5d0 = local_648[1];
        local_5c8 = local_648[1];
        dStack_5e0 = local_648[1];
        local_5d8 = local_648[1];
        dStack_5c0 = local_648[1];
        local_5b8 = local_648[1] * 3.0;
        dStack_5b0 = local_648[1];
        local_5a8 = local_648[1] * 0.5;
        pdVar92 = pdVar6 + 0xc;
        for (lVar90 = 0; lVar90 != 0x15; lVar90 = lVar90 + 1) {
          pdVar92[-10] = pdVar92[-10] - local_648[lVar90];
          pdVar92[-1] = pdVar92[-1] - local_648[lVar90];
          *pdVar92 = local_648[lVar90] + *pdVar92;
          pdVar92 = pdVar92 + 0x16;
        }
        dVar131 = dVar131 * (dVar134 * (double)local_898._0_8_ * dVar110 -
                            (dVar134 - ((h_RT[0xc] - (h_RT[2] + h_RT[0xb])) + 1.0) * dVar135) *
                            dVar105 * dVar132);
        pdVar6[0x1d0] = pdVar6[0x1d0] - dVar131;
        pdVar6[0x1d9] = pdVar6[0x1d9] - dVar131;
        pdVar6[0x1da] = dVar131 + pdVar6[0x1da];
        dVar114 = ((local_858[0x12] * 0.5 +
                   local_858[0xc] * 0.5 +
                   local_858[0xb] * -0.25 + ((dVar123 - local_858[3]) - local_858[5])) -
                  local_858[0x13]) - local_858[0x14];
        dVar109 = local_858[3] * local_858[1];
        dVar131 = exp(dVar121 * -0.86 + dVar129);
        uVar85 = local_878._8_8_;
        dVar131 = dVar131 * 2800000.0;
        dVar105 = dVar135 * -0.86 + dVar20;
        local_898._0_8_ = local_858[6];
        dVar108 = ((double)local_878._8_8_ + dVar124) - local_a08;
        dVar134 = exp(dVar108);
        dVar110 = local_858[3];
        dVar130 = local_858[1];
        dVar134 = dVar131 / (dVar134 * dVar120);
        local_648[0] = dVar131 * dVar109 - (double)local_898._0_8_ * dVar134;
        dVar132 = dVar114 * local_648[0];
        local_978[1] = local_978[1] - dVar132;
        local_978[3] = local_978[3] - dVar132;
        local_978[6] = dVar132 + local_978[6];
        local_648[1] = dVar107 * dVar131 * dVar114 + local_648[0];
        local_648[2] = local_648[0];
        local_648[3] = dVar131 * dVar114 * dVar106;
        auStack_628._8_8_ = 0;
        auStack_628._0_8_ = local_648[0];
        local_618 = local_648[0] - dVar134 * dVar114;
        uVar103 = SUB84(local_648[0],0);
        uVar104 = (undefined4)((ulong)local_648[0] >> 0x20);
        auVar23._8_4_ = uVar103;
        auVar23._0_8_ = local_648[0];
        auVar23._12_4_ = uVar104;
        dStack_600 = local_648[0];
        local_5f8 = auVar23._8_8_;
        auVar24._8_4_ = uVar103;
        auVar24._0_8_ = local_648[0];
        auVar24._12_4_ = uVar104;
        dStack_610 = local_648[0];
        local_608 = auVar24._8_8_;
        local_5b8 = local_648[0] * 1.5;
        auVar52._8_4_ = SUB84(local_5b8,0);
        auVar52._0_8_ = local_648[0] * 0.75;
        auVar52._12_4_ = (int)((ulong)local_5b8 >> 0x20);
        dStack_5f0 = local_648[0] * 0.75;
        local_5e8 = auVar52._8_8_;
        auVar25._8_4_ = uVar103;
        auVar25._0_8_ = local_648[0];
        auVar25._12_4_ = uVar104;
        dStack_5d0 = local_648[0];
        local_5c8 = auVar25._8_8_;
        auVar26._8_4_ = uVar103;
        auVar26._0_8_ = local_648[0];
        auVar26._12_4_ = uVar104;
        dStack_5e0 = local_648[0];
        local_5d8 = auVar26._8_8_;
        dStack_5c0 = local_648[0];
        dStack_5b0 = 0.0;
        local_5a8 = 0.0;
        pdVar92 = pdVar93;
        for (lVar90 = 0; lVar90 != 0x15; lVar90 = lVar90 + 1) {
          *pdVar92 = *pdVar92 - local_648[lVar90];
          pdVar92[2] = pdVar92[2] - local_648[lVar90];
          pdVar92[5] = local_648[lVar90] + pdVar92[5];
          pdVar92 = pdVar92 + 0x16;
        }
        dVar114 = dVar114 * (dVar105 * dVar131 * dVar109 -
                            (dVar105 - ((h_RT[6] - (h_RT[1] + h_RT[3])) + 1.0) * dVar135) * dVar134
                            * (double)local_898._0_8_);
        pdVar6[0x1cf] = pdVar6[0x1cf] - dVar114;
        pdVar6[0x1d1] = pdVar6[0x1d1] - dVar114;
        pdVar6[0x1d4] = dVar114 + pdVar6[0x1d4];
        local_8b8._0_8_ = local_858[3] * local_858[3];
        dVar131 = local_858[1] * local_858[3] * local_858[3];
        dVar132 = dVar121 * -1.72 + dVar129;
        dVar105 = exp(dVar132);
        dVar134 = local_858[6];
        local_898._8_8_ = 0;
        local_898._0_8_ = dVar135 * -1.72 + dVar20;
        dVar106 = dVar110 * local_858[6];
        local_8c8._0_8_ = dVar105 * 300000000.0;
        dVar105 = exp(dVar108);
        RVar88 = h_RT[6];
        RVar87 = h_RT[3];
        RVar86 = h_RT[1];
        dVar114 = local_858[5];
        dVar105 = (double)local_8c8._0_8_ / (dVar105 * dVar120);
        dVar116 = (double)local_8c8._0_8_ * dVar131 - dVar106 * dVar105;
        dVar115 = local_978[1] - dVar116;
        dVar112 = local_978[3] - dVar116;
        dVar116 = dVar116 + local_978[6];
        dVar107 = (double)local_8b8._0_8_ * (double)local_8c8._0_8_;
        pdVar6[0x17] = pdVar6[0x17] - dVar107;
        pdVar6[0x19] = pdVar6[0x19] - dVar107;
        dVar131 = (double)local_898._0_8_ * (double)local_8c8._0_8_ * dVar131 -
                  ((double)local_898._0_8_ -
                  (((h_RT[3] + h_RT[6]) - (h_RT[3] + h_RT[3] + h_RT[1])) + 1.0) * dVar135) * dVar105
                  * dVar106;
        pdVar6[0x1c] = dVar107 + pdVar6[0x1c];
        dVar106 = (double)local_8c8._0_8_ * dVar130;
        dVar106 = (dVar106 + dVar106) * dVar110 - dVar105 * dVar134;
        pdVar6[0x43] = pdVar6[0x43] - dVar106;
        pdVar6[0x45] = pdVar6[0x45] - dVar106;
        pdVar6[0x48] = dVar106 + pdVar6[0x48];
        dVar105 = -dVar105 * dVar110;
        pdVar6[0x85] = pdVar6[0x85] - dVar105;
        pdVar6[0x87] = pdVar6[0x87] - dVar105;
        pdVar6[0x8a] = dVar105 + pdVar6[0x8a];
        pdVar6[0x1cf] = pdVar6[0x1cf] - dVar131;
        pdVar6[0x1d1] = pdVar6[0x1d1] - dVar131;
        pdVar6[0x1d4] = dVar131 + pdVar6[0x1d4];
        dVar131 = dVar110 * dVar130 * local_858[5];
        local_8c8._0_8_ = exp(dVar121 * -0.76 + dVar129);
        local_8c8._0_8_ = (double)local_8c8._0_8_ * 9380000.0;
        local_8b8._8_8_ = 0;
        local_8b8._0_8_ = dVar135 * -0.76 + dVar20;
        dVar134 = dVar134 * dVar114;
        dVar105 = exp(dVar108);
        dVar109 = local_858[0x13];
        dVar110 = local_858[6];
        dVar107 = local_858[3];
        dVar106 = local_858[1];
        dVar105 = (double)local_8c8._0_8_ / (dVar105 * dVar120);
        dVar113 = (double)local_8c8._0_8_ * dVar131 - dVar134 * dVar105;
        dVar134 = (double)local_8b8._0_8_ * (double)local_8c8._0_8_ * dVar131 -
                  ((double)local_8b8._0_8_ -
                  (((h_RT[5] + RVar88) - (RVar86 + RVar87 + h_RT[5])) + 1.0) * dVar135) * dVar105 *
                  dVar134;
        dVar131 = (double)local_8c8._0_8_ * local_858[3] * dVar114;
        pdVar6[0x17] = pdVar6[0x17] - dVar131;
        pdVar6[0x19] = pdVar6[0x19] - dVar131;
        pdVar6[0x1c] = dVar131 + pdVar6[0x1c];
        dVar131 = dVar114 * (double)local_8c8._0_8_ * local_858[1];
        pdVar6[0x43] = pdVar6[0x43] - dVar131;
        pdVar6[0x45] = pdVar6[0x45] - dVar131;
        pdVar6[0x48] = dVar131 + pdVar6[0x48];
        dVar131 = (double)local_8c8._0_8_ * local_858[1] * local_858[3] - dVar105 * local_858[6];
        pdVar6[0x6f] = pdVar6[0x6f] - dVar131;
        pdVar6[0x71] = pdVar6[0x71] - dVar131;
        pdVar6[0x74] = dVar131 + pdVar6[0x74];
        dVar114 = -dVar105 * dVar114;
        pdVar6[0x85] = pdVar6[0x85] - dVar114;
        pdVar6[0x87] = pdVar6[0x87] - dVar114;
        pdVar6[0x8a] = dVar114 + pdVar6[0x8a];
        pdVar6[0x1cf] = pdVar6[0x1cf] - dVar134;
        pdVar6[0x1d1] = pdVar6[0x1d1] - dVar134;
        pdVar6[0x1d4] = dVar134 + pdVar6[0x1d4];
        dVar131 = local_858[3] * local_858[1];
        local_8b8._0_8_ = dVar131 * local_858[0x13];
        local_8c8._0_8_ = exp(dVar132);
        local_8c8._0_8_ = (double)local_8c8._0_8_ * 375000000.0;
        dVar105 = exp(dVar108);
        RVar86 = h_RT[6];
        dVar133 = local_858[0x14];
        dVar114 = (double)local_8c8._0_8_ / (dVar105 * dVar120);
        dVar105 = h_RT[1] + h_RT[3];
        dVar134 = (double)local_898._0_8_ -
                  (((h_RT[0x13] + h_RT[6]) - (dVar105 + h_RT[0x13])) + 1.0) * dVar135;
        dVar130 = (double)local_8c8._0_8_ * (double)local_8b8._0_8_ - dVar110 * dVar109 * dVar114;
        dVar127 = (double)local_898._0_8_ * (double)local_8c8._0_8_;
        dVar132 = (double)local_8c8._0_8_ * dVar107 * dVar109;
        pdVar6[0x17] = pdVar6[0x17] - dVar132;
        pdVar6[0x19] = pdVar6[0x19] - dVar132;
        pdVar6[0x1c] = dVar132 + pdVar6[0x1c];
        dVar132 = dVar109 * (double)local_8c8._0_8_ * dVar106;
        pdVar6[0x43] = pdVar6[0x43] - dVar132;
        pdVar6[0x45] = pdVar6[0x45] - dVar132;
        pdVar6[0x48] = dVar132 + pdVar6[0x48];
        dVar132 = -dVar114 * dVar109;
        pdVar6[0x85] = pdVar6[0x85] - dVar132;
        pdVar6[0x87] = pdVar6[0x87] - dVar132;
        pdVar6[0x8a] = dVar132 + pdVar6[0x8a];
        local_898._0_8_ = local_858[6];
        dVar132 = (double)local_8c8._0_8_ * dVar106 * dVar107 - dVar114 * local_858[6];
        pdVar6[0x1a3] = pdVar6[0x1a3] - dVar132;
        pdVar6[0x1a5] = pdVar6[0x1a5] - dVar132;
        dVar134 = dVar127 * (double)local_8b8._0_8_ - dVar134 * dVar114 * dVar110 * dVar109;
        pdVar6[0x1a8] = dVar132 + pdVar6[0x1a8];
        pdVar6[0x1cf] = pdVar6[0x1cf] - dVar134;
        pdVar6[0x1d1] = pdVar6[0x1d1] - dVar134;
        pdVar6[0x1d4] = dVar134 + pdVar6[0x1d4];
        dVar131 = dVar131 * local_858[0x14];
        dVar134 = exp((double)local_538._0_8_);
        dVar134 = dVar134 * 700000.0;
        local_538._0_8_ = (double)local_898._0_8_ * dVar133;
        dVar108 = exp(dVar108);
        dVar114 = local_858[0];
        dVar108 = dVar134 / (dVar108 * dVar120);
        dVar106 = dVar134 * dVar131 - (double)local_538._0_8_ * dVar108;
        local_978[3] = ((dVar112 - dVar113) - dVar130) - dVar106;
        local_978[6] = dVar106 + dVar130 + dVar113 + dVar116;
        dVar132 = dVar134 * local_858[3] * dVar133;
        pdVar6[0x17] = pdVar6[0x17] - dVar132;
        pdVar6[0x19] = pdVar6[0x19] - dVar132;
        dVar105 = (double)local_788._0_8_ * dVar134 * dVar131 -
                  ((double)local_788._0_8_ -
                  (((h_RT[0x14] + RVar86) - (dVar105 + h_RT[0x14])) + 1.0) * dVar135) * dVar108 *
                  (double)local_538._0_8_;
        pdVar6[0x1c] = dVar132 + pdVar6[0x1c];
        local_788._0_8_ = local_858[1];
        dVar131 = dVar133 * dVar134 * local_858[1];
        pdVar6[0x43] = pdVar6[0x43] - dVar131;
        pdVar6[0x45] = pdVar6[0x45] - dVar131;
        pdVar6[0x48] = dVar131 + pdVar6[0x48];
        dVar131 = -dVar108 * dVar133;
        pdVar6[0x85] = pdVar6[0x85] - dVar131;
        pdVar6[0x87] = pdVar6[0x87] - dVar131;
        pdVar6[0x8a] = dVar131 + pdVar6[0x8a];
        dVar131 = dVar134 * local_858[1] * local_858[3] - dVar108 * (double)local_898._0_8_;
        pdVar6[0x1b9] = pdVar6[0x1b9] - dVar131;
        pdVar6[0x1bb] = pdVar6[0x1bb] - dVar131;
        pdVar6[0x1be] = dVar131 + pdVar6[0x1be];
        pdVar6[0x1cf] = pdVar6[0x1cf] - dVar105;
        pdVar6[0x1d1] = pdVar6[0x1d1] - dVar105;
        pdVar6[0x1d4] = dVar105 + pdVar6[0x1d4];
        dVar108 = dVar133 * -0.37 +
                  local_858[0x12] + local_858[0x12] +
                  ((((dVar123 - local_858[0]) - local_858[5]) + local_858[10]) - local_858[0xc]);
        dVar107 = local_858[1] * local_858[1];
        dVar131 = exp(dVar129 - dVar121);
        local_898._0_8_ = dVar131 * 1000000.0;
        dVar131 = (dVar124 + dVar124) - local_ac8;
        dVar105 = exp(dVar131);
        dVar132 = local_858[0];
        dVar134 = (double)local_898._0_8_ / (dVar105 * dVar120);
        local_648[2] = (double)local_898._0_8_ * dVar107 - dVar114 * dVar134;
        dVar105 = dVar108 * local_648[2];
        local_978[0] = local_978[0] + dVar105;
        local_648[0] = -dVar134 * dVar108;
        local_648[1] = ((double)local_898._0_8_ * dVar108 + (double)local_898._0_8_ * dVar108) *
                       (double)local_788._0_8_ + local_648[2];
        local_648[3] = local_648[2];
        auStack_628._8_8_ = 0;
        auStack_628._0_8_ = local_648[2];
        uVar103 = SUB84(local_648[2],0);
        uVar104 = (undefined4)((ulong)local_648[2] >> 0x20);
        auVar53._8_4_ = uVar103;
        auVar53._0_8_ = local_648[2];
        auVar53._12_4_ = uVar104;
        local_608 = local_648[2];
        dStack_600 = auVar53._8_8_;
        auVar54._8_4_ = uVar103;
        auVar54._0_8_ = local_648[2];
        auVar54._12_4_ = uVar104;
        local_618 = local_648[2];
        dStack_610 = auVar54._8_8_;
        local_5f8 = local_648[2] + local_648[2];
        dStack_5f0 = local_648[2];
        local_5e8 = 0.0;
        local_978[1] = (((dVar115 - dVar113) - dVar130) - dVar106) - (dVar105 + dVar105);
        auVar55._8_4_ = uVar103;
        auVar55._0_8_ = local_648[2];
        auVar55._12_4_ = uVar104;
        dStack_5d0 = local_648[2];
        local_5c8 = auVar55._8_8_;
        auVar56._8_4_ = uVar103;
        auVar56._0_8_ = local_648[2];
        auVar56._12_4_ = uVar104;
        dStack_5e0 = local_648[2];
        local_5d8 = auVar56._8_8_;
        dStack_5c0 = local_648[2];
        local_5b8 = local_648[2] * 3.0;
        dStack_5b0 = local_648[2];
        local_5a8 = local_648[2] * 0.63;
        for (lVar90 = 0; lVar90 != 0x15; lVar90 = lVar90 + 1) {
          pdVar93[-1] = local_648[lVar90] + pdVar93[-1];
          *pdVar93 = *pdVar93 - (local_648[lVar90] + local_648[lVar90]);
          pdVar93 = pdVar93 + 0x16;
        }
        dVar108 = dVar108 * ((double)local_798._0_8_ * (double)local_898._0_8_ * dVar107 -
                            ((double)local_798._0_8_ -
                            ((h_RT[0] - (h_RT[1] + h_RT[1])) + 1.0) * dVar135) * dVar134 * dVar114);
        pdVar6[0x1ce] = pdVar6[0x1ce] + dVar108;
        pdVar6[0x1cf] = pdVar6[0x1cf] - (dVar108 + dVar108);
        local_788._0_8_ = local_858[1] * local_858[1];
        dVar114 = local_858[0] * (double)local_788._0_8_;
        dVar105 = exp(dVar121 * -0.6 + dVar129);
        local_798._0_8_ = dVar105 * 90000.0;
        dVar105 = dVar135 * -0.6 + dVar20;
        dVar108 = exp(dVar131);
        dVar134 = local_858[0];
        dVar108 = (double)local_798._0_8_ / (dVar108 * dVar120);
        dVar130 = (double)local_798._0_8_ * dVar114 - dVar132 * dVar132 * dVar108;
        dVar105 = dVar105 * (double)local_798._0_8_ * dVar114 -
                  (dVar105 - (((h_RT[0] + h_RT[0]) - (h_RT[1] + h_RT[1] + h_RT[0])) + 1.0) * dVar135
                  ) * dVar108 * dVar132 * dVar132;
        local_978[0] = local_978[0] + dVar130;
        local_978[1] = local_978[1] - (dVar130 + dVar130);
        dVar108 = (double)local_788._0_8_ * (double)local_798._0_8_ + dVar108 * -2.0 * dVar132;
        *pdVar6 = *pdVar6 + dVar108;
        pdVar6[1] = pdVar6[1] - (dVar108 + dVar108);
        dVar108 = ((double)local_798._0_8_ * local_858[0] + (double)local_798._0_8_ * local_858[0])
                  * local_858[1];
        pdVar6[0x16] = pdVar6[0x16] + dVar108;
        pdVar6[0x17] = pdVar6[0x17] - (dVar108 + dVar108);
        pdVar6[0x1ce] = pdVar6[0x1ce] + dVar105;
        pdVar6[0x1cf] = pdVar6[0x1cf] - (dVar105 + dVar105);
        local_788._0_8_ = local_858[5];
        dVar106 = local_858[1] * local_858[1] * local_858[5];
        dVar105 = exp(dVar121 * -1.25 + dVar129);
        dVar105 = dVar105 * 60000000.0;
        dVar108 = dVar135 * -1.25 + dVar20;
        dVar134 = dVar134 * (double)local_788._0_8_;
        dVar114 = exp(dVar131);
        dVar107 = local_858[0xc];
        dVar132 = local_858[0];
        dVar114 = dVar105 / (dVar114 * dVar120);
        dVar130 = dVar105 * dVar106 - dVar134 * dVar114;
        local_978[0] = local_978[0] + dVar130;
        local_978[1] = local_978[1] - (dVar130 + dVar130);
        dVar130 = -dVar114 * (double)local_788._0_8_;
        *pdVar6 = *pdVar6 + dVar130;
        pdVar6[1] = pdVar6[1] - (dVar130 + dVar130);
        dVar130 = (dVar105 + dVar105) * local_858[1] * local_858[5];
        dVar108 = dVar108 * dVar105 * dVar106 -
                  (dVar108 - (((h_RT[5] + h_RT[0]) - (h_RT[1] + h_RT[1] + h_RT[5])) + 1.0) * dVar135
                  ) * dVar114 * dVar134;
        pdVar6[0x16] = pdVar6[0x16] + dVar130;
        pdVar6[0x17] = pdVar6[0x17] - (dVar130 + dVar130);
        dVar105 = dVar105 * local_858[1] * local_858[1] - dVar114 * local_858[0];
        pdVar6[0x6e] = pdVar6[0x6e] + dVar105;
        pdVar6[0x6f] = pdVar6[0x6f] - (dVar105 + dVar105);
        pdVar6[0x1ce] = pdVar6[0x1ce] + dVar108;
        pdVar6[0x1cf] = pdVar6[0x1cf] - (dVar108 + dVar108);
        dVar110 = local_858[1] * local_858[1] * local_858[0xc];
        local_798._8_4_ = extraout_XMM0_Dc;
        local_798._0_8_ = dVar121 + dVar121;
        local_798._12_4_ = extraout_XMM0_Dd;
        dVar105 = dVar129 - (dVar121 + dVar121);
        dVar108 = exp(dVar105);
        dVar108 = dVar108 * 550000000.0;
        local_898._8_8_ = 0;
        local_898._0_8_ = dVar135 + dVar135;
        local_788._8_8_ = 0;
        local_788._0_8_ = dVar20 - (dVar135 + dVar135);
        dVar132 = dVar132 * dVar107;
        dVar131 = exp(dVar131);
        dVar106 = local_858[5];
        dVar130 = local_858[4];
        dVar114 = local_858[1];
        dVar134 = dVar108 / (dVar131 * dVar120);
        dVar131 = dVar108 * dVar110 - dVar132 * dVar134;
        local_978[0] = local_978[0] + dVar131;
        local_978[1] = local_978[1] - (dVar131 + dVar131);
        dVar107 = -dVar134 * dVar107;
        *pdVar6 = *pdVar6 + dVar107;
        pdVar6[1] = pdVar6[1] - (dVar107 + dVar107);
        dVar107 = (dVar108 + dVar108) * local_858[1] * local_858[0xc];
        dVar131 = (double)local_788._0_8_ * dVar108 * dVar110 -
                  ((double)local_788._0_8_ -
                  (((h_RT[0xc] + h_RT[0]) - (h_RT[1] + h_RT[1] + h_RT[0xc])) + 1.0) * dVar135) *
                  dVar134 * dVar132;
        pdVar6[0x16] = pdVar6[0x16] + dVar107;
        pdVar6[0x17] = pdVar6[0x17] - (dVar107 + dVar107);
        dVar108 = local_858[1] * local_858[1] * dVar108 - dVar134 * local_858[0];
        pdVar6[0x108] = pdVar6[0x108] + dVar108;
        pdVar6[0x109] = pdVar6[0x109] - (dVar108 + dVar108);
        pdVar6[0x1ce] = pdVar6[0x1ce] + dVar131;
        pdVar6[0x1cf] = pdVar6[0x1cf] - (dVar131 + dVar131);
        dVar131 = local_858[0x14] * -0.62 +
                  local_858[0x12] + local_858[0x12] +
                  local_858[5] * 2.65 + local_858[0] * -0.27 + dVar123 + local_858[10];
        local_538._8_8_ = 0;
        local_538._0_8_ = local_858[1] * local_858[4];
        dVar105 = exp(dVar105);
        dVar105 = dVar105 * 22000000000.0;
        dVar108 = exp((local_a48 + dVar124) - dStack_a00);
        dVar134 = local_858[0xd];
        dVar120 = dVar105 / (dVar108 * dVar120);
        local_648[2] = dVar105 * (double)local_538._0_8_ - dVar106 * dVar120;
        dVar108 = dVar131 * local_648[2];
        local_978[1] = local_978[1] - dVar108;
        local_978[4] = local_978[4] - dVar108;
        local_978[5] = dVar108 + local_978[5];
        local_648[0] = local_648[2] * 0.73;
        local_648[1] = dVar130 * dVar105 * dVar131 + local_648[2];
        local_648[3] = local_648[2];
        dVar108 = -dVar120 * dVar131 + local_648[2] * 3.65;
        auStack_628._8_4_ = SUB84(dVar108,0);
        auStack_628._0_8_ = local_648[2] + dVar114 * dVar105 * dVar131;
        auStack_628._12_4_ = (int)((ulong)dVar108 >> 0x20);
        uVar103 = SUB84(local_648[2],0);
        uVar104 = (undefined4)((ulong)local_648[2] >> 0x20);
        auVar27._8_4_ = uVar103;
        auVar27._0_8_ = local_648[2];
        auVar27._12_4_ = uVar104;
        local_608 = local_648[2];
        dStack_600 = auVar27._8_8_;
        auVar28._8_4_ = uVar103;
        auVar28._0_8_ = local_648[2];
        auVar28._12_4_ = uVar104;
        local_618 = local_648[2];
        dStack_610 = auVar28._8_8_;
        local_5f8 = local_648[2] + local_648[2];
        auVar29._8_4_ = uVar103;
        auVar29._0_8_ = local_648[2];
        auVar29._12_4_ = uVar104;
        dStack_5e0 = local_648[2];
        local_5d8 = auVar29._8_8_;
        auVar30._8_4_ = uVar103;
        auVar30._0_8_ = local_648[2];
        auVar30._12_4_ = uVar104;
        dStack_5f0 = local_648[2];
        local_5e8 = auVar30._8_8_;
        dStack_5d0 = local_648[2];
        local_5c8 = local_648[2];
        dStack_5c0 = local_648[2];
        local_5b8 = local_648[2] * 3.0;
        dStack_5b0 = local_648[2];
        local_5a8 = local_648[2] * 0.38;
        pdVar93 = pdVar6 + 5;
        for (lVar90 = 0; lVar90 != 0x15; lVar90 = lVar90 + 1) {
          pdVar93[-4] = pdVar93[-4] - local_648[lVar90];
          pdVar93[-1] = pdVar93[-1] - local_648[lVar90];
          *pdVar93 = local_648[lVar90] + *pdVar93;
          pdVar93 = pdVar93 + 0x16;
        }
        dVar131 = dVar131 * ((double)local_788._0_8_ * dVar105 * (double)local_538._0_8_ -
                            ((double)local_788._0_8_ -
                            ((h_RT[5] - (h_RT[1] + h_RT[4])) + 1.0) * dVar135) * dVar120 * dVar106);
        pdVar6[0x1cf] = pdVar6[0x1cf] - dVar131;
        pdVar6[0x1d2] = pdVar6[0x1d2] - dVar131;
        pdVar6[0x1d3] = dVar131 + pdVar6[0x1d3];
        local_788._0_8_ = local_858[5];
        dVar132 = local_858[5] * local_858[0xd];
        dVar131 = dVar135 * -8554.68331868024 - dVar121;
        dVar120 = exp(dVar131);
        dVar109 = local_858[0xb];
        dVar107 = local_858[1];
        dVar120 = dVar120 * 2244000000000.0;
        dVar105 = dVar50 * 8554.68331868024 - dVar135;
        dVar130 = local_858[1] * (double)local_788._0_8_ * local_858[0xb];
        local_538._8_4_ = local_9d8._8_4_;
        local_538._0_8_ = -dVar124;
        local_538._12_4_ = local_9d8._12_4_ ^ 0x80000000;
        dVar108 = (-dVar124 - (double)local_888._0_8_) + (double)local_7a8._0_8_;
        dVar114 = exp(dVar108);
        dVar106 = dVar120 / (dVar114 * dVar117);
        dVar110 = dVar120 * dVar132 - dVar130 * dVar106;
        dVar114 = dVar105 * dVar120 * dVar132 -
                  (dVar105 -
                  (((h_RT[5] + h_RT[1] + h_RT[0xb]) - (h_RT[0xd] + h_RT[5])) + -1.0) * dVar135) *
                  dVar106 * dVar130;
        local_978[1] = local_978[1] + dVar110;
        local_978[0xb] = local_978[0xb] + dVar110;
        auStack_910._0_8_ = (double)auStack_910._0_8_ - dVar110;
        dVar132 = (double)local_788._0_8_ * -dVar106 * dVar109;
        pdVar6[0x17] = pdVar6[0x17] + dVar132;
        pdVar6[0x21] = pdVar6[0x21] + dVar132;
        pdVar6[0x23] = pdVar6[0x23] - dVar132;
        dVar107 = -dVar106 * dVar107;
        dVar132 = dVar120 * dVar134 + dVar109 * dVar107;
        pdVar6[0x6f] = pdVar6[0x6f] + dVar132;
        pdVar6[0x79] = pdVar6[0x79] + dVar132;
        pdVar6[0x7b] = pdVar6[0x7b] - dVar132;
        dVar107 = dVar107 * (double)local_788._0_8_;
        pdVar6[0xf3] = pdVar6[0xf3] + dVar107;
        pdVar6[0xfd] = pdVar6[0xfd] + dVar107;
        pdVar6[0xff] = pdVar6[0xff] - dVar107;
        dVar120 = dVar120 * (double)local_788._0_8_;
        pdVar6[0x11f] = pdVar6[0x11f] + dVar120;
        pdVar6[0x129] = pdVar6[0x129] + dVar120;
        pdVar6[299] = pdVar6[299] - dVar120;
        pdVar6[0x1cf] = pdVar6[0x1cf] + dVar114;
        pdVar6[0x1d9] = pdVar6[0x1d9] + dVar114;
        pdVar6[0x1db] = pdVar6[0x1db] - dVar114;
        dVar123 = local_858[0x12] + local_858[0x12] +
                  dVar109 * 0.5 +
                  ((dVar123 + local_858[0]) - (double)local_788._0_8_) + local_858[10] +
                  local_858[0xc];
        dVar131 = exp(dVar131);
        dVar132 = local_858[1];
        dVar131 = dVar131 * 187000000000.0;
        local_788._0_8_ = local_858[0xb];
        dVar120 = local_858[1] * local_858[0xb];
        dVar108 = exp(dVar108);
        dVar130 = local_858[2];
        dVar108 = dVar131 / (dVar108 * dVar117);
        local_648[2] = dVar131 * dVar134 - dVar120 * dVar108;
        dVar114 = dVar123 * local_648[2];
        local_978[1] = local_978[1] + dVar114;
        local_978[0xb] = local_978[0xb] + dVar114;
        local_648[0] = local_648[2] + local_648[2];
        local_648[1] = (double)local_788._0_8_ * -dVar108 * dVar123 + local_648[2];
        local_648[3] = local_648[2];
        auStack_628._8_8_ = 0;
        auStack_628._0_8_ = local_648[2];
        auStack_910._0_8_ = (double)auStack_910._0_8_ - dVar114;
        uVar103 = SUB84(local_648[2],0);
        uVar104 = (undefined4)((ulong)local_648[2] >> 0x20);
        auVar31._8_4_ = uVar103;
        auVar31._0_8_ = local_648[2];
        auVar31._12_4_ = uVar104;
        local_608 = local_648[2];
        dStack_600 = auVar31._8_8_;
        auVar32._8_4_ = uVar103;
        auVar32._0_8_ = local_648[2];
        auVar32._12_4_ = uVar104;
        local_618 = local_648[2];
        dStack_610 = auVar32._8_8_;
        local_5f8 = local_648[0];
        dStack_5f0 = local_648[2] * 1.5 + -dVar108 * dVar123 * dVar132;
        local_5e8 = local_648[0];
        dStack_5e0 = dVar131 * dVar123 + local_648[2];
        auVar33._8_4_ = uVar103;
        auVar33._0_8_ = local_648[2];
        auVar33._12_4_ = uVar104;
        local_5c8 = local_648[2];
        dStack_5c0 = auVar33._8_8_;
        auVar34._8_4_ = uVar103;
        auVar34._0_8_ = local_648[2];
        auVar34._12_4_ = uVar104;
        local_5d8 = local_648[2];
        dStack_5d0 = auVar34._8_8_;
        local_5b8 = local_648[2] * 3.0;
        dStack_5b0 = local_648[2];
        local_5a8 = local_648[2];
        pdVar93 = pdVar6 + 0xd;
        for (lVar90 = 0; lVar90 != 0x15; lVar90 = lVar90 + 1) {
          pdVar93[-0xc] = local_648[lVar90] + pdVar93[-0xc];
          pdVar93[-2] = local_648[lVar90] + pdVar93[-2];
          *pdVar93 = *pdVar93 - local_648[lVar90];
          pdVar93 = pdVar93 + 0x16;
        }
        dVar123 = dVar123 * (dVar105 * dVar131 * dVar134 -
                            (dVar105 - (((h_RT[1] + h_RT[0xb]) - h_RT[0xd]) + -1.0) * dVar135) *
                            dVar108 * dVar120);
        pdVar6[0x1cf] = pdVar6[0x1cf] + dVar123;
        pdVar6[0x1d9] = pdVar6[0x1d9] + dVar123;
        pdVar6[0x1db] = pdVar6[0x1db] - dVar123;
        dVar105 = local_858[0] * local_858[2];
        dVar123 = exp(dVar121 * 2.67 + dVar135 * -3165.232827911689);
        dVar123 = dVar123 * 0.05;
        dVar108 = dVar135 * 2.67 + dVar50 * 3165.232827911689;
        dVar131 = local_858[1] * local_858[4];
        local_788._0_8_ = local_ac8 - dVar124;
        dVar120 = exp((local_ae8 + (double)local_788._0_8_) - local_a48);
        dVar114 = local_858[4];
        dVar134 = local_858[2];
        dVar120 = dVar123 / dVar120;
        dVar132 = dVar123 * dVar105 - dVar131 * dVar120;
        local_978[0] = local_978[0] - dVar132;
        local_978[1] = local_978[1] + dVar132;
        local_978[2] = local_978[2] - dVar132;
        local_978[4] = dVar132 + local_978[4];
        dVar130 = dVar130 * dVar123;
        *pdVar6 = *pdVar6 - dVar130;
        pdVar6[1] = pdVar6[1] + dVar130;
        pdVar6[2] = pdVar6[2] - dVar130;
        dVar105 = dVar108 * dVar123 * dVar105 -
                  (dVar108 - ((h_RT[1] + h_RT[4]) - (h_RT[0] + h_RT[2])) * dVar135) * dVar120 *
                  dVar131;
        pdVar6[4] = dVar130 + pdVar6[4];
        dVar131 = -dVar120 * local_858[4];
        pdVar6[0x16] = pdVar6[0x16] - dVar131;
        pdVar6[0x17] = pdVar6[0x17] + dVar131;
        pdVar6[0x18] = pdVar6[0x18] - dVar131;
        pdVar6[0x1a] = dVar131 + pdVar6[0x1a];
        dVar123 = dVar123 * local_858[0];
        pdVar6[0x2c] = pdVar6[0x2c] - dVar123;
        pdVar6[0x2d] = pdVar6[0x2d] + dVar123;
        pdVar6[0x2e] = pdVar6[0x2e] - dVar123;
        pdVar6[0x30] = dVar123 + pdVar6[0x30];
        dVar123 = local_858[1] * -dVar120;
        pdVar6[0x58] = pdVar6[0x58] - dVar123;
        pdVar6[0x59] = pdVar6[0x59] + dVar123;
        pdVar6[0x5a] = pdVar6[0x5a] - dVar123;
        pdVar6[0x5c] = dVar123 + pdVar6[0x5c];
        pdVar6[0x1ce] = pdVar6[0x1ce] - dVar105;
        pdVar6[0x1cf] = pdVar6[0x1cf] + dVar105;
        pdVar6[0x1d0] = pdVar6[0x1d0] - dVar105;
        pdVar6[0x1d2] = dVar105 + pdVar6[0x1d2];
        dVar129 = dVar129 + dVar119;
        dVar131 = exp(dVar129);
        dVar108 = local_858[3];
        dVar20 = dVar20 + dVar122;
        dVar123 = exp(((local_ae8 - (double)uVar85) - local_a48) + local_a08);
        dVar110 = local_858[7];
        dVar107 = local_978[4];
        dVar106 = local_978[2];
        dVar131 = dVar131 * 20000000.0;
        dVar114 = dVar114 * dVar108;
        dVar120 = dVar134 * local_858[6];
        auVar7._8_4_ = SUB84(dVar134 * local_858[7],0);
        auVar7._0_8_ = dVar120;
        auVar7._12_4_ = (int)((ulong)(dVar134 * local_858[7]) >> 0x20);
        dVar132 = dVar20 * dVar131 * dVar120 -
                  (dVar131 / dVar123) *
                  (dVar20 - ((h_RT[4] + h_RT[3]) - (h_RT[6] + h_RT[2])) * dVar135) * dVar114;
        dVar105 = dVar131 * local_858[6];
        pdVar6[0x2e] = pdVar6[0x2e] - dVar105;
        auVar8._8_4_ = SUB84(dVar105 + pdVar6[0x30],0);
        auVar8._0_8_ = dVar105 + pdVar6[0x2f];
        auVar8._12_4_ = (int)((ulong)(dVar105 + pdVar6[0x30]) >> 0x20);
        *(undefined1 (*) [16])(pdVar6 + 0x2f) = auVar8;
        pdVar6[0x32] = pdVar6[0x32] - dVar105;
        dVar112 = -(dVar131 / dVar123);
        dVar123 = local_858[4] * dVar112;
        pdVar6[0x44] = pdVar6[0x44] - dVar123;
        auVar35._8_4_ = SUB84(dVar123 + pdVar6[0x46],0);
        auVar35._0_8_ = dVar123 + pdVar6[0x45];
        auVar35._12_4_ = (int)((ulong)(dVar123 + pdVar6[0x46]) >> 0x20);
        *(undefined1 (*) [16])(pdVar6 + 0x45) = auVar35;
        pdVar6[0x48] = pdVar6[0x48] - dVar123;
        dVar108 = dVar108 * dVar112;
        pdVar6[0x5a] = pdVar6[0x5a] - dVar108;
        auVar9._8_4_ = SUB84(dVar108 + pdVar6[0x5c],0);
        auVar9._0_8_ = dVar108 + pdVar6[0x5b];
        auVar9._12_4_ = (int)((ulong)(dVar108 + pdVar6[0x5c]) >> 0x20);
        *(undefined1 (*) [16])(pdVar6 + 0x5b) = auVar9;
        pdVar6[0x5e] = pdVar6[0x5e] - dVar108;
        dVar134 = dVar134 * dVar131;
        pdVar6[0x86] = pdVar6[0x86] - dVar134;
        auVar10._8_4_ = SUB84(dVar134 + pdVar6[0x88],0);
        auVar10._0_8_ = dVar134 + pdVar6[0x87];
        auVar10._12_4_ = (int)((ulong)(dVar134 + pdVar6[0x88]) >> 0x20);
        *(undefined1 (*) [16])(pdVar6 + 0x87) = auVar10;
        pdVar6[0x8a] = pdVar6[0x8a] - dVar134;
        pdVar6[0x1d0] = pdVar6[0x1d0] - dVar132;
        dVar130 = local_ae8 - dVar124;
        auVar57._8_4_ = SUB84(dVar132 + pdVar6[0x1d2],0);
        auVar57._0_8_ = dVar132 + pdVar6[0x1d1];
        auVar57._12_4_ = (int)((ulong)(dVar132 + pdVar6[0x1d2]) >> 0x20);
        *(undefined1 (*) [16])(pdVar6 + 0x1d1) = auVar57;
        dVar105 = ((double)local_878._0_8_ + dVar130) - (double)local_7a8._0_8_;
        pdVar6[0x1d4] = pdVar6[0x1d4] - dVar132;
        dVar123 = auVar7._8_8_;
        auVar11._8_4_ = SUB84(dVar120,0);
        auVar11._0_8_ = dVar123;
        auVar11._12_4_ = (int)((ulong)dVar120 >> 0x20);
        dVar120 = exp(dVar129);
        dVar115 = local_858[0xd];
        dVar132 = local_858[1];
        local_8b8._8_4_ = extraout_XMM0_Dc_04;
        local_8b8._0_8_ = dVar120 * 80000000.0;
        local_8b8._12_4_ = extraout_XMM0_Dd_04;
        dVar120 = local_858[1] * local_858[0xd];
        dVar105 = exp(dVar105);
        dVar109 = local_858[8];
        dVar133 = local_858[2];
        dVar108 = -((double)local_8b8._0_8_ / dVar105);
        dStack_9b0 = auVar11._8_8_;
        dVar134 = (double)local_8b8._0_8_ * dVar123 + dVar108 * dVar120;
        dVar131 = dVar131 * dStack_9b0 + dVar112 * dVar114;
        local_978[4] = dVar131 + dVar107;
        local_978[1] = local_978[1] + dVar134;
        local_978[3] = dVar131 + local_978[3];
        local_978[2] = (dVar106 - dVar131) - dVar134;
        local_978[6] = local_978[6] - dVar131;
        local_978[7] = local_978[7] - dVar134;
        auStack_910._0_8_ = (double)auStack_910._0_8_ + dVar134;
        dVar115 = dVar115 * dVar108;
        pdVar6[0x17] = pdVar6[0x17] + dVar115;
        pdVar6[0x18] = pdVar6[0x18] - dVar115;
        pdVar6[0x1d] = pdVar6[0x1d] - dVar115;
        pdVar6[0x23] = dVar115 + pdVar6[0x23];
        dVar110 = dVar110 * (double)local_8b8._0_8_;
        pdVar6[0x2d] = pdVar6[0x2d] + dVar110;
        pdVar6[0x2e] = pdVar6[0x2e] - dVar110;
        pdVar6[0x33] = pdVar6[0x33] - dVar110;
        pdVar6[0x39] = dVar110 + pdVar6[0x39];
        dVar131 = (double)local_8b8._0_8_ * local_858[2];
        pdVar6[0x9b] = pdVar6[0x9b] + dVar131;
        pdVar6[0x9c] = pdVar6[0x9c] - dVar131;
        pdVar6[0xa1] = pdVar6[0xa1] - dVar131;
        dVar123 = dVar123 * dVar20 * (double)local_8b8._0_8_ -
                  (dVar20 - ((h_RT[1] + h_RT[0xd]) - (h_RT[2] + h_RT[7])) * dVar135) *
                  ((double)local_8b8._0_8_ / dVar105) * dVar120;
        pdVar6[0xa7] = dVar131 + pdVar6[0xa7];
        dVar108 = dVar108 * dVar132;
        pdVar6[0x11f] = pdVar6[0x11f] + dVar108;
        pdVar6[0x120] = pdVar6[0x120] - dVar108;
        pdVar6[0x125] = pdVar6[0x125] - dVar108;
        pdVar6[299] = dVar108 + pdVar6[299];
        pdVar6[0x1cf] = pdVar6[0x1cf] + dVar123;
        pdVar6[0x1d0] = pdVar6[0x1d0] - dVar123;
        pdVar6[0x1d5] = pdVar6[0x1d5] - dVar123;
        pdVar6[0x1db] = dVar123 + pdVar6[0x1db];
        dVar123 = exp(dVar129);
        dVar108 = local_858[1];
        local_8a0 = local_858[0xd];
        dVar131 = local_ae8._8_8_;
        auVar12._8_4_ = local_ae8._8_4_;
        auVar12._0_8_ = dVar131;
        auVar12._12_4_ = local_ae8._12_4_;
        dVar120 = exp((dVar131 + dVar130) - (double)local_7a8._0_8_);
        dVar106 = local_858[9];
        dVar110 = local_978[2];
        dVar107 = local_978[1];
        local_8c8._0_8_ = pdVar6[0x18];
        local_8b8._0_8_ = pdVar6[0x1e];
        dVar123 = dVar123 * 15000000.0;
        dVar132 = dVar108 * local_8a0;
        dVar105 = -(dVar123 / dVar120);
        dVar114 = dVar123 * dVar109;
        dVar133 = dVar133 * dVar109;
        dVar113 = local_858[9] * local_858[2];
        dVar120 = dVar20 * dVar123 * dVar133 -
                  (dVar123 / dVar120) *
                  (dVar20 - ((h_RT[1] + h_RT[0xd]) - (h_RT[2] + h_RT[8])) * dVar135) * dVar132;
        dVar134 = local_8a0 * dVar105;
        local_8a0 = pdVar6[0x1d0];
        pdVar6[0x17] = pdVar6[0x17] + dVar134;
        pdVar6[0x18] = (double)local_8c8._0_8_ - dVar134;
        pdVar6[0x1e] = pdVar6[0x1e] - dVar134;
        pdVar6[0x23] = pdVar6[0x23] + dVar134;
        pdVar6[0x2d] = pdVar6[0x2d] + dVar114;
        pdVar6[0x2e] = pdVar6[0x2e] - dVar114;
        pdVar6[0x34] = pdVar6[0x34] - dVar114;
        pdVar6[0x39] = pdVar6[0x39] + dVar114;
        dVar134 = local_858[2] * dVar123;
        pdVar6[0xb1] = pdVar6[0xb1] + dVar134;
        pdVar6[0xb2] = pdVar6[0xb2] - dVar134;
        pdVar6[0xb8] = pdVar6[0xb8] - dVar134;
        pdVar6[0xbd] = pdVar6[0xbd] + dVar134;
        dVar108 = dVar108 * dVar105;
        pdVar6[0x11f] = pdVar6[0x11f] + dVar108;
        pdVar6[0x120] = pdVar6[0x120] - dVar108;
        pdVar6[0x126] = pdVar6[0x126] - dVar108;
        pdVar6[299] = pdVar6[299] + dVar108;
        pdVar6[0x1cf] = pdVar6[0x1cf] + dVar120;
        pdVar6[0x1d0] = local_8a0 - dVar120;
        pdVar6[0x1d6] = pdVar6[0x1d6] - dVar120;
        pdVar6[0x1db] = pdVar6[0x1db] + dVar120;
        dVar120 = (double)local_868._0_8_ + dVar130;
        dVar108 = exp(dVar129);
        dVar112 = local_858[0xe];
        dVar109 = local_858[1];
        local_8b8._8_4_ = extraout_XMM0_Dc_05;
        local_8b8._0_8_ = dVar108 * 84300000.0;
        local_8b8._12_4_ = extraout_XMM0_Dd_05;
        dVar108 = local_858[1] * local_858[0xe];
        dVar120 = exp(dVar120 - local_678);
        dVar115 = local_858[10];
        dVar114 = local_858[2];
        dVar134 = -((double)local_8b8._0_8_ / dVar120);
        dVar105 = dVar123 * dVar133 + dVar105 * dVar132;
        dVar123 = (double)local_8b8._0_8_ * dVar113 + dVar134 * dVar108;
        dVar120 = dVar113 * dVar20 * (double)local_8b8._0_8_ -
                  (dVar20 - ((h_RT[1] + h_RT[0xe]) - (h_RT[2] + h_RT[9])) * dVar135) *
                  ((double)local_8b8._0_8_ / dVar120) * dVar108;
        local_978[1] = dVar107 + dVar105 + dVar123;
        local_978[2] = (dVar110 - dVar105) - dVar123;
        local_978[8] = local_978[8] - dVar105;
        auVar36._8_4_ = SUB84(local_978[9] - dVar123,0);
        auVar36._0_8_ = local_978[8];
        auVar36._12_4_ = (int)((ulong)(local_978[9] - dVar123) >> 0x20);
        local_978[9] = auVar36._8_8_;
        dVar123 = (double)auStack_910._8_8_ + dVar123;
        auStack_910._8_4_ = SUB84(dVar123,0);
        auStack_910._0_8_ = (double)auStack_910._0_8_ + dVar105;
        auStack_910._12_4_ = (int)((ulong)dVar123 >> 0x20);
        dVar112 = dVar112 * dVar134;
        pdVar6[0x17] = pdVar6[0x17] + dVar112;
        pdVar6[0x18] = pdVar6[0x18] - dVar112;
        pdVar6[0x1f] = pdVar6[0x1f] - dVar112;
        pdVar6[0x24] = dVar112 + pdVar6[0x24];
        dVar106 = dVar106 * (double)local_8b8._0_8_;
        pdVar6[0x2d] = pdVar6[0x2d] + dVar106;
        pdVar6[0x2e] = pdVar6[0x2e] - dVar106;
        pdVar6[0x35] = pdVar6[0x35] - dVar106;
        pdVar6[0x3a] = dVar106 + pdVar6[0x3a];
        dVar123 = (double)local_8b8._0_8_ * local_858[2];
        pdVar6[199] = pdVar6[199] + dVar123;
        pdVar6[200] = pdVar6[200] - dVar123;
        pdVar6[0xcf] = pdVar6[0xcf] - dVar123;
        pdVar6[0xd4] = dVar123 + pdVar6[0xd4];
        dVar134 = dVar134 * dVar109;
        pdVar6[0x135] = pdVar6[0x135] + dVar134;
        pdVar6[0x136] = pdVar6[0x136] - dVar134;
        pdVar6[0x13d] = pdVar6[0x13d] - dVar134;
        pdVar6[0x142] = dVar134 + pdVar6[0x142];
        pdVar6[0x1cf] = pdVar6[0x1cf] + dVar120;
        pdVar6[0x1d0] = pdVar6[0x1d0] - dVar120;
        pdVar6[0x1d7] = pdVar6[0x1d7] - dVar120;
        pdVar6[0x1dc] = dVar120 + pdVar6[0x1dc];
        dVar123 = exp(dVar121 * 1.5 + dVar135 * -4327.663325920592);
        dVar132 = local_858[9];
        dVar108 = local_858[4];
        dVar134 = dVar135 * 1.5 + dVar50 * 4327.663325920592;
        dVar120 = local_ae8 - local_a48;
        dVar105 = exp((dVar120 - (double)local_868._0_8_) + dStack_690);
        dVar112 = local_858[0xd];
        dVar133 = local_978[9];
        dVar109 = local_978[4];
        dVar110 = local_978[2];
        local_8c8._0_8_ = pdVar6[0x36];
        local_8b8._0_8_ = pdVar6[0x5a];
        dVar123 = dVar123 * 1020.0;
        dVar107 = dVar123 * dVar115;
        dVar114 = dVar114 * dVar115;
        auVar13._8_4_ = SUB84(local_858[0xd] * local_858[2],0);
        auVar13._0_8_ = dVar114;
        auVar13._12_4_ = (int)((ulong)(local_858[0xd] * local_858[2]) >> 0x20);
        dVar106 = dVar108 * dVar132;
        dVar134 = dVar134 * dVar123 * dVar114 -
                  (dVar123 / dVar105) *
                  (dVar134 - ((h_RT[4] + h_RT[9]) - (h_RT[2] + h_RT[10])) * dVar135) * dVar106;
        local_560 = pdVar6[0xe6];
        local_8a0 = pdVar6[0x1d0];
        pdVar6[0x2e] = pdVar6[0x2e] - dVar107;
        pdVar6[0x30] = pdVar6[0x30] + dVar107;
        pdVar6[0x35] = pdVar6[0x35] + dVar107;
        pdVar6[0x36] = (double)local_8c8._0_8_ - dVar107;
        dVar105 = -(dVar123 / dVar105);
        dVar132 = dVar132 * dVar105;
        pdVar6[0x5a] = pdVar6[0x5a] - dVar132;
        pdVar6[0x5c] = pdVar6[0x5c] + dVar132;
        pdVar6[0x61] = pdVar6[0x61] + dVar132;
        pdVar6[0x62] = pdVar6[0x62] - dVar132;
        dVar108 = dVar108 * dVar105;
        pdVar6[200] = pdVar6[200] - dVar108;
        pdVar6[0xca] = pdVar6[0xca] + dVar108;
        pdVar6[0xcf] = pdVar6[0xcf] + dVar108;
        pdVar6[0xd0] = pdVar6[0xd0] - dVar108;
        dVar108 = local_858[2] * dVar123;
        pdVar6[0xde] = pdVar6[0xde] - dVar108;
        pdVar6[0xe0] = pdVar6[0xe0] + dVar108;
        pdVar6[0xe5] = pdVar6[0xe5] + dVar108;
        pdVar6[0xe6] = local_560 - dVar108;
        pdVar6[0x1d0] = local_8a0 - dVar134;
        pdVar6[0x1d2] = pdVar6[0x1d2] + dVar134;
        pdVar6[0x1d7] = pdVar6[0x1d7] + dVar134;
        pdVar6[0x1d8] = pdVar6[0x1d8] - dVar134;
        dVar108 = (dVar120 - (double)local_888._0_8_) + (double)local_7a8._0_8_;
        dVar134 = exp(dVar129);
        dVar107 = local_858[0xb];
        dVar115 = local_858[4];
        local_8b8._8_4_ = extraout_XMM0_Dc_06;
        local_8b8._0_8_ = dVar134 * 30000000.0;
        local_8b8._12_4_ = extraout_XMM0_Dd_06;
        dVar134 = local_858[4] * local_858[0xb];
        dVar108 = exp(dVar108);
        dVar113 = local_858[0xd];
        dVar132 = -((double)local_8b8._0_8_ / dVar108);
        dStack_b20 = auVar13._8_8_;
        dVar123 = dVar123 * dVar114 + dVar105 * dVar106;
        dVar106 = (double)local_8b8._0_8_ * dStack_b20 + dVar132 * dVar134;
        local_978[9] = dVar133 + dVar123;
        dVar105 = dStack_b20 * dVar20 * (double)local_8b8._0_8_ -
                  (dVar20 - ((h_RT[4] + h_RT[0xb]) - (h_RT[2] + h_RT[0xd])) * dVar135) *
                  ((double)local_8b8._0_8_ / dVar108) * dVar134;
        local_978[2] = (dVar110 - dVar123) - dVar106;
        local_978[4] = dVar109 + dVar123 + dVar106;
        local_978[10] = local_978[10] - dVar123;
        local_978[0xb] = dVar106 + local_978[0xb];
        dVar112 = dVar112 * (double)local_8b8._0_8_;
        pdVar6[0x2e] = pdVar6[0x2e] - dVar112;
        pdVar6[0x30] = pdVar6[0x30] + dVar112;
        pdVar6[0x37] = dVar112 + pdVar6[0x37];
        pdVar6[0x39] = pdVar6[0x39] - dVar112;
        dVar107 = dVar107 * dVar132;
        pdVar6[0x5a] = pdVar6[0x5a] - dVar107;
        pdVar6[0x5c] = pdVar6[0x5c] + dVar107;
        pdVar6[99] = pdVar6[99] + dVar107;
        pdVar6[0x65] = pdVar6[0x65] - dVar107;
        dVar132 = dVar132 * dVar115;
        pdVar6[0xf4] = pdVar6[0xf4] - dVar132;
        pdVar6[0xf6] = pdVar6[0xf6] + dVar132;
        pdVar6[0xfd] = pdVar6[0xfd] + dVar132;
        pdVar6[0xff] = pdVar6[0xff] - dVar132;
        dVar123 = (double)local_8b8._0_8_ * local_858[2];
        pdVar6[0x120] = pdVar6[0x120] - dVar123;
        pdVar6[0x122] = pdVar6[0x122] + dVar123;
        pdVar6[0x129] = pdVar6[0x129] + dVar123;
        pdVar6[299] = pdVar6[299] - dVar123;
        pdVar6[0x1d0] = pdVar6[0x1d0] - dVar105;
        pdVar6[0x1d2] = pdVar6[0x1d2] + dVar105;
        pdVar6[0x1d9] = pdVar6[0x1d9] + dVar105;
        pdVar6[0x1db] = pdVar6[0x1db] - dVar105;
        dVar114 = local_858[2] * local_858[0xd];
        auStack_910._0_8_ = (double)auStack_910._0_8_ - dVar106;
        dVar123 = exp(dVar129);
        dVar132 = local_858[0xc];
        dVar134 = local_858[1];
        dVar123 = dVar123 * 30000000.0;
        dVar105 = local_858[1] * local_858[0xc];
        dVar108 = exp((dVar130 - local_698) + (double)local_7a8._0_8_);
        dVar106 = local_858[0xe];
        dVar108 = dVar123 / dVar108;
        dVar130 = dVar123 * dVar114 - dVar105 * dVar108;
        local_978[1] = local_978[1] + dVar130;
        local_978[2] = local_978[2] - dVar130;
        auStack_910._0_8_ = (double)auStack_910._0_8_ - dVar130;
        local_978[0xc] = dVar130 + local_978[0xc];
        dVar132 = dVar132 * -dVar108;
        pdVar6[0x17] = pdVar6[0x17] + dVar132;
        pdVar6[0x18] = pdVar6[0x18] - dVar132;
        dVar105 = dVar20 * dVar123 * dVar114 -
                  (dVar20 - ((h_RT[1] + h_RT[0xc]) - (h_RT[2] + h_RT[0xd])) * dVar135) * dVar108 *
                  dVar105;
        pdVar6[0x22] = dVar132 + pdVar6[0x22];
        pdVar6[0x23] = pdVar6[0x23] - dVar132;
        dVar113 = dVar113 * dVar123;
        pdVar6[0x2d] = pdVar6[0x2d] + dVar113;
        pdVar6[0x2e] = pdVar6[0x2e] - dVar113;
        pdVar6[0x38] = pdVar6[0x38] + dVar113;
        pdVar6[0x39] = pdVar6[0x39] - dVar113;
        dVar134 = -dVar108 * dVar134;
        pdVar6[0x109] = pdVar6[0x109] + dVar134;
        pdVar6[0x10a] = pdVar6[0x10a] - dVar134;
        pdVar6[0x114] = pdVar6[0x114] + dVar134;
        pdVar6[0x115] = pdVar6[0x115] - dVar134;
        dVar123 = dVar123 * local_858[2];
        pdVar6[0x11f] = pdVar6[0x11f] + dVar123;
        pdVar6[0x120] = pdVar6[0x120] - dVar123;
        pdVar6[0x12a] = pdVar6[0x12a] + dVar123;
        pdVar6[299] = pdVar6[299] - dVar123;
        pdVar6[0x1cf] = pdVar6[0x1cf] + dVar105;
        pdVar6[0x1d0] = pdVar6[0x1d0] - dVar105;
        pdVar6[0x1da] = pdVar6[0x1da] + dVar105;
        pdVar6[0x1db] = pdVar6[0x1db] - dVar105;
        dVar107 = local_858[2] * local_858[0xe];
        dVar123 = exp(dVar135 * -1781.3869969487089 + dVar119);
        dVar130 = local_858[0xd];
        dVar132 = local_858[4];
        dVar123 = dVar123 * 39000000.0;
        dVar105 = dVar50 * 1781.3869969487089 + dVar122;
        dVar108 = local_858[4] * local_858[0xd];
        dVar134 = exp((dVar120 - (double)local_7a8._0_8_) + local_678);
        dVar109 = local_858[0x10];
        dVar114 = local_858[2];
        dVar134 = dVar123 / dVar134;
        dVar110 = dVar123 * dVar107 - dVar108 * dVar134;
        local_978[2] = local_978[2] - dVar110;
        local_978[4] = local_978[4] + dVar110;
        auStack_910._8_8_ = (double)auStack_910._8_8_ - dVar110;
        auStack_910._0_8_ = dVar110 + (double)auStack_910._0_8_;
        dVar105 = dVar105 * dVar123 * dVar107 -
                  (dVar105 - ((h_RT[4] + h_RT[0xd]) - (h_RT[2] + h_RT[0xe])) * dVar135) * dVar134 *
                  dVar108;
        dVar106 = dVar106 * dVar123;
        pdVar6[0x2e] = pdVar6[0x2e] - dVar106;
        pdVar6[0x30] = pdVar6[0x30] + dVar106;
        pdVar6[0x39] = dVar106 + pdVar6[0x39];
        pdVar6[0x3a] = pdVar6[0x3a] - dVar106;
        dVar130 = dVar130 * -dVar134;
        pdVar6[0x5a] = pdVar6[0x5a] - dVar130;
        pdVar6[0x5c] = pdVar6[0x5c] + dVar130;
        pdVar6[0x65] = pdVar6[0x65] + dVar130;
        pdVar6[0x66] = pdVar6[0x66] - dVar130;
        dVar132 = -dVar134 * dVar132;
        pdVar6[0x120] = pdVar6[0x120] - dVar132;
        pdVar6[0x122] = pdVar6[0x122] + dVar132;
        pdVar6[299] = pdVar6[299] + dVar132;
        pdVar6[300] = pdVar6[300] - dVar132;
        dVar123 = dVar123 * local_858[2];
        pdVar6[0x136] = pdVar6[0x136] - dVar123;
        pdVar6[0x138] = pdVar6[0x138] + dVar123;
        pdVar6[0x141] = pdVar6[0x141] + dVar123;
        pdVar6[0x142] = pdVar6[0x142] - dVar123;
        pdVar6[0x1d0] = pdVar6[0x1d0] - dVar105;
        pdVar6[0x1d2] = pdVar6[0x1d2] + dVar105;
        pdVar6[0x1db] = pdVar6[0x1db] + dVar105;
        pdVar6[0x1dc] = pdVar6[0x1dc] - dVar105;
        dVar105 = exp(dVar121 * 1.83 + dVar135 * -110.7076664770384);
        dVar106 = local_858[0xd];
        dVar132 = local_858[9];
        dVar130 = dVar135 * 1.83 + dVar50 * 110.7076664770384;
        dVar108 = local_ae8 - (double)local_868._0_8_;
        dVar134 = exp((dVar108 - (double)local_7a8._0_8_) + (double)local_558._0_8_);
        dVar133 = local_858[0x11];
        dVar110 = local_978[9];
        dVar107 = local_978[2];
        local_8c8._0_8_ = pdVar6[0x3c];
        dVar123 = pdVar6[200];
        dVar105 = dVar105 * 19.2;
        dVar115 = dVar105 * dVar109;
        dVar114 = dVar114 * dVar109;
        auVar14._8_4_ = SUB84(local_858[0x11] * local_858[2],0);
        auVar14._0_8_ = dVar114;
        auVar14._12_4_ = (int)((ulong)(local_858[0x11] * local_858[2]) >> 0x20);
        dVar112 = dVar132 * dVar106;
        dVar130 = dVar130 * dVar105 * dVar114 -
                  (dVar105 / dVar134) *
                  (dVar130 - ((h_RT[9] + h_RT[0xd]) - (h_RT[2] + h_RT[0x10])) * dVar135) * dVar112;
        local_8a0 = pdVar6[0x2e] - dVar115;
        pdVar6[0x2e] = local_8a0;
        pdVar6[0x35] = pdVar6[0x35] + dVar115;
        pdVar6[0x39] = pdVar6[0x39] + dVar115;
        pdVar6[0x3c] = pdVar6[0x3c] - dVar115;
        dVar134 = -(dVar105 / dVar134);
        dVar106 = dVar106 * dVar134;
        pdVar6[200] = dVar123 - dVar106;
        pdVar6[0xcf] = pdVar6[0xcf] + dVar106;
        pdVar6[0xd3] = pdVar6[0xd3] + dVar106;
        pdVar6[0xd6] = pdVar6[0xd6] - dVar106;
        dVar132 = dVar132 * dVar134;
        pdVar6[0x120] = pdVar6[0x120] - dVar132;
        pdVar6[0x127] = pdVar6[0x127] + dVar132;
        pdVar6[299] = pdVar6[299] + dVar132;
        pdVar6[0x12e] = pdVar6[0x12e] - dVar132;
        dVar132 = local_858[2] * dVar105;
        pdVar6[0x162] = pdVar6[0x162] - dVar132;
        pdVar6[0x169] = pdVar6[0x169] + dVar132;
        pdVar6[0x16d] = pdVar6[0x16d] + dVar132;
        pdVar6[0x170] = pdVar6[0x170] - dVar132;
        pdVar6[0x1d0] = pdVar6[0x1d0] - dVar130;
        pdVar6[0x1d7] = pdVar6[0x1d7] + dVar130;
        pdVar6[0x1db] = pdVar6[0x1db] + dVar130;
        pdVar6[0x1de] = pdVar6[0x1de] - dVar130;
        dVar108 = (dVar108 - local_678) + (double)local_588._0_8_;
        local_8b8._0_8_ = dVar123;
        dVar123 = exp(dVar129);
        dVar106 = local_858[0xe];
        dVar109 = local_858[9];
        dVar123 = dVar123 * 132000000.0;
        dVar132 = local_858[9] * local_858[0xe];
        dVar108 = exp(dVar108);
        dVar115 = local_858[0x12];
        dVar130 = -(dVar123 / dVar108);
        dStack_aa0 = auVar14._8_8_;
        dVar114 = dVar105 * dVar114 + dVar134 * dVar112;
        dVar134 = dVar123 * dStack_aa0 + dVar130 * dVar132;
        dVar108 = dStack_aa0 * dVar20 * dVar123 -
                  (dVar20 - ((h_RT[9] + h_RT[0xe]) - (h_RT[2] + h_RT[0x11])) * dVar135) *
                  (dVar123 / dVar108) * dVar132;
        local_978[2] = (dVar107 - dVar114) - dVar134;
        local_978[9] = dVar134 + dVar110 + dVar114;
        dVar105 = (double)auStack_910._8_8_ + dVar134;
        auStack_910._8_4_ = SUB84(dVar105,0);
        auStack_910._0_8_ = (double)auStack_910._0_8_ + dVar114;
        auStack_910._12_4_ = (int)((ulong)dVar105 >> 0x20);
        dVar134 = (double)local_8f8._8_8_ - dVar134;
        local_8f8._8_4_ = SUB84(dVar134,0);
        local_8f8._0_8_ = (double)local_8f8._0_8_ - dVar114;
        local_8f8._12_4_ = (int)((ulong)dVar134 >> 0x20);
        dVar133 = dVar133 * dVar123;
        pdVar6[0x2e] = pdVar6[0x2e] - dVar133;
        pdVar6[0x35] = pdVar6[0x35] + dVar133;
        pdVar6[0x3a] = dVar133 + pdVar6[0x3a];
        pdVar6[0x3d] = pdVar6[0x3d] - dVar133;
        dVar106 = dVar106 * dVar130;
        pdVar6[200] = pdVar6[200] - dVar106;
        pdVar6[0xcf] = pdVar6[0xcf] + dVar106;
        pdVar6[0xd4] = pdVar6[0xd4] + dVar106;
        pdVar6[0xd7] = pdVar6[0xd7] - dVar106;
        dVar130 = dVar130 * dVar109;
        pdVar6[0x136] = pdVar6[0x136] - dVar130;
        pdVar6[0x13d] = pdVar6[0x13d] + dVar130;
        pdVar6[0x142] = pdVar6[0x142] + dVar130;
        pdVar6[0x145] = pdVar6[0x145] - dVar130;
        dVar123 = dVar123 * local_858[2];
        pdVar6[0x178] = pdVar6[0x178] - dVar123;
        pdVar6[0x17f] = pdVar6[0x17f] + dVar123;
        pdVar6[0x184] = pdVar6[0x184] + dVar123;
        pdVar6[0x187] = pdVar6[0x187] - dVar123;
        pdVar6[0x1d0] = pdVar6[0x1d0] - dVar108;
        pdVar6[0x1d7] = pdVar6[0x1d7] + dVar108;
        pdVar6[0x1dc] = pdVar6[0x1dc] + dVar108;
        pdVar6[0x1df] = pdVar6[0x1df] - dVar108;
        dVar110 = local_858[2] * local_858[0x12];
        dVar123 = exp(dVar121 * 1.92 + dVar135 * -2863.302828428857);
        dVar106 = local_858[0x11];
        dVar108 = local_858[4];
        dVar123 = dVar123 * 89.8;
        dVar134 = dVar135 * 1.92 + dVar50 * 2863.302828428857;
        dVar105 = local_858[4] * local_858[0x11];
        dVar120 = exp((dVar120 - (double)local_588._0_8_) + (double)local_578._0_8_);
        dVar107 = local_858[0xb];
        dVar114 = local_858[3];
        dVar132 = local_858[2];
        dVar120 = dVar123 / dVar120;
        dVar130 = dVar123 * dVar110 - dVar105 * dVar120;
        local_978[2] = local_978[2] - dVar130;
        local_978[4] = local_978[4] + dVar130;
        local_8e8 = local_8e8 - dVar130;
        dVar115 = dVar115 * dVar123;
        pdVar6[0x2e] = pdVar6[0x2e] - dVar115;
        pdVar6[0x30] = pdVar6[0x30] + dVar115;
        dVar105 = dVar134 * dVar123 * dVar110 -
                  (dVar134 - ((h_RT[4] + h_RT[0x11]) - (h_RT[2] + h_RT[0x12])) * dVar135) * dVar120
                  * dVar105;
        pdVar6[0x3d] = dVar115 + pdVar6[0x3d];
        pdVar6[0x3e] = pdVar6[0x3e] - dVar115;
        dVar106 = dVar106 * -dVar120;
        pdVar6[0x5a] = pdVar6[0x5a] - dVar106;
        pdVar6[0x5c] = pdVar6[0x5c] + dVar106;
        pdVar6[0x69] = pdVar6[0x69] + dVar106;
        pdVar6[0x6a] = pdVar6[0x6a] - dVar106;
        dVar108 = -dVar120 * dVar108;
        pdVar6[0x178] = pdVar6[0x178] - dVar108;
        pdVar6[0x17a] = pdVar6[0x17a] + dVar108;
        pdVar6[0x187] = pdVar6[0x187] + dVar108;
        pdVar6[0x188] = pdVar6[0x188] - dVar108;
        dVar123 = dVar123 * local_858[2];
        pdVar6[0x18e] = pdVar6[0x18e] - dVar123;
        pdVar6[400] = pdVar6[400] + dVar123;
        pdVar6[0x19d] = pdVar6[0x19d] + dVar123;
        pdVar6[0x19e] = pdVar6[0x19e] - dVar123;
        pdVar6[0x1d0] = pdVar6[0x1d0] - dVar105;
        pdVar6[0x1d2] = pdVar6[0x1d2] + dVar105;
        pdVar6[0x1df] = pdVar6[0x1df] + dVar105;
        pdVar6[0x1e0] = pdVar6[0x1e0] - dVar105;
        local_8f8._8_8_ = dVar130 + (double)local_8f8._8_8_;
        dVar123 = exp(dVar135 * -24053.756625465616 + dVar119);
        local_8c8._8_8_ = 0;
        local_8c8._0_8_ = dVar50 * 24053.756625465616 + dVar122;
        local_8b8._0_8_ = local_858[0xc];
        dVar120 = exp(((double)local_888._0_8_ + ((double)uVar85 - local_ae8)) - local_698);
        dVar127 = local_858[0xe];
        dVar115 = local_858[3];
        dVar133 = local_978[0xb];
        dVar109 = local_978[3];
        dVar110 = local_978[2];
        dVar123 = dVar123 * 2500000.0;
        dVar108 = dVar123 * dVar107;
        dVar105 = dVar123 * dVar114;
        dVar114 = dVar114 * dVar107;
        auVar37._8_4_ = SUB84(local_858[0xe] * local_858[3],0);
        auVar37._0_8_ = dVar114;
        auVar37._12_4_ = (int)((ulong)(local_858[0xe] * local_858[3]) >> 0x20);
        dVar132 = dVar132 * (double)local_8b8._0_8_;
        dVar107 = -(dVar123 / dVar120);
        dVar106 = (double)local_8c8._0_8_ * dVar123 * dVar114 -
                  (dVar123 / dVar120) *
                  ((double)local_8c8._0_8_ -
                  ((h_RT[2] + h_RT[0xc]) - (h_RT[3] + h_RT[0xb])) * dVar135) * dVar132;
        dVar120 = (double)local_8b8._0_8_ * dVar107;
        local_8a0 = pdVar6[0x113];
        local_8b8._0_8_ = pdVar6[0x1d9];
        pdVar6[0x2e] = pdVar6[0x2e] + dVar120;
        pdVar6[0x2f] = pdVar6[0x2f] - dVar120;
        pdVar6[0x37] = pdVar6[0x37] - dVar120;
        pdVar6[0x38] = pdVar6[0x38] + dVar120;
        pdVar6[0x44] = pdVar6[0x44] + dVar108;
        pdVar6[0x45] = pdVar6[0x45] - dVar108;
        pdVar6[0x4d] = pdVar6[0x4d] - dVar108;
        pdVar6[0x4e] = pdVar6[0x4e] + dVar108;
        pdVar6[0xf4] = pdVar6[0xf4] + dVar105;
        pdVar6[0xf5] = pdVar6[0xf5] - dVar105;
        pdVar6[0xfd] = pdVar6[0xfd] - dVar105;
        pdVar6[0xfe] = pdVar6[0xfe] + dVar105;
        dVar120 = local_858[2] * dVar107;
        pdVar6[0x10a] = pdVar6[0x10a] + dVar120;
        pdVar6[0x10b] = pdVar6[0x10b] - dVar120;
        pdVar6[0x113] = local_8a0 - dVar120;
        pdVar6[0x114] = pdVar6[0x114] + dVar120;
        pdVar6[0x1d0] = pdVar6[0x1d0] + dVar106;
        pdVar6[0x1d1] = pdVar6[0x1d1] - dVar106;
        dVar134 = dVar50 * 20128.6666321888 + dVar122;
        pdVar6[0x1d9] = (double)local_8b8._0_8_ - dVar106;
        dVar130 = (double)uVar85 - local_a08;
        pdVar6[0x1da] = pdVar6[0x1da] + dVar106;
        local_8c8._0_8_ = (dVar130 - (double)local_7a8._0_8_) + local_678;
        dVar120 = exp(dVar135 * -20128.6666321888 + dVar119);
        dVar106 = local_858[0xd];
        dVar112 = local_858[6];
        dVar120 = dVar120 * 100000000.0;
        local_8b8._8_8_ = 0;
        local_8b8._0_8_ = local_858[6] * local_858[0xd];
        dVar105 = exp((double)local_8c8._0_8_);
        dVar116 = local_858[3];
        dVar113 = local_858[1];
        dVar108 = -(dVar120 / dVar105);
        dStack_b10 = auVar37._8_8_;
        dVar114 = dVar123 * dVar114 + dVar107 * dVar132;
        dVar132 = dVar120 * dStack_b10 + dVar108 * (double)local_8b8._0_8_;
        local_978[2] = dVar110 + dVar114;
        local_978[0xb] = dVar133 - dVar114;
        dVar123 = dStack_b10 * dVar134 * dVar120 -
                  (dVar134 - ((h_RT[6] + h_RT[0xd]) - (h_RT[3] + h_RT[0xe])) * dVar135) *
                  (dVar120 / dVar105) * (double)local_8b8._0_8_;
        local_978[3] = (dVar109 - dVar114) - dVar132;
        local_978[6] = local_978[6] + dVar132;
        local_978[0xc] = dVar114 + local_978[0xc];
        auStack_910._8_8_ = (double)auStack_910._8_8_ - dVar132;
        dVar127 = dVar127 * dVar120;
        pdVar6[0x45] = pdVar6[0x45] - dVar127;
        pdVar6[0x48] = pdVar6[0x48] + dVar127;
        pdVar6[0x4f] = dVar127 + pdVar6[0x4f];
        pdVar6[0x50] = pdVar6[0x50] - dVar127;
        dVar106 = dVar106 * dVar108;
        pdVar6[0x87] = pdVar6[0x87] - dVar106;
        pdVar6[0x8a] = pdVar6[0x8a] + dVar106;
        pdVar6[0x91] = pdVar6[0x91] + dVar106;
        pdVar6[0x92] = pdVar6[0x92] - dVar106;
        dVar108 = dVar108 * dVar112;
        pdVar6[0x121] = pdVar6[0x121] - dVar108;
        pdVar6[0x124] = pdVar6[0x124] + dVar108;
        pdVar6[299] = pdVar6[299] + dVar108;
        pdVar6[300] = pdVar6[300] - dVar108;
        dVar120 = dVar120 * dVar115;
        pdVar6[0x137] = pdVar6[0x137] - dVar120;
        pdVar6[0x13a] = pdVar6[0x13a] + dVar120;
        pdVar6[0x141] = pdVar6[0x141] + dVar120;
        pdVar6[0x142] = pdVar6[0x142] - dVar120;
        pdVar6[0x1d1] = pdVar6[0x1d1] - dVar123;
        pdVar6[0x1d4] = pdVar6[0x1d4] + dVar123;
        pdVar6[0x1db] = pdVar6[0x1db] + dVar123;
        pdVar6[0x1dc] = pdVar6[0x1dc] - dVar123;
        auStack_910._0_8_ = dVar132 + (double)auStack_910._0_8_;
        dVar123 = exp(dVar135 * -7252.86180424343 + dVar119);
        dVar106 = local_858[4];
        dVar132 = local_858[2];
        dVar120 = dVar50 * 7252.86180424343 + dVar122;
        dVar105 = exp(((dVar124 - local_ae8) + (double)uVar85) - local_a48);
        dVar112 = local_978[3];
        dVar115 = local_978[2];
        dVar133 = local_978[1];
        local_ac8 = dVar124 - local_ac8;
        dVar123 = dVar123 * 83000000.0;
        dVar108 = dVar132 * dVar106;
        dVar134 = local_858[1] * local_858[6];
        dVar114 = dVar116 * dVar113;
        auVar15._8_4_ = SUB84(dVar114,0);
        auVar15._0_8_ = dVar134;
        auVar15._12_4_ = (int)((ulong)dVar114 >> 0x20);
        dVar120 = dVar114 * dVar120 * dVar123 -
                  (dVar123 / dVar105) *
                  (dVar120 - ((h_RT[2] + h_RT[4]) - (h_RT[1] + h_RT[3])) * dVar135) * dVar108;
        dVar116 = dVar116 * dVar123;
        auVar38._8_4_ = SUB84(pdVar6[0x1a] + dVar116,0);
        auVar38._0_8_ = pdVar6[0x19] - dVar116;
        auVar38._12_4_ = (int)((ulong)(pdVar6[0x1a] + dVar116) >> 0x20);
        *(undefined1 (*) [16])(pdVar6 + 0x19) = auVar38;
        pdVar6[0x17] = pdVar6[0x17] - dVar116;
        pdVar6[0x18] = dVar116 + pdVar6[0x18];
        dVar116 = -(dVar123 / dVar105);
        dVar106 = dVar106 * dVar116;
        pdVar6[0x2f] = pdVar6[0x2f] - dVar106;
        pdVar6[0x30] = pdVar6[0x30] + dVar106;
        auVar39._8_4_ = SUB84(dVar106 + pdVar6[0x2e],0);
        auVar39._0_8_ = pdVar6[0x2d] - dVar106;
        auVar39._12_4_ = (int)((ulong)(dVar106 + pdVar6[0x2e]) >> 0x20);
        *(undefined1 (*) [16])(pdVar6 + 0x2d) = auVar39;
        dVar113 = dVar113 * dVar123;
        pdVar6[0x45] = pdVar6[0x45] - dVar113;
        pdVar6[0x46] = pdVar6[0x46] + dVar113;
        auVar40._8_4_ = SUB84(dVar113 + pdVar6[0x44],0);
        auVar40._0_8_ = pdVar6[0x43] - dVar113;
        auVar40._12_4_ = (int)((ulong)(dVar113 + pdVar6[0x44]) >> 0x20);
        *(undefined1 (*) [16])(pdVar6 + 0x43) = auVar40;
        dVar132 = dVar132 * dVar116;
        auVar79._8_4_ = SUB84(pdVar6[0x5c] + dVar132,0);
        auVar79._0_8_ = pdVar6[0x5b] - dVar132;
        auVar79._12_4_ = (int)((ulong)(pdVar6[0x5c] + dVar132) >> 0x20);
        *(undefined1 (*) [16])(pdVar6 + 0x5b) = auVar79;
        auVar41._8_4_ = SUB84(dVar132 + pdVar6[0x5a],0);
        auVar41._0_8_ = pdVar6[0x59] - dVar132;
        auVar41._12_4_ = (int)((ulong)(dVar132 + pdVar6[0x5a]) >> 0x20);
        *(undefined1 (*) [16])(pdVar6 + 0x59) = auVar41;
        pdVar6[0x1cf] = pdVar6[0x1cf] - dVar120;
        pdVar6[0x1d0] = pdVar6[0x1d0] + dVar120;
        pdVar6[0x1d1] = pdVar6[0x1d1] - dVar120;
        dVar132 = dVar50 * 537.435399079441 + dVar122;
        pdVar6[0x1d2] = pdVar6[0x1d2] + dVar120;
        dVar120 = exp(dVar135 * -537.435399079441 + dVar119);
        dVar110 = local_858[3];
        dVar120 = dVar120 * 28000000.0;
        dVar106 = local_858[0] * local_858[3];
        dVar105 = exp((local_ac8 - (double)uVar85) + local_a08);
        dVar113 = local_858[6];
        dVar109 = local_858[1];
        dVar114 = -(dVar120 / dVar105);
        dStack_a80 = auVar15._8_8_;
        dVar107 = dVar120 * dVar134 + dVar114 * dVar106;
        dVar123 = dVar123 * dStack_a80 + dVar116 * dVar108;
        local_978[2] = dVar115 + dVar123;
        dVar105 = dVar132 * dVar120 * dVar134 -
                  (dVar132 - ((h_RT[0] + h_RT[3]) - (h_RT[1] + h_RT[6])) * dVar135) *
                  (dVar120 / dVar105) * dVar106;
        local_978[0] = local_978[0] + dVar107;
        local_978[1] = (dVar133 - dVar123) - dVar107;
        local_978[3] = (dVar112 - dVar123) + dVar107;
        auVar58._8_4_ = SUB84(local_978[4] + dVar123,0);
        auVar58._0_8_ = local_978[3];
        auVar58._12_4_ = (int)((ulong)(local_978[4] + dVar123) >> 0x20);
        local_978[4] = auVar58._8_8_;
        local_978[6] = local_978[6] - dVar107;
        dVar110 = dVar114 * dVar110;
        *pdVar6 = *pdVar6 + dVar110;
        pdVar6[1] = pdVar6[1] - dVar110;
        pdVar6[3] = dVar110 + pdVar6[3];
        pdVar6[6] = pdVar6[6] - dVar110;
        dVar123 = dVar120 * local_858[6];
        pdVar6[0x16] = pdVar6[0x16] + dVar123;
        pdVar6[0x17] = pdVar6[0x17] - dVar123;
        pdVar6[0x19] = pdVar6[0x19] + dVar123;
        pdVar6[0x1c] = pdVar6[0x1c] - dVar123;
        dVar114 = local_858[0] * dVar114;
        pdVar6[0x42] = pdVar6[0x42] + dVar114;
        pdVar6[0x43] = pdVar6[0x43] - dVar114;
        pdVar6[0x45] = pdVar6[0x45] + dVar114;
        pdVar6[0x48] = pdVar6[0x48] - dVar114;
        dVar120 = dVar120 * local_858[1];
        pdVar6[0x84] = pdVar6[0x84] + dVar120;
        pdVar6[0x85] = pdVar6[0x85] - dVar120;
        pdVar6[0x87] = pdVar6[0x87] + dVar120;
        pdVar6[0x8a] = pdVar6[0x8a] - dVar120;
        pdVar6[0x1ce] = pdVar6[0x1ce] + dVar105;
        pdVar6[0x1cf] = pdVar6[0x1cf] - dVar105;
        pdVar6[0x1d1] = pdVar6[0x1d1] + dVar105;
        pdVar6[0x1d4] = pdVar6[0x1d4] - dVar105;
        dVar114 = local_858[1] * local_858[6];
        dVar123 = exp(dVar135 * -319.54258278599724 + dVar119);
        dVar134 = local_858[4];
        dVar123 = dVar123 * 134000000.0;
        dVar120 = dVar50 * 319.54258278599724 + dVar122;
        dVar105 = local_858[4] * local_858[4];
        dVar108 = exp((dVar124 - (local_a48 + local_a48)) + local_a08);
        RVar86 = h_RT[1];
        dVar108 = dVar123 / dVar108;
        dVar132 = dVar123 * dVar114 - dVar105 * dVar108;
        dVar107 = local_978[1] - dVar132;
        local_978[6] = local_978[6] - dVar132;
        local_978[4] = dVar132 + dVar132 + local_978[4];
        dVar113 = dVar113 * dVar123;
        pdVar6[0x17] = pdVar6[0x17] - dVar113;
        pdVar6[0x1a] = dVar113 + dVar113 + pdVar6[0x1a];
        pdVar6[0x1c] = pdVar6[0x1c] - dVar113;
        dVar134 = dVar108 * -2.0 * dVar134;
        pdVar6[0x59] = pdVar6[0x59] - dVar134;
        pdVar6[0x5c] = dVar134 + dVar134 + pdVar6[0x5c];
        pdVar6[0x5e] = pdVar6[0x5e] - dVar134;
        dVar109 = dVar123 * dVar109;
        pdVar6[0x85] = pdVar6[0x85] - dVar109;
        dVar123 = dVar120 * dVar123 * dVar114 -
                  (dVar120 - ((h_RT[4] + h_RT[4]) - (h_RT[6] + h_RT[1])) * dVar135) * dVar108 *
                  dVar105;
        pdVar6[0x88] = dVar109 + dVar109 + pdVar6[0x88];
        pdVar6[0x8a] = pdVar6[0x8a] - dVar109;
        pdVar6[0x1cf] = pdVar6[0x1cf] - dVar123;
        pdVar6[0x1d2] = dVar123 + dVar123 + pdVar6[0x1d2];
        pdVar6[0x1d4] = pdVar6[0x1d4] - dVar123;
        dVar108 = local_858[1] * local_858[10];
        dVar123 = exp(dVar121 * 1.62 + dVar135 * -5454.868657323165);
        dVar106 = local_858[9];
        dVar123 = dVar123 * 660.0;
        dVar134 = dVar135 * 1.62 + dVar50 * 5454.868657323165;
        dVar114 = local_858[0] * local_858[9];
        dVar120 = exp((local_ac8 - (double)local_868._0_8_) + dStack_690);
        dVar105 = local_858[0];
        dVar120 = dVar123 / dVar120;
        dVar132 = dVar123 * dVar108 - dVar114 * dVar120;
        dVar134 = dVar134 * dVar123 * dVar108 -
                  (dVar134 - ((h_RT[0] + h_RT[9]) - (RVar86 + h_RT[10])) * dVar135) * dVar120 *
                  dVar114;
        local_978[0] = local_978[0] + dVar132;
        local_978[1] = dVar107 - dVar132;
        local_978[9] = local_978[9] + dVar132;
        local_978[10] = local_978[10] - dVar132;
        dVar106 = dVar106 * -dVar120;
        *pdVar6 = *pdVar6 + dVar106;
        pdVar6[1] = pdVar6[1] - dVar106;
        pdVar6[9] = dVar106 + pdVar6[9];
        pdVar6[10] = pdVar6[10] - dVar106;
        dVar108 = local_858[10] * dVar123;
        pdVar6[0x16] = pdVar6[0x16] + dVar108;
        pdVar6[0x17] = pdVar6[0x17] - dVar108;
        pdVar6[0x1f] = pdVar6[0x1f] + dVar108;
        pdVar6[0x20] = pdVar6[0x20] - dVar108;
        dVar120 = -dVar120 * local_858[0];
        pdVar6[0xc6] = pdVar6[0xc6] + dVar120;
        pdVar6[199] = pdVar6[199] - dVar120;
        pdVar6[0xcf] = pdVar6[0xcf] + dVar120;
        pdVar6[0xd0] = pdVar6[0xd0] - dVar120;
        dVar123 = dVar123 * local_858[1];
        pdVar6[0xdc] = pdVar6[0xdc] + dVar123;
        pdVar6[0xdd] = pdVar6[0xdd] - dVar123;
        pdVar6[0xe5] = pdVar6[0xe5] + dVar123;
        pdVar6[0xe6] = pdVar6[0xe6] - dVar123;
        pdVar6[0x1ce] = pdVar6[0x1ce] + dVar134;
        pdVar6[0x1cf] = pdVar6[0x1cf] - dVar134;
        pdVar6[0x1d7] = pdVar6[0x1d7] + dVar134;
        pdVar6[0x1d8] = pdVar6[0x1d8] - dVar134;
        dVar134 = local_858[1] * local_858[0xd];
        dVar123 = exp(dVar129);
        dVar132 = local_858[0xb];
        dVar123 = dVar123 * 73400000.0;
        dVar105 = dVar105 * local_858[0xb];
        dVar120 = exp((local_ac8 - (double)local_888._0_8_) + (double)local_7a8._0_8_);
        dVar114 = local_858[0xd];
        dVar108 = local_858[0];
        dVar120 = dVar123 / dVar120;
        dVar106 = dVar123 * dVar134 - dVar105 * dVar120;
        dVar105 = dVar20 * dVar123 * dVar134 -
                  (dVar20 - ((h_RT[0] + h_RT[0xb]) - (h_RT[1] + h_RT[0xd])) * dVar135) * dVar120 *
                  dVar105;
        local_978[0] = local_978[0] + dVar106;
        local_978[1] = local_978[1] - dVar106;
        auStack_910._0_8_ = (double)auStack_910._0_8_ - dVar106;
        local_978[0xb] = dVar106 + local_978[0xb];
        dVar132 = dVar132 * -dVar120;
        *pdVar6 = *pdVar6 + dVar132;
        pdVar6[1] = pdVar6[1] - dVar132;
        pdVar6[0xb] = dVar132 + pdVar6[0xb];
        pdVar6[0xd] = pdVar6[0xd] - dVar132;
        dVar134 = dVar123 * local_858[0xd];
        pdVar6[0x16] = pdVar6[0x16] + dVar134;
        pdVar6[0x17] = pdVar6[0x17] - dVar134;
        pdVar6[0x21] = pdVar6[0x21] + dVar134;
        pdVar6[0x23] = pdVar6[0x23] - dVar134;
        dVar120 = -dVar120 * local_858[0];
        pdVar6[0xf2] = pdVar6[0xf2] + dVar120;
        pdVar6[0xf3] = pdVar6[0xf3] - dVar120;
        pdVar6[0xfd] = pdVar6[0xfd] + dVar120;
        pdVar6[0xff] = pdVar6[0xff] - dVar120;
        dVar123 = dVar123 * local_858[1];
        pdVar6[0x11e] = pdVar6[0x11e] + dVar123;
        pdVar6[0x11f] = pdVar6[0x11f] - dVar123;
        pdVar6[0x129] = pdVar6[0x129] + dVar123;
        pdVar6[299] = pdVar6[299] - dVar123;
        pdVar6[0x1ce] = pdVar6[0x1ce] + dVar105;
        pdVar6[0x1cf] = pdVar6[0x1cf] - dVar105;
        pdVar6[0x1d9] = pdVar6[0x1d9] + dVar105;
        pdVar6[0x1db] = pdVar6[0x1db] - dVar105;
        dVar106 = local_858[1] * local_858[0xe];
        dVar123 = exp(dVar121 * 1.05 + dVar135 * -1648.034580510458);
        dVar123 = dVar123 * 23000.0;
        dVar105 = dVar135 * 1.05 + dVar50 * 1648.034580510458;
        dVar108 = dVar108 * dVar114;
        dVar120 = exp((local_ac8 - (double)local_7a8._0_8_) + local_678);
        dVar132 = local_858[0xf];
        dVar120 = dVar123 / dVar120;
        dVar134 = dVar123 * dVar106 - dVar108 * dVar120;
        dVar108 = dVar105 * dVar123 * dVar106 -
                  (dVar105 - ((h_RT[0] + h_RT[0xd]) - (h_RT[1] + h_RT[0xe])) * dVar135) * dVar120 *
                  dVar108;
        local_978[0] = local_978[0] + dVar134;
        local_978[1] = local_978[1] - dVar134;
        auStack_910._8_8_ = (double)auStack_910._8_8_ - dVar134;
        auStack_910._0_8_ = dVar134 + (double)auStack_910._0_8_;
        dVar114 = -dVar120 * dVar114;
        *pdVar6 = *pdVar6 + dVar114;
        pdVar6[1] = pdVar6[1] - dVar114;
        pdVar6[0xd] = dVar114 + pdVar6[0xd];
        pdVar6[0xe] = pdVar6[0xe] - dVar114;
        dVar105 = local_858[0xe] * dVar123;
        pdVar6[0x16] = pdVar6[0x16] + dVar105;
        pdVar6[0x17] = pdVar6[0x17] - dVar105;
        pdVar6[0x23] = pdVar6[0x23] + dVar105;
        pdVar6[0x24] = pdVar6[0x24] - dVar105;
        dVar120 = local_858[0] * -dVar120;
        pdVar6[0x11e] = pdVar6[0x11e] + dVar120;
        pdVar6[0x11f] = pdVar6[0x11f] - dVar120;
        pdVar6[299] = pdVar6[299] + dVar120;
        pdVar6[300] = pdVar6[300] - dVar120;
        dVar123 = dVar123 * local_858[1];
        pdVar6[0x134] = pdVar6[0x134] + dVar123;
        pdVar6[0x135] = pdVar6[0x135] - dVar123;
        pdVar6[0x141] = pdVar6[0x141] + dVar123;
        pdVar6[0x142] = pdVar6[0x142] - dVar123;
        pdVar6[0x1ce] = pdVar6[0x1ce] + dVar108;
        pdVar6[0x1cf] = pdVar6[0x1cf] - dVar108;
        pdVar6[0x1db] = pdVar6[0x1db] + dVar108;
        pdVar6[0x1dc] = pdVar6[0x1dc] - dVar108;
        dVar134 = local_858[1] * local_858[0xf];
        dVar123 = exp(dVar129);
        dVar114 = local_858[9];
        dVar108 = local_858[4];
        dVar123 = dVar123 * 32000000.0;
        dVar120 = local_858[4] * local_858[9];
        dVar105 = exp(((dVar124 - local_a48) - (double)local_868._0_8_) + (double)local_598._0_8_);
        dVar105 = dVar123 / dVar105;
        dVar106 = dVar123 * dVar134 - dVar120 * dVar105;
        local_978[1] = local_978[1] - dVar106;
        local_978[4] = local_978[4] + dVar106;
        dStack_900 = dStack_900 - dVar106;
        local_978[9] = dVar106 + local_978[9];
        dVar132 = dVar132 * dVar123;
        pdVar6[0x17] = pdVar6[0x17] - dVar132;
        pdVar6[0x1a] = pdVar6[0x1a] + dVar132;
        dVar120 = dVar20 * dVar123 * dVar134 -
                  (dVar20 - ((h_RT[4] + h_RT[9]) - (h_RT[1] + h_RT[0xf])) * dVar135) * dVar105 *
                  dVar120;
        pdVar6[0x1f] = dVar132 + pdVar6[0x1f];
        pdVar6[0x25] = pdVar6[0x25] - dVar132;
        dVar114 = dVar114 * -dVar105;
        pdVar6[0x59] = pdVar6[0x59] - dVar114;
        pdVar6[0x5c] = pdVar6[0x5c] + dVar114;
        pdVar6[0x61] = pdVar6[0x61] + dVar114;
        pdVar6[0x67] = pdVar6[0x67] - dVar114;
        dVar108 = -dVar105 * dVar108;
        pdVar6[199] = pdVar6[199] - dVar108;
        pdVar6[0xca] = pdVar6[0xca] + dVar108;
        pdVar6[0xcf] = pdVar6[0xcf] + dVar108;
        pdVar6[0xd5] = pdVar6[0xd5] - dVar108;
        dVar123 = dVar123 * local_858[1];
        pdVar6[0x14b] = pdVar6[0x14b] - dVar123;
        pdVar6[0x14e] = pdVar6[0x14e] + dVar123;
        pdVar6[0x153] = pdVar6[0x153] + dVar123;
        pdVar6[0x159] = pdVar6[0x159] - dVar123;
        pdVar6[0x1cf] = pdVar6[0x1cf] - dVar120;
        pdVar6[0x1d2] = pdVar6[0x1d2] + dVar120;
        pdVar6[0x1d7] = pdVar6[0x1d7] + dVar120;
        pdVar6[0x1dd] = pdVar6[0x1dd] - dVar120;
        dVar107 = local_858[1] * local_858[0x12];
        dVar123 = exp(dVar121 * 1.9 + dVar135 * -3789.2214935095417);
        dVar132 = local_858[0x11];
        dVar123 = dVar123 * 115.0;
        dVar105 = dVar135 * 1.9 + dVar50 * 3789.2214935095417;
        dVar108 = local_858[0] * local_858[0x11];
        dVar120 = exp((local_ac8 - (double)local_588._0_8_) + (double)local_578._0_8_);
        dVar106 = local_858[4];
        dVar114 = local_858[1];
        dVar120 = dVar123 / dVar120;
        dVar134 = dVar123 * dVar107 - dVar108 * dVar120;
        local_978[0] = local_978[0] + dVar134;
        local_978[1] = local_978[1] - dVar134;
        local_8e8 = local_8e8 - dVar134;
        local_8f8._8_8_ = dVar134 + (double)local_8f8._8_8_;
        dVar132 = dVar132 * -dVar120;
        *pdVar6 = *pdVar6 + dVar132;
        pdVar6[1] = pdVar6[1] - dVar132;
        dVar108 = dVar105 * dVar123 * dVar107 -
                  (dVar105 - ((h_RT[0] + h_RT[0x11]) - (h_RT[1] + h_RT[0x12])) * dVar135) * dVar120
                  * dVar108;
        pdVar6[0x11] = dVar132 + pdVar6[0x11];
        pdVar6[0x12] = pdVar6[0x12] - dVar132;
        dVar105 = local_858[0x12] * dVar123;
        pdVar6[0x16] = pdVar6[0x16] + dVar105;
        pdVar6[0x17] = pdVar6[0x17] - dVar105;
        pdVar6[0x27] = pdVar6[0x27] + dVar105;
        pdVar6[0x28] = pdVar6[0x28] - dVar105;
        dVar120 = -dVar120 * local_858[0];
        pdVar6[0x176] = pdVar6[0x176] + dVar120;
        pdVar6[0x177] = pdVar6[0x177] - dVar120;
        pdVar6[0x187] = pdVar6[0x187] + dVar120;
        pdVar6[0x188] = pdVar6[0x188] - dVar120;
        dVar123 = dVar123 * local_858[1];
        pdVar6[0x18c] = pdVar6[0x18c] + dVar123;
        pdVar6[0x18d] = pdVar6[0x18d] - dVar123;
        pdVar6[0x19d] = pdVar6[0x19d] + dVar123;
        pdVar6[0x19e] = pdVar6[0x19e] - dVar123;
        pdVar6[0x1ce] = pdVar6[0x1ce] + dVar108;
        pdVar6[0x1cf] = pdVar6[0x1cf] - dVar108;
        pdVar6[0x1df] = pdVar6[0x1df] + dVar108;
        pdVar6[0x1e0] = pdVar6[0x1e0] - dVar108;
        dVar108 = local_858[0] * local_858[4];
        dVar123 = exp(dVar121 * 1.51 + dVar135 * -1726.0331637101897);
        dVar123 = dVar123 * 216.0;
        dVar114 = dVar114 * local_858[5];
        dVar105 = dVar135 * 1.51 + dVar50 * 1726.0331637101897;
        dVar120 = exp((local_a48 + (double)local_788._0_8_) - dStack_a00);
        dVar132 = local_858[5];
        dVar115 = local_858[4];
        dVar120 = dVar123 / dVar120;
        dVar134 = dVar123 * dVar108 - dVar114 * dVar120;
        local_978[0] = local_978[0] - dVar134;
        local_978[1] = local_978[1] + dVar134;
        local_978[4] = local_978[4] - dVar134;
        local_978[5] = dVar134 + local_978[5];
        dVar106 = dVar106 * dVar123;
        *pdVar6 = *pdVar6 - dVar106;
        pdVar6[1] = pdVar6[1] + dVar106;
        pdVar6[4] = pdVar6[4] - dVar106;
        pdVar6[5] = dVar106 + pdVar6[5];
        dVar134 = -dVar120 * local_858[5];
        pdVar6[0x16] = pdVar6[0x16] - dVar134;
        pdVar6[0x17] = pdVar6[0x17] + dVar134;
        pdVar6[0x1a] = pdVar6[0x1a] - dVar134;
        pdVar6[0x1b] = dVar134 + pdVar6[0x1b];
        dVar134 = dVar123 * local_858[0];
        pdVar6[0x58] = pdVar6[0x58] - dVar134;
        pdVar6[0x59] = pdVar6[0x59] + dVar134;
        pdVar6[0x5c] = pdVar6[0x5c] - dVar134;
        dVar105 = dVar105 * dVar123 * dVar108 -
                  (dVar105 - ((h_RT[1] + h_RT[5]) - (h_RT[0] + h_RT[4])) * dVar135) * dVar120 *
                  dVar114;
        pdVar6[0x5d] = dVar134 + pdVar6[0x5d];
        dVar123 = local_858[1] * -dVar120;
        pdVar6[0x6e] = pdVar6[0x6e] - dVar123;
        pdVar6[0x6f] = pdVar6[0x6f] + dVar123;
        pdVar6[0x72] = pdVar6[0x72] - dVar123;
        pdVar6[0x73] = dVar123 + pdVar6[0x73];
        pdVar6[0x1ce] = pdVar6[0x1ce] - dVar105;
        pdVar6[0x1cf] = pdVar6[0x1cf] + dVar105;
        pdVar6[0x1d2] = pdVar6[0x1d2] - dVar105;
        pdVar6[0x1d3] = dVar105 + pdVar6[0x1d3];
        dVar123 = local_858[4] * local_858[4];
        dVar120 = exp(dVar121 * 2.4 + dVar135 * 1061.7871648479593);
        dVar134 = local_858[2];
        dVar120 = dVar120 * 0.0357;
        dVar114 = dVar135 * 2.4 + dVar50 * -1061.7871648479593;
        dVar105 = local_858[2] * dVar132;
        dVar108 = exp(((local_a48 + local_a48) - local_ae8) - dStack_a00);
        RVar87 = h_RT[5];
        RVar86 = h_RT[4];
        dVar133 = local_858[6];
        dVar108 = dVar120 / dVar108;
        dVar106 = dVar120 * dVar123 - dVar105 * dVar108;
        dVar123 = dVar114 * dVar120 * dVar123 -
                  (dVar114 - ((h_RT[2] + h_RT[5]) - (h_RT[4] + h_RT[4])) * dVar135) * dVar108 *
                  dVar105;
        dVar107 = local_978[4] - (dVar106 + dVar106);
        dVar132 = dVar132 * -dVar108;
        pdVar6[0x2e] = pdVar6[0x2e] + dVar132;
        pdVar6[0x30] = pdVar6[0x30] - (dVar132 + dVar132);
        pdVar6[0x31] = dVar132 + pdVar6[0x31];
        dVar120 = (dVar120 + dVar120) * dVar115;
        pdVar6[0x5a] = pdVar6[0x5a] + dVar120;
        pdVar6[0x5c] = pdVar6[0x5c] - (dVar120 + dVar120);
        pdVar6[0x5d] = dVar120 + pdVar6[0x5d];
        dVar134 = -dVar108 * dVar134;
        pdVar6[0x70] = pdVar6[0x70] + dVar134;
        pdVar6[0x72] = pdVar6[0x72] - (dVar134 + dVar134);
        pdVar6[0x73] = dVar134 + pdVar6[0x73];
        pdVar6[0x1d0] = pdVar6[0x1d0] + dVar123;
        dVar127 = local_978[5] + dVar106;
        pdVar6[0x1d2] = pdVar6[0x1d2] - (dVar123 + dVar123);
        pdVar6[0x1d3] = dVar123 + pdVar6[0x1d3];
        dVar123 = exp(dVar135 * 251.60833290236002 + dVar119);
        dVar134 = local_858[5];
        dVar114 = local_858[3];
        dVar120 = dVar50 * -251.60833290236002 + dVar122;
        dVar105 = exp(((local_a48 - (double)uVar85) - dStack_a00) + local_a08);
        dVar112 = local_858[7];
        dVar110 = local_858[4];
        dVar123 = dVar123 * 29000000.0;
        dVar109 = dVar114 * dVar134;
        dVar108 = -(dVar123 / dVar105);
        dVar115 = dVar115 * dVar133;
        dVar125 = local_858[7] * local_858[4];
        dVar105 = dVar120 * dVar123 * dVar115 -
                  (dVar123 / dVar105) *
                  (dVar120 - ((RVar87 + h_RT[3]) - (RVar86 + h_RT[6])) * dVar135) * dVar109;
        dVar134 = dVar134 * dVar108;
        pdVar6[0x45] = pdVar6[0x45] + dVar134;
        pdVar6[0x46] = pdVar6[0x46] - dVar134;
        pdVar6[0x47] = dVar134 + pdVar6[0x47];
        pdVar6[0x48] = pdVar6[0x48] - dVar134;
        dVar133 = dVar133 * dVar123;
        pdVar6[0x5b] = pdVar6[0x5b] + dVar133;
        pdVar6[0x5c] = pdVar6[0x5c] - dVar133;
        pdVar6[0x5d] = dVar133 + pdVar6[0x5d];
        pdVar6[0x5e] = pdVar6[0x5e] - dVar133;
        dVar114 = dVar114 * dVar108;
        auVar59._8_4_ = SUB84(pdVar6[0x72] - dVar114,0);
        auVar59._0_8_ = pdVar6[0x71] + dVar114;
        auVar59._12_4_ = (int)((ulong)(pdVar6[0x72] - dVar114) >> 0x20);
        *(undefined1 (*) [16])(pdVar6 + 0x71) = auVar59;
        pdVar6[0x73] = dVar114 + pdVar6[0x73];
        pdVar6[0x74] = pdVar6[0x74] - dVar114;
        dVar120 = dVar123 * local_858[4];
        pdVar6[0x87] = pdVar6[0x87] + dVar120;
        pdVar6[0x88] = pdVar6[0x88] - dVar120;
        pdVar6[0x89] = dVar120 + pdVar6[0x89];
        pdVar6[0x8a] = pdVar6[0x8a] - dVar120;
        pdVar6[0x1d1] = pdVar6[0x1d1] + dVar105;
        pdVar6[0x1d2] = pdVar6[0x1d2] - dVar105;
        pdVar6[0x1d3] = dVar105 + pdVar6[0x1d3];
        dVar132 = local_a48 - dVar124;
        pdVar6[0x1d4] = pdVar6[0x1d4] - dVar105;
        dVar120 = (double)local_878._0_8_ + dVar132;
        dVar105 = exp(dVar129);
        dVar116 = local_858[0xe];
        dVar133 = local_858[1];
        local_8b8._8_4_ = extraout_XMM0_Dc_07;
        local_8b8._0_8_ = dVar105 * 20000000.0;
        local_8b8._12_4_ = extraout_XMM0_Dd_07;
        dVar105 = local_858[1] * local_858[0xe];
        dVar120 = exp(dVar120 - local_678);
        dVar113 = local_858[8];
        dVar114 = local_858[4];
        dVar134 = -((double)local_8b8._0_8_ / dVar120);
        dVar108 = dVar123 * dVar115 + dVar108 * dVar109;
        dVar109 = (double)local_8b8._0_8_ * dVar125 + dVar134 * dVar105;
        local_978[2] = dVar106 + local_978[2];
        auVar42._8_4_ = SUB84(dVar108 + local_978[3],0);
        auVar42._0_8_ = local_978[2];
        auVar42._12_4_ = (int)((ulong)(dVar108 + local_978[3]) >> 0x20);
        local_978[3] = auVar42._8_8_;
        local_978[5] = dVar127 + dVar108;
        dVar123 = dVar125 * dVar20 * (double)local_8b8._0_8_ -
                  (dVar20 - ((h_RT[1] + h_RT[0xe]) - (h_RT[4] + h_RT[7])) * dVar135) *
                  ((double)local_8b8._0_8_ / dVar120) * dVar105;
        local_978[1] = local_978[1] + dVar109;
        local_978[4] = (dVar107 - dVar108) - dVar109;
        local_978[6] = local_978[6] - dVar108;
        auVar60._8_4_ = SUB84(local_978[7] - dVar109,0);
        auVar60._0_8_ = local_978[6];
        auVar60._12_4_ = (int)((ulong)(local_978[7] - dVar109) >> 0x20);
        local_978[7] = auVar60._8_8_;
        auStack_910._8_8_ = (double)auStack_910._8_8_ + dVar109;
        dVar116 = dVar116 * dVar134;
        pdVar6[0x17] = pdVar6[0x17] + dVar116;
        pdVar6[0x1a] = pdVar6[0x1a] - dVar116;
        pdVar6[0x1d] = pdVar6[0x1d] - dVar116;
        pdVar6[0x24] = dVar116 + pdVar6[0x24];
        dVar112 = dVar112 * (double)local_8b8._0_8_;
        pdVar6[0x59] = pdVar6[0x59] + dVar112;
        pdVar6[0x5c] = pdVar6[0x5c] - dVar112;
        pdVar6[0x5f] = pdVar6[0x5f] - dVar112;
        pdVar6[0x66] = dVar112 + pdVar6[0x66];
        dVar110 = (double)local_8b8._0_8_ * dVar110;
        pdVar6[0x9b] = pdVar6[0x9b] + dVar110;
        pdVar6[0x9e] = pdVar6[0x9e] - dVar110;
        pdVar6[0xa1] = pdVar6[0xa1] - dVar110;
        pdVar6[0xa8] = dVar110 + pdVar6[0xa8];
        dVar134 = dVar134 * dVar133;
        pdVar6[0x135] = pdVar6[0x135] + dVar134;
        pdVar6[0x138] = pdVar6[0x138] - dVar134;
        pdVar6[0x13b] = pdVar6[0x13b] - dVar134;
        pdVar6[0x142] = dVar134 + pdVar6[0x142];
        pdVar6[0x1cf] = pdVar6[0x1cf] + dVar123;
        pdVar6[0x1d2] = pdVar6[0x1d2] - dVar123;
        pdVar6[0x1d5] = pdVar6[0x1d5] - dVar123;
        pdVar6[0x1dc] = dVar123 + pdVar6[0x1dc];
        dVar120 = exp(dVar129);
        dVar134 = local_858[1];
        local_8c8._0_8_ = local_858[0xe];
        dVar105 = exp((dVar131 + dVar132) - local_678);
        dVar112 = local_858[9];
        dVar109 = local_858[4];
        uVar84 = auStack_910._8_8_;
        dVar110 = local_978[4];
        dVar107 = local_978[1];
        dVar123 = pdVar6[0x1a];
        dVar120 = dVar120 * 30000000.0;
        dVar116 = local_858[4] * local_858[9];
        dVar127 = dVar113 * dVar114;
        dVar108 = dVar134 * (double)local_8c8._0_8_;
        dVar125 = -(dVar120 / dVar105);
        dVar105 = dVar127 * dVar20 * dVar120 -
                  (dVar120 / dVar105) *
                  (dVar20 - ((h_RT[1] + h_RT[0xe]) - (h_RT[4] + h_RT[8])) * dVar135) * dVar108;
        local_8c8._0_8_ = (double)local_8c8._0_8_ * dVar125;
        pdVar6[0x17] = pdVar6[0x17] + (double)local_8c8._0_8_;
        pdVar6[0x1a] = dVar123 - (double)local_8c8._0_8_;
        pdVar6[0x1e] = pdVar6[0x1e] - (double)local_8c8._0_8_;
        pdVar6[0x24] = pdVar6[0x24] + (double)local_8c8._0_8_;
        dVar113 = dVar113 * dVar120;
        pdVar6[0x59] = pdVar6[0x59] + dVar113;
        pdVar6[0x5c] = pdVar6[0x5c] - dVar113;
        pdVar6[0x60] = pdVar6[0x60] - dVar113;
        pdVar6[0x66] = pdVar6[0x66] + dVar113;
        dVar114 = dVar114 * dVar120;
        pdVar6[0xb1] = pdVar6[0xb1] + dVar114;
        pdVar6[0xb4] = pdVar6[0xb4] - dVar114;
        pdVar6[0xb8] = pdVar6[0xb8] - dVar114;
        pdVar6[0xbe] = pdVar6[0xbe] + dVar114;
        dVar134 = dVar134 * dVar125;
        pdVar6[0x135] = pdVar6[0x135] + dVar134;
        pdVar6[0x138] = pdVar6[0x138] - dVar134;
        pdVar6[0x13c] = pdVar6[0x13c] - dVar134;
        pdVar6[0x142] = pdVar6[0x142] + dVar134;
        pdVar6[0x1cf] = pdVar6[0x1cf] + dVar105;
        pdVar6[0x1d2] = pdVar6[0x1d2] - dVar105;
        local_8c8._8_8_ = 0;
        local_8c8._0_8_ = dVar50 * 2727.4343286615826 + dVar135 * 1.6;
        pdVar6[0x1d6] = pdVar6[0x1d6] - dVar105;
        dStack_a00 = local_a48 - dStack_a00;
        pdVar6[0x1dc] = pdVar6[0x1dc] + dVar105;
        local_8a0 = (dStack_a00 - (double)local_878._0_8_) + (double)local_868._0_8_;
        local_8b8._0_8_ = dVar123;
        dVar123 = exp(dVar135 * -2727.4343286615826 + dVar121 * 1.6);
        dVar115 = local_858[5];
        dVar123 = dVar123 * 56.0;
        local_8b8._0_8_ = local_858[7];
        dVar105 = local_858[5] * local_858[7];
        dVar134 = exp(local_8a0);
        dVar113 = local_858[9];
        dVar133 = local_858[4];
        dVar114 = -(dVar123 / dVar134);
        dVar106 = dVar123 * dVar116 + dVar114 * dVar105;
        dVar120 = dVar120 * dVar127 + dVar125 * dVar108;
        local_978[1] = dVar107 + dVar120;
        auStack_910._8_8_ = dVar120 + (double)uVar84;
        dVar105 = (double)local_8c8._0_8_ * dVar123 * dVar116 -
                  ((double)local_8c8._0_8_ - ((h_RT[5] + h_RT[7]) - (h_RT[4] + h_RT[9])) * dVar135)
                  * (dVar123 / dVar134) * dVar105;
        local_978[4] = (dVar110 - dVar120) - dVar106;
        local_978[5] = local_978[5] + dVar106;
        local_978[7] = local_978[7] + dVar106;
        auVar61._8_4_ = SUB84(local_978[8] - dVar120,0);
        auVar61._0_8_ = local_978[7];
        auVar61._12_4_ = (int)((ulong)(local_978[8] - dVar120) >> 0x20);
        local_978[8] = auVar61._8_8_;
        local_978[9] = local_978[9] - dVar106;
        dVar112 = dVar112 * dVar123;
        pdVar6[0x5c] = pdVar6[0x5c] - dVar112;
        pdVar6[0x5d] = pdVar6[0x5d] + dVar112;
        pdVar6[0x5f] = dVar112 + pdVar6[0x5f];
        pdVar6[0x61] = pdVar6[0x61] - dVar112;
        local_8b8._0_8_ = (double)local_8b8._0_8_ * dVar114;
        pdVar6[0x72] = pdVar6[0x72] - (double)local_8b8._0_8_;
        pdVar6[0x73] = pdVar6[0x73] + (double)local_8b8._0_8_;
        pdVar6[0x75] = pdVar6[0x75] + (double)local_8b8._0_8_;
        pdVar6[0x77] = pdVar6[0x77] - (double)local_8b8._0_8_;
        dVar114 = dVar114 * dVar115;
        pdVar6[0x9e] = pdVar6[0x9e] - dVar114;
        pdVar6[0x9f] = pdVar6[0x9f] + dVar114;
        pdVar6[0xa1] = pdVar6[0xa1] + dVar114;
        pdVar6[0xa3] = pdVar6[0xa3] - dVar114;
        dVar123 = dVar123 * dVar109;
        pdVar6[0xca] = pdVar6[0xca] - dVar123;
        pdVar6[0xcb] = pdVar6[0xcb] + dVar123;
        pdVar6[0xcd] = pdVar6[0xcd] + dVar123;
        pdVar6[0xcf] = pdVar6[0xcf] - dVar123;
        pdVar6[0x1d2] = pdVar6[0x1d2] - dVar105;
        pdVar6[0x1d3] = pdVar6[0x1d3] + dVar105;
        pdVar6[0x1d5] = pdVar6[0x1d5] + dVar105;
        pdVar6[0x1d7] = pdVar6[0x1d7] - dVar105;
        dVar123 = local_858[4] * local_858[9];
        dVar120 = exp(dVar129);
        dVar107 = local_858[8];
        dVar134 = local_858[5];
        dVar120 = dVar120 * 25010000.0;
        dVar105 = local_858[5] * local_858[8];
        dVar108 = exp((dStack_a00 - dVar131) + (double)local_868._0_8_);
        dVar114 = local_858[4];
        dVar108 = dVar120 / dVar108;
        dVar106 = dVar120 * dVar123 - dVar105 * dVar108;
        dVar123 = dVar20 * dVar120 * dVar123 -
                  (dVar20 - ((h_RT[5] + h_RT[8]) - (h_RT[4] + h_RT[9])) * dVar135) * dVar108 *
                  dVar105;
        local_978[4] = local_978[4] - dVar106;
        local_978[5] = local_978[5] + dVar106;
        local_978[9] = local_978[9] - dVar106;
        local_978[8] = dVar106 + local_978[8];
        dVar113 = dVar113 * dVar120;
        pdVar6[0x5c] = pdVar6[0x5c] - dVar113;
        pdVar6[0x5d] = pdVar6[0x5d] + dVar113;
        pdVar6[0x60] = dVar113 + pdVar6[0x60];
        pdVar6[0x61] = pdVar6[0x61] - dVar113;
        dVar107 = dVar107 * -dVar108;
        pdVar6[0x72] = pdVar6[0x72] - dVar107;
        pdVar6[0x73] = pdVar6[0x73] + dVar107;
        pdVar6[0x76] = pdVar6[0x76] + dVar107;
        pdVar6[0x77] = pdVar6[0x77] - dVar107;
        dVar134 = -dVar108 * dVar134;
        pdVar6[0xb4] = pdVar6[0xb4] - dVar134;
        pdVar6[0xb5] = pdVar6[0xb5] + dVar134;
        pdVar6[0xb8] = pdVar6[0xb8] + dVar134;
        pdVar6[0xb9] = pdVar6[0xb9] - dVar134;
        dVar120 = dVar120 * dVar133;
        pdVar6[0xca] = pdVar6[0xca] - dVar120;
        pdVar6[0xcb] = pdVar6[0xcb] + dVar120;
        pdVar6[0xce] = pdVar6[0xce] + dVar120;
        pdVar6[0xcf] = pdVar6[0xcf] - dVar120;
        pdVar6[0x1d2] = pdVar6[0x1d2] - dVar123;
        pdVar6[0x1d3] = pdVar6[0x1d3] + dVar123;
        pdVar6[0x1d6] = pdVar6[0x1d6] + dVar123;
        pdVar6[0x1d7] = pdVar6[0x1d7] - dVar123;
        local_8c8._8_8_ = 0;
        local_8c8._0_8_ = local_858[10];
        dVar123 = exp(dVar135 * -1570.0359973107265 + dVar121 * 1.6);
        dVar110 = local_858[9];
        dVar134 = local_858[5];
        dVar120 = dVar50 * 1570.0359973107265 + dVar135 * 1.6;
        dVar105 = exp((dStack_a00 - (double)local_868._0_8_) + dStack_690);
        dVar109 = local_858[0xb];
        dVar112 = local_858[4];
        dVar115 = local_978[9];
        dVar133 = local_978[4];
        local_8b8._0_8_ = dVar121 * 1.228 + dVar135 * -35.225166606330404;
        dVar113 = dVar135 * 1.228 + dVar50 * 35.225166606330404;
        dVar123 = dVar123 * 100.0;
        dVar106 = local_858[4] * local_858[0xb];
        dVar107 = (double)local_8c8._0_8_ * dVar114;
        auVar43._8_4_ = SUB84(dVar107,0);
        auVar43._0_8_ = dVar106;
        auVar43._12_4_ = (int)((ulong)dVar107 >> 0x20);
        dVar108 = dVar134 * dVar110;
        dVar107 = dVar107 * dVar120 * dVar123 -
                  (dVar123 / dVar105) *
                  (dVar120 - ((h_RT[5] + h_RT[9]) - (h_RT[4] + h_RT[10])) * dVar135) * dVar108;
        dVar120 = (double)local_8c8._0_8_ * dVar123;
        local_518 = pdVar6[0x5c] - dVar120;
        local_520 = pdVar6[0xca];
        local_560 = pdVar6[0xd0];
        local_8a0 = pdVar6[0xe6];
        local_8c8._0_8_ = pdVar6[0x1d8];
        pdVar6[0x5c] = local_518;
        pdVar6[0x5d] = pdVar6[0x5d] + dVar120;
        pdVar6[0x61] = pdVar6[0x61] + dVar120;
        pdVar6[0x62] = pdVar6[0x62] - dVar120;
        dVar120 = -(dVar123 / dVar105);
        dVar110 = dVar110 * dVar120;
        pdVar6[0x72] = pdVar6[0x72] - dVar110;
        pdVar6[0x73] = pdVar6[0x73] + dVar110;
        pdVar6[0x77] = pdVar6[0x77] + dVar110;
        pdVar6[0x78] = pdVar6[0x78] - dVar110;
        dVar134 = dVar134 * dVar120;
        pdVar6[0xca] = local_520 - dVar134;
        pdVar6[0xcb] = pdVar6[0xcb] + dVar134;
        pdVar6[0xcf] = pdVar6[0xcf] + dVar134;
        pdVar6[0xd0] = local_560 - dVar134;
        dVar114 = dVar114 * dVar123;
        pdVar6[0xe0] = pdVar6[0xe0] - dVar114;
        pdVar6[0xe1] = pdVar6[0xe1] + dVar114;
        pdVar6[0xe5] = pdVar6[0xe5] + dVar114;
        pdVar6[0xe6] = local_8a0 - dVar114;
        pdVar6[0x1d2] = pdVar6[0x1d2] - dVar107;
        pdVar6[0x1d3] = pdVar6[0x1d3] + dVar107;
        pdVar6[0x1d7] = pdVar6[0x1d7] + dVar107;
        pdVar6[0x1d8] = pdVar6[0x1d8] - dVar107;
        dVar132 = dVar132 + (double)local_888._0_8_;
        dVar105 = exp((double)local_8b8._0_8_);
        dVar110 = local_858[0xc];
        dVar107 = local_858[1];
        local_8c8._8_4_ = extraout_XMM0_Dc_08;
        local_8c8._0_8_ = dVar105 * 47.6;
        local_8c8._12_4_ = extraout_XMM0_Dd_08;
        local_8b8._8_8_ = 0;
        local_8b8._0_8_ = local_858[1] * local_858[0xc];
        dVar105 = exp(dVar132 - local_698);
        dVar114 = local_858[4];
        dVar134 = -((double)local_8c8._0_8_ / dVar105);
        dStack_a50 = auVar43._8_8_;
        dVar116 = (double)local_8c8._0_8_ * dVar106 + dVar134 * (double)local_8b8._0_8_;
        dVar123 = dVar123 * dStack_a50 + dVar120 * dVar108;
        local_978[9] = dVar123 + dVar115;
        local_978[1] = local_978[1] + dVar116;
        local_978[4] = (dVar133 - dVar123) - dVar116;
        auVar62._8_4_ = SUB84(local_978[5] + dVar123,0);
        auVar62._0_8_ = local_978[4];
        auVar62._12_4_ = (int)((ulong)(local_978[5] + dVar123) >> 0x20);
        local_978[5] = auVar62._8_8_;
        local_978[10] = local_978[10] - dVar123;
        auVar63._8_4_ = SUB84(local_978[0xb] - dVar116,0);
        auVar63._0_8_ = local_978[10];
        auVar63._12_4_ = (int)((ulong)(local_978[0xb] - dVar116) >> 0x20);
        local_978[0xb] = auVar63._8_8_;
        dVar110 = dVar110 * dVar134;
        pdVar6[0x17] = pdVar6[0x17] + dVar110;
        pdVar6[0x1a] = pdVar6[0x1a] - dVar110;
        pdVar6[0x21] = pdVar6[0x21] - dVar110;
        dVar123 = dVar113 * (double)local_8c8._0_8_ * dVar106 -
                  (dVar113 - ((h_RT[1] + h_RT[0xc]) - (h_RT[4] + h_RT[0xb])) * dVar135) *
                  ((double)local_8c8._0_8_ / dVar105) * (double)local_8b8._0_8_;
        pdVar6[0x22] = dVar110 + pdVar6[0x22];
        dVar109 = dVar109 * (double)local_8c8._0_8_;
        pdVar6[0x59] = pdVar6[0x59] + dVar109;
        pdVar6[0x5c] = pdVar6[0x5c] - dVar109;
        pdVar6[99] = pdVar6[99] - dVar109;
        pdVar6[100] = dVar109 + pdVar6[100];
        local_8c8._0_8_ = (double)local_8c8._0_8_ * dVar112;
        pdVar6[0xf3] = pdVar6[0xf3] + (double)local_8c8._0_8_;
        pdVar6[0xf6] = pdVar6[0xf6] - (double)local_8c8._0_8_;
        pdVar6[0xfd] = pdVar6[0xfd] - (double)local_8c8._0_8_;
        pdVar6[0xfe] = (double)local_8c8._0_8_ + pdVar6[0xfe];
        dVar134 = dVar134 * dVar107;
        pdVar6[0x109] = pdVar6[0x109] + dVar134;
        pdVar6[0x10c] = pdVar6[0x10c] - dVar134;
        pdVar6[0x113] = pdVar6[0x113] - dVar134;
        pdVar6[0x114] = dVar134 + pdVar6[0x114];
        pdVar6[0x1cf] = pdVar6[0x1cf] + dVar123;
        pdVar6[0x1d2] = pdVar6[0x1d2] - dVar123;
        pdVar6[0x1d9] = pdVar6[0x1d9] - dVar123;
        pdVar6[0x1da] = dVar123 + pdVar6[0x1da];
        local_8c8._8_8_ = 0;
        local_8c8._0_8_ = local_858[0xd];
        dVar123 = exp(dVar129);
        dVar107 = local_858[0xb];
        dVar108 = local_858[5];
        dVar120 = exp((dStack_a00 - (double)local_888._0_8_) + (double)local_7a8._0_8_);
        dVar110 = local_858[0xe];
        dVar106 = local_858[4];
        uVar84 = auStack_910._0_8_;
        dVar133 = local_978[4];
        dVar113 = dVar135 * 1.18 + dVar50 * -224.93784961470985;
        dVar123 = dVar123 * 50000000.0;
        dVar132 = local_858[4] * local_858[0xe];
        dVar105 = (double)local_8c8._0_8_ * dVar114;
        auVar44._8_4_ = SUB84(dVar105,0);
        auVar44._0_8_ = dVar132;
        auVar44._12_4_ = (int)((ulong)dVar105 >> 0x20);
        local_8b8._0_8_ = dVar108 * dVar107;
        local_8b8._8_8_ = 0;
        dVar134 = dVar105 * dVar20 * dVar123 -
                  (dVar123 / dVar120) *
                  (dVar20 - ((h_RT[5] + h_RT[0xb]) - (h_RT[4] + h_RT[0xd])) * dVar135) *
                  (double)local_8b8._0_8_;
        dVar105 = (double)local_8c8._0_8_ * dVar123;
        local_518 = pdVar6[0x5c] - dVar105;
        local_520 = pdVar6[0xf6];
        local_560 = pdVar6[0xff];
        local_8a0 = pdVar6[299];
        local_8c8._0_8_ = pdVar6[0x1db];
        pdVar6[0x5c] = local_518;
        pdVar6[0x5d] = pdVar6[0x5d] + dVar105;
        pdVar6[99] = pdVar6[99] + dVar105;
        pdVar6[0x65] = pdVar6[0x65] - dVar105;
        dVar120 = -(dVar123 / dVar120);
        dVar107 = dVar107 * dVar120;
        pdVar6[0x72] = pdVar6[0x72] - dVar107;
        pdVar6[0x73] = pdVar6[0x73] + dVar107;
        pdVar6[0x79] = pdVar6[0x79] + dVar107;
        pdVar6[0x7b] = pdVar6[0x7b] - dVar107;
        dVar108 = dVar108 * dVar120;
        pdVar6[0xf6] = local_520 - dVar108;
        pdVar6[0xf7] = pdVar6[0xf7] + dVar108;
        pdVar6[0xfd] = pdVar6[0xfd] + dVar108;
        pdVar6[0xff] = local_560 - dVar108;
        dVar114 = dVar114 * dVar123;
        pdVar6[0x122] = pdVar6[0x122] - dVar114;
        pdVar6[0x123] = pdVar6[0x123] + dVar114;
        pdVar6[0x129] = pdVar6[0x129] + dVar114;
        pdVar6[299] = local_8a0 - dVar114;
        pdVar6[0x1d2] = pdVar6[0x1d2] - dVar134;
        pdVar6[0x1d3] = pdVar6[0x1d3] + dVar134;
        pdVar6[0x1d9] = pdVar6[0x1d9] + dVar134;
        pdVar6[0x1db] = pdVar6[0x1db] - dVar134;
        dVar105 = dStack_a00 - (double)local_7a8._0_8_;
        dVar108 = exp(dVar121 * 1.18 + dVar135 * 224.93784961470985);
        dVar112 = local_858[0xd];
        dVar115 = local_858[5];
        local_8c8._8_4_ = extraout_XMM0_Dc_09;
        local_8c8._0_8_ = dVar108 * 3430.0;
        local_8c8._12_4_ = extraout_XMM0_Dd_09;
        dVar108 = local_858[5] * local_858[0xd];
        dVar105 = exp(dVar105 + local_678);
        dVar109 = local_858[0x12];
        dVar107 = local_858[4];
        dVar134 = -((double)local_8c8._0_8_ / dVar105);
        dStack_a50 = auVar44._8_8_;
        dVar114 = (double)local_8c8._0_8_ * dVar132 + dVar134 * dVar108;
        dVar123 = dVar123 * dStack_a50 + dVar120 * (double)local_8b8._0_8_;
        local_978[0xb] = dVar123 + local_978[0xb];
        local_978[0xc] = dVar116 + local_978[0xc];
        dVar120 = dVar113 * (double)local_8c8._0_8_ * dVar132 -
                  (dVar113 - ((h_RT[5] + h_RT[0xd]) - (h_RT[4] + h_RT[0xe])) * dVar135) *
                  ((double)local_8c8._0_8_ / dVar105) * dVar108;
        local_978[4] = (dVar133 - dVar123) - dVar114;
        auVar64._8_4_ = SUB84(local_978[5] + dVar123,0);
        auVar64._0_8_ = local_978[4];
        auVar64._12_4_ = (int)((ulong)(local_978[5] + dVar123) >> 0x20);
        local_978[5] = auVar64._8_8_;
        local_978[5] = local_978[5] + dVar114;
        auStack_910._0_8_ = ((double)uVar84 - dVar123) + dVar114;
        auStack_910._8_8_ = (double)auStack_910._8_8_ - dVar114;
        dVar110 = dVar110 * (double)local_8c8._0_8_;
        pdVar6[0x5c] = pdVar6[0x5c] - dVar110;
        pdVar6[0x5d] = pdVar6[0x5d] + dVar110;
        pdVar6[0x65] = pdVar6[0x65] + dVar110;
        pdVar6[0x66] = pdVar6[0x66] - dVar110;
        dVar112 = dVar112 * dVar134;
        pdVar6[0x72] = pdVar6[0x72] - dVar112;
        pdVar6[0x73] = pdVar6[0x73] + dVar112;
        pdVar6[0x7b] = pdVar6[0x7b] + dVar112;
        pdVar6[0x7c] = pdVar6[0x7c] - dVar112;
        dVar134 = dVar134 * dVar115;
        pdVar6[0x122] = pdVar6[0x122] - dVar134;
        pdVar6[0x123] = pdVar6[0x123] + dVar134;
        pdVar6[299] = pdVar6[299] + dVar134;
        pdVar6[300] = pdVar6[300] - dVar134;
        dVar106 = (double)local_8c8._0_8_ * dVar106;
        pdVar6[0x138] = pdVar6[0x138] - dVar106;
        pdVar6[0x139] = pdVar6[0x139] + dVar106;
        pdVar6[0x141] = pdVar6[0x141] + dVar106;
        pdVar6[0x142] = pdVar6[0x142] - dVar106;
        pdVar6[0x1d2] = pdVar6[0x1d2] - dVar120;
        pdVar6[0x1d3] = pdVar6[0x1d3] + dVar120;
        pdVar6[0x1db] = pdVar6[0x1db] + dVar120;
        pdVar6[0x1dc] = pdVar6[0x1dc] - dVar120;
        dVar120 = exp(dVar121 * 2.12 + dVar135 * -437.79849925010643);
        dVar106 = local_858[0x11];
        dVar132 = local_858[5];
        dVar123 = dVar135 * 2.12 + dVar50 * 437.79849925010643;
        dVar105 = exp((dStack_a00 - (double)local_588._0_8_) + (double)local_578._0_8_);
        dVar112 = local_858[7];
        dVar115 = local_858[6];
        dVar133 = local_8e8;
        uVar84 = local_8f8._8_8_;
        dVar110 = local_978[4];
        dVar120 = dVar120 * 3.54;
        dVar116 = local_858[7] * local_858[6];
        dVar127 = dVar109 * dVar107;
        dVar134 = dVar132 * dVar106;
        dVar108 = dVar127 * dVar123 * dVar120 -
                  (dVar120 / dVar105) *
                  (dVar123 - ((h_RT[5] + h_RT[0x11]) - (h_RT[4] + h_RT[0x12])) * dVar135) * dVar134;
        dVar109 = dVar109 * dVar120;
        local_8a0 = pdVar6[0x5c] - dVar109;
        dVar123 = pdVar6[0x19e];
        local_8b8._0_8_ = pdVar6[0x1d2];
        pdVar6[0x5c] = local_8a0;
        pdVar6[0x5d] = pdVar6[0x5d] + dVar109;
        pdVar6[0x69] = pdVar6[0x69] + dVar109;
        pdVar6[0x6a] = pdVar6[0x6a] - dVar109;
        dVar114 = -(dVar120 / dVar105);
        dVar106 = dVar106 * dVar114;
        pdVar6[0x72] = pdVar6[0x72] - dVar106;
        pdVar6[0x73] = pdVar6[0x73] + dVar106;
        pdVar6[0x7f] = pdVar6[0x7f] + dVar106;
        pdVar6[0x80] = pdVar6[0x80] - dVar106;
        dVar132 = dVar132 * dVar114;
        pdVar6[0x17a] = pdVar6[0x17a] - dVar132;
        pdVar6[0x17b] = pdVar6[0x17b] + dVar132;
        pdVar6[0x187] = pdVar6[0x187] + dVar132;
        pdVar6[0x188] = pdVar6[0x188] - dVar132;
        dVar107 = dVar107 * dVar120;
        pdVar6[400] = pdVar6[400] - dVar107;
        pdVar6[0x191] = pdVar6[0x191] + dVar107;
        pdVar6[0x19d] = pdVar6[0x19d] + dVar107;
        pdVar6[0x19e] = dVar123 - dVar107;
        pdVar6[0x1d2] = pdVar6[0x1d2] - dVar108;
        pdVar6[0x1d3] = pdVar6[0x1d3] + dVar108;
        pdVar6[0x1df] = pdVar6[0x1df] + dVar108;
        dVar132 = local_a08 - local_a48;
        pdVar6[0x1e0] = pdVar6[0x1e0] - dVar108;
        dVar105 = (double)local_878._0_8_ + dVar132;
        local_8c8._0_8_ = dVar123;
        dVar123 = exp(dVar129);
        dVar109 = local_858[0xe];
        dVar107 = local_858[4];
        local_8b8._8_4_ = extraout_XMM0_Dc_10;
        local_8b8._0_8_ = dVar123 * 20000000.0;
        local_8b8._12_4_ = extraout_XMM0_Dd_10;
        dVar123 = local_858[4] * local_858[0xe];
        dVar105 = exp(dVar105 - local_678);
        dVar113 = local_858[9];
        dVar106 = local_858[6];
        dVar108 = -((double)local_8b8._0_8_ / dVar105);
        dVar125 = (double)local_8b8._0_8_ * dVar116 + dVar108 * dVar123;
        dVar120 = dVar120 * dVar127 + dVar114 * dVar134;
        local_8f8._8_8_ = (double)uVar84 + dVar120;
        local_8e8 = dVar133 - dVar120;
        local_978[4] = (dVar110 - dVar120) + dVar125;
        local_978[5] = local_978[5] + dVar120;
        local_978[6] = local_978[6] - dVar125;
        auStack_910._8_8_ = (double)auStack_910._8_8_ + dVar125;
        dVar109 = dVar109 * dVar108;
        pdVar6[0x5c] = pdVar6[0x5c] + dVar109;
        pdVar6[0x5e] = pdVar6[0x5e] - dVar109;
        pdVar6[0x5f] = pdVar6[0x5f] - dVar109;
        dVar123 = dVar20 * (double)local_8b8._0_8_ * dVar116 -
                  (dVar20 - ((h_RT[4] + h_RT[0xe]) - (h_RT[6] + h_RT[7])) * dVar135) *
                  ((double)local_8b8._0_8_ / dVar105) * dVar123;
        pdVar6[0x66] = dVar109 + pdVar6[0x66];
        dVar112 = dVar112 * (double)local_8b8._0_8_;
        pdVar6[0x88] = pdVar6[0x88] + dVar112;
        pdVar6[0x8a] = pdVar6[0x8a] - dVar112;
        pdVar6[0x8b] = pdVar6[0x8b] - dVar112;
        pdVar6[0x92] = dVar112 + pdVar6[0x92];
        dVar115 = (double)local_8b8._0_8_ * dVar115;
        pdVar6[0x9e] = pdVar6[0x9e] + dVar115;
        auVar65._8_4_ = SUB84(pdVar6[0xa1] - dVar115,0);
        auVar65._0_8_ = pdVar6[0xa0] - dVar115;
        auVar65._12_4_ = (int)((ulong)(pdVar6[0xa1] - dVar115) >> 0x20);
        *(undefined1 (*) [16])(pdVar6 + 0xa0) = auVar65;
        pdVar6[0xa8] = dVar115 + pdVar6[0xa8];
        dVar108 = dVar108 * dVar107;
        pdVar6[0x138] = pdVar6[0x138] + dVar108;
        auVar66._8_4_ = SUB84(pdVar6[0x13b] - dVar108,0);
        auVar66._0_8_ = pdVar6[0x13a] - dVar108;
        auVar66._12_4_ = (int)((ulong)(pdVar6[0x13b] - dVar108) >> 0x20);
        *(undefined1 (*) [16])(pdVar6 + 0x13a) = auVar66;
        pdVar6[0x142] = dVar108 + pdVar6[0x142];
        pdVar6[0x1d2] = pdVar6[0x1d2] + dVar123;
        pdVar6[0x1d4] = pdVar6[0x1d4] - dVar123;
        pdVar6[0x1d5] = pdVar6[0x1d5] - dVar123;
        pdVar6[0x1dc] = dVar123 + pdVar6[0x1dc];
        dVar120 = exp(dVar129);
        dVar108 = local_858[3];
        local_8c8._0_8_ = local_858[10];
        dVar105 = exp(((local_a08 - (double)uVar85) + (double)local_868._0_8_) - dStack_690);
        dVar112 = local_858[9];
        dVar133 = local_858[6];
        dVar109 = local_978[9];
        dVar110 = local_978[3];
        dVar123 = pdVar6[0x48];
        dVar120 = dVar120 * 1000000.0;
        dVar127 = local_858[6] * local_858[9];
        dVar126 = dVar113 * dVar106;
        dVar107 = dVar108 * (double)local_8c8._0_8_;
        dVar128 = -(dVar120 / dVar105);
        dVar105 = dVar126 * dVar20 * dVar120 -
                  (dVar120 / dVar105) *
                  (dVar20 - ((h_RT[3] + h_RT[10]) - (h_RT[6] + h_RT[9])) * dVar135) * dVar107;
        dVar134 = (double)local_8c8._0_8_ * dVar128;
        local_8a0 = pdVar6[0xe5];
        local_8c8._0_8_ = pdVar6[0x1d7];
        pdVar6[0x45] = pdVar6[0x45] + dVar134;
        pdVar6[0x48] = dVar123 - dVar134;
        pdVar6[0x4b] = pdVar6[0x4b] - dVar134;
        pdVar6[0x4c] = pdVar6[0x4c] + dVar134;
        dVar113 = dVar113 * dVar120;
        pdVar6[0x87] = pdVar6[0x87] + dVar113;
        pdVar6[0x8a] = pdVar6[0x8a] - dVar113;
        pdVar6[0x8d] = pdVar6[0x8d] - dVar113;
        pdVar6[0x8e] = pdVar6[0x8e] + dVar113;
        dVar106 = dVar106 * dVar120;
        pdVar6[0xc9] = pdVar6[0xc9] + dVar106;
        pdVar6[0xcc] = pdVar6[0xcc] - dVar106;
        pdVar6[0xcf] = pdVar6[0xcf] - dVar106;
        pdVar6[0xd0] = pdVar6[0xd0] + dVar106;
        dVar108 = dVar108 * dVar128;
        pdVar6[0xdf] = pdVar6[0xdf] + dVar108;
        pdVar6[0xe2] = pdVar6[0xe2] - dVar108;
        pdVar6[0xe5] = local_8a0 - dVar108;
        pdVar6[0xe6] = pdVar6[0xe6] + dVar108;
        pdVar6[0x1d1] = pdVar6[0x1d1] + dVar105;
        pdVar6[0x1d4] = pdVar6[0x1d4] - dVar105;
        pdVar6[0x1d7] = (double)local_8c8._0_8_ - dVar105;
        pdVar6[0x1d8] = pdVar6[0x1d8] + dVar105;
        dVar105 = ((double)local_868._0_8_ + dVar132) - (double)local_598._0_8_;
        local_8b8._0_8_ = dVar123;
        dVar123 = exp(dVar129);
        dVar113 = local_858[0xf];
        dVar106 = local_858[4];
        dVar123 = dVar123 * 20000000.0;
        dVar108 = local_858[4] * local_858[0xf];
        dVar105 = exp(dVar105);
        dVar114 = local_858[0xb];
        dVar115 = local_858[6];
        dVar134 = -(dVar123 / dVar105);
        dVar116 = dVar123 * dVar127 + dVar134 * dVar108;
        dVar120 = dVar120 * dVar126 + dVar128 * dVar107;
        local_978[3] = dVar110 + dVar120;
        local_978[7] = local_978[7] - dVar125;
        local_978[4] = local_978[4] + dVar116;
        local_978[6] = (local_978[6] - dVar120) - dVar116;
        local_978[10] = dVar120 + local_978[10];
        local_978[9] = (dVar109 - dVar120) - dVar116;
        dStack_900 = dStack_900 + dVar116;
        dVar113 = dVar113 * dVar134;
        pdVar6[0x5c] = pdVar6[0x5c] + dVar113;
        pdVar6[0x5e] = pdVar6[0x5e] - dVar113;
        pdVar6[0x61] = pdVar6[0x61] - dVar113;
        pdVar6[0x67] = dVar113 + pdVar6[0x67];
        dVar112 = dVar112 * dVar123;
        pdVar6[0x88] = pdVar6[0x88] + dVar112;
        pdVar6[0x8a] = pdVar6[0x8a] - dVar112;
        pdVar6[0x8d] = pdVar6[0x8d] - dVar112;
        pdVar6[0x93] = dVar112 + pdVar6[0x93];
        dVar133 = dVar123 * dVar133;
        pdVar6[0xca] = pdVar6[0xca] + dVar133;
        pdVar6[0xcc] = pdVar6[0xcc] - dVar133;
        pdVar6[0xcf] = pdVar6[0xcf] - dVar133;
        dVar123 = dVar20 * dVar123 * dVar127 -
                  (dVar20 - ((h_RT[4] + h_RT[0xf]) - (h_RT[6] + h_RT[9])) * dVar135) *
                  (dVar123 / dVar105) * dVar108;
        pdVar6[0xd5] = dVar133 + pdVar6[0xd5];
        dVar134 = dVar134 * dVar106;
        pdVar6[0x14e] = pdVar6[0x14e] + dVar134;
        pdVar6[0x150] = pdVar6[0x150] - dVar134;
        pdVar6[0x153] = pdVar6[0x153] - dVar134;
        pdVar6[0x159] = dVar134 + pdVar6[0x159];
        pdVar6[0x1d2] = pdVar6[0x1d2] + dVar123;
        pdVar6[0x1d4] = pdVar6[0x1d4] - dVar123;
        pdVar6[0x1d7] = pdVar6[0x1d7] - dVar123;
        pdVar6[0x1dd] = dVar123 + pdVar6[0x1dd];
        dVar123 = exp(dVar135 * -11875.913312991392 + dVar119);
        dVar106 = local_858[0xc];
        dVar108 = local_858[4];
        dVar120 = dVar50 * 11875.913312991392 + dVar122;
        dVar105 = exp((dVar132 + (double)local_888._0_8_) - local_698);
        dVar112 = local_858[7];
        dVar133 = local_858[3];
        dVar109 = local_978[0xb];
        dVar110 = local_978[4];
        dVar123 = dVar123 * 150000000.0;
        dVar134 = dVar123 * dVar115;
        dVar107 = dVar123 * dVar114;
        dVar114 = dVar114 * dVar115;
        auVar16._8_4_ = SUB84(local_858[7] * local_858[3],0);
        auVar16._0_8_ = dVar114;
        auVar16._12_4_ = (int)((ulong)(local_858[7] * local_858[3]) >> 0x20);
        dVar132 = dVar108 * dVar106;
        dVar116 = -(dVar123 / dVar105);
        dVar120 = dVar120 * dVar123 * dVar114 -
                  (dVar123 / dVar105) *
                  (dVar120 - ((h_RT[4] + h_RT[0xc]) - (h_RT[6] + h_RT[0xb])) * dVar135) * dVar132;
        dVar106 = dVar106 * dVar116;
        local_8c8._0_8_ = pdVar6[0x10e];
        local_8b8._0_8_ = pdVar6[0x113];
        pdVar6[0x5c] = pdVar6[0x5c] + dVar106;
        pdVar6[0x5e] = pdVar6[0x5e] - dVar106;
        pdVar6[99] = pdVar6[99] - dVar106;
        pdVar6[100] = pdVar6[100] + dVar106;
        pdVar6[0x88] = pdVar6[0x88] + dVar107;
        pdVar6[0x8a] = pdVar6[0x8a] - dVar107;
        pdVar6[0x8f] = pdVar6[0x8f] - dVar107;
        pdVar6[0x90] = pdVar6[0x90] + dVar107;
        pdVar6[0xf6] = pdVar6[0xf6] + dVar134;
        pdVar6[0xf8] = pdVar6[0xf8] - dVar134;
        pdVar6[0xfd] = pdVar6[0xfd] - dVar134;
        pdVar6[0xfe] = pdVar6[0xfe] + dVar134;
        dVar108 = dVar108 * dVar116;
        pdVar6[0x10c] = pdVar6[0x10c] + dVar108;
        pdVar6[0x10e] = pdVar6[0x10e] - dVar108;
        pdVar6[0x113] = pdVar6[0x113] - dVar108;
        pdVar6[0x114] = pdVar6[0x114] + dVar108;
        pdVar6[0x1d2] = pdVar6[0x1d2] + dVar120;
        pdVar6[0x1d4] = pdVar6[0x1d4] - dVar120;
        dVar106 = dVar50 * 754.82499870708 + dVar122;
        pdVar6[0x1d9] = pdVar6[0x1d9] - dVar120;
        pdVar6[0x1da] = pdVar6[0x1da] + dVar120;
        dVar108 = ((double)local_878._0_8_ + ((double)uVar85 - local_a48)) - (double)local_7a8._0_8_
        ;
        dVar120 = exp(dVar135 * -754.82499870708 + dVar119);
        dVar107 = local_858[0xd];
        dVar115 = local_858[4];
        dVar120 = dVar120 * 13200000.0;
        dVar105 = local_858[4] * local_858[0xd];
        dVar108 = exp(dVar108);
        dVar113 = local_858[7];
        dVar134 = -(dVar120 / dVar108);
        dStack_a00 = auVar16._8_8_;
        dVar123 = dVar123 * dVar114 + dVar116 * dVar132;
        dVar114 = dVar120 * dStack_a00 + dVar134 * dVar105;
        local_978[0xb] = dVar109 - dVar123;
        local_978[3] = local_978[3] - dVar114;
        local_978[4] = dVar114 + dVar110 + dVar123;
        local_978[6] = local_978[6] - dVar123;
        auVar67._8_4_ = SUB84(local_978[7] - dVar114,0);
        auVar67._0_8_ = local_978[6];
        auVar67._12_4_ = (int)((ulong)(local_978[7] - dVar114) >> 0x20);
        local_978[7] = auVar67._8_8_;
        local_978[0xc] = dVar123 + local_978[0xc];
        auStack_910._0_8_ = dVar114 + (double)auStack_910._0_8_;
        dVar112 = dVar112 * dVar120;
        pdVar6[0x45] = pdVar6[0x45] - dVar112;
        pdVar6[0x46] = pdVar6[0x46] + dVar112;
        pdVar6[0x49] = pdVar6[0x49] - dVar112;
        dVar123 = dStack_a00 * dVar106 * dVar120 -
                  (dVar106 - ((h_RT[4] + h_RT[0xd]) - (h_RT[3] + h_RT[7])) * dVar135) *
                  (dVar120 / dVar108) * dVar105;
        pdVar6[0x4f] = dVar112 + pdVar6[0x4f];
        dVar107 = dVar107 * dVar134;
        pdVar6[0x5b] = pdVar6[0x5b] - dVar107;
        pdVar6[0x5c] = pdVar6[0x5c] + dVar107;
        pdVar6[0x5f] = pdVar6[0x5f] - dVar107;
        pdVar6[0x65] = dVar107 + pdVar6[0x65];
        dVar120 = dVar120 * dVar133;
        pdVar6[0x9d] = pdVar6[0x9d] - dVar120;
        pdVar6[0x9e] = pdVar6[0x9e] + dVar120;
        pdVar6[0xa1] = pdVar6[0xa1] - dVar120;
        pdVar6[0xa7] = dVar120 + pdVar6[0xa7];
        dVar134 = dVar134 * dVar115;
        pdVar6[0x121] = pdVar6[0x121] - dVar134;
        pdVar6[0x122] = pdVar6[0x122] + dVar134;
        pdVar6[0x125] = pdVar6[0x125] - dVar134;
        pdVar6[299] = dVar134 + pdVar6[299];
        pdVar6[0x1d1] = pdVar6[0x1d1] - dVar123;
        pdVar6[0x1d2] = pdVar6[0x1d2] + dVar123;
        pdVar6[0x1d5] = pdVar6[0x1d5] - dVar123;
        pdVar6[0x1db] = dVar123 + pdVar6[0x1db];
        dVar134 = local_858[0] * local_858[7];
        dVar123 = exp(dVar135 * -3638.256493768126 + (double)local_798._0_8_);
        dVar123 = dVar123 * 0.5;
        dVar114 = local_858[1] * local_858[9];
        dVar120 = dVar50 * 3638.256493768126 + (double)local_898._0_8_;
        dVar105 = exp(((double)local_878._0_8_ + (double)local_788._0_8_) - (double)local_868._0_8_)
        ;
        dVar107 = local_858[7];
        dVar108 = local_858[1];
        dVar105 = dVar123 / dVar105;
        dVar132 = dVar123 * dVar134 - dVar114 * dVar105;
        local_978[0] = local_978[0] - dVar132;
        local_978[1] = local_978[1] + dVar132;
        local_978[7] = local_978[7] - dVar132;
        local_978[9] = dVar132 + local_978[9];
        dVar113 = dVar113 * dVar123;
        *pdVar6 = *pdVar6 - dVar113;
        pdVar6[1] = pdVar6[1] + dVar113;
        pdVar6[7] = pdVar6[7] - dVar113;
        dVar134 = dVar120 * dVar123 * dVar134 -
                  (dVar120 - ((h_RT[1] + h_RT[9]) - (h_RT[0] + h_RT[7])) * dVar135) * dVar105 *
                  dVar114;
        pdVar6[9] = dVar113 + pdVar6[9];
        dVar120 = local_858[9] * -dVar105;
        pdVar6[0x16] = pdVar6[0x16] - dVar120;
        pdVar6[0x17] = pdVar6[0x17] + dVar120;
        pdVar6[0x1d] = pdVar6[0x1d] - dVar120;
        pdVar6[0x1f] = dVar120 + pdVar6[0x1f];
        dVar123 = dVar123 * local_858[0];
        pdVar6[0x9a] = pdVar6[0x9a] - dVar123;
        pdVar6[0x9b] = pdVar6[0x9b] + dVar123;
        pdVar6[0xa1] = pdVar6[0xa1] - dVar123;
        pdVar6[0xa3] = dVar123 + pdVar6[0xa3];
        dVar123 = -dVar105 * local_858[1];
        pdVar6[0xc6] = pdVar6[0xc6] - dVar123;
        pdVar6[199] = pdVar6[199] + dVar123;
        pdVar6[0xcd] = pdVar6[0xcd] - dVar123;
        pdVar6[0xcf] = dVar123 + pdVar6[0xcf];
        pdVar6[0x1ce] = pdVar6[0x1ce] - dVar134;
        pdVar6[0x1cf] = pdVar6[0x1cf] + dVar134;
        pdVar6[0x1d5] = pdVar6[0x1d5] - dVar134;
        pdVar6[0x1d7] = dVar134 + pdVar6[0x1d7];
        dVar134 = local_858[9] * local_858[7];
        dVar123 = exp(dVar129);
        dVar105 = local_858[0x10];
        dVar123 = dVar123 * 40000000.0;
        dVar108 = dVar108 * local_858[0x10];
        dVar120 = exp((((double)local_878._0_8_ - dVar124) + (double)local_868._0_8_) -
                      (double)local_558._0_8_);
        dVar106 = local_858[10];
        dVar132 = local_858[9];
        dVar120 = dVar123 / dVar120;
        dVar133 = dVar123 * dVar134 - dVar108 * dVar120;
        local_978[1] = local_978[1] + dVar133;
        local_978[7] = local_978[7] - dVar133;
        local_8f8._0_8_ = (double)local_8f8._0_8_ + dVar133;
        dVar105 = -dVar120 * dVar105;
        pdVar6[0x17] = pdVar6[0x17] + dVar105;
        pdVar6[0x1d] = pdVar6[0x1d] - dVar105;
        pdVar6[0x1f] = pdVar6[0x1f] - dVar105;
        pdVar6[0x26] = dVar105 + pdVar6[0x26];
        dVar105 = dVar123 * local_858[9];
        pdVar6[0x9b] = pdVar6[0x9b] + dVar105;
        pdVar6[0xa1] = pdVar6[0xa1] - dVar105;
        pdVar6[0xa3] = pdVar6[0xa3] - dVar105;
        pdVar6[0xaa] = dVar105 + pdVar6[0xaa];
        dVar107 = dVar123 * dVar107;
        pdVar6[199] = pdVar6[199] + dVar107;
        pdVar6[0xcd] = pdVar6[0xcd] - dVar107;
        pdVar6[0xcf] = pdVar6[0xcf] - dVar107;
        dVar123 = dVar20 * dVar123 * dVar134 -
                  (dVar20 - ((h_RT[1] + h_RT[0x10]) - (h_RT[7] + h_RT[9])) * dVar135) * dVar120 *
                  dVar108;
        pdVar6[0xd6] = dVar107 + pdVar6[0xd6];
        dVar120 = local_858[1] * -dVar120;
        pdVar6[0x161] = pdVar6[0x161] + dVar120;
        pdVar6[0x167] = pdVar6[0x167] - dVar120;
        pdVar6[0x169] = pdVar6[0x169] - dVar120;
        pdVar6[0x170] = dVar120 + pdVar6[0x170];
        pdVar6[0x1cf] = pdVar6[0x1cf] + dVar123;
        pdVar6[0x1d5] = pdVar6[0x1d5] - dVar123;
        pdVar6[0x1d7] = pdVar6[0x1d7] - dVar123;
        pdVar6[0x1de] = dVar123 + pdVar6[0x1de];
        dVar123 = exp(dVar135 * -4161.601826205035 + (double)local_798._0_8_);
        dVar120 = dVar50 * 4161.601826205035 + (double)local_898._0_8_;
        local_798._0_8_ = (double)local_868._0_8_ * -2.0;
        dVar105 = exp((double)local_868._0_8_ * -2.0 + (double)local_878._0_8_ + dStack_690);
        RVar86 = h_RT[7];
        dVar110 = local_858[0x13];
        dVar134 = local_858[8];
        uStack_a60 = auVar12._8_8_;
        dVar115 = dVar131 - (double)local_878._0_8_;
        local_548._0_8_ = (dVar115 + (double)local_548._0_8_) - (double)local_548._0_8_;
        local_548._8_8_ = uStack_a60;
        local_898._8_8_ = uStack_a60;
        local_898._0_8_ = (dVar115 + (double)local_4f8._0_8_) - (double)local_4f8._0_8_;
        dVar123 = dVar123 * 2.46;
        dVar105 = dVar123 / dVar105;
        dVar132 = dVar132 * dVar132;
        auVar80._8_4_ = SUB84(local_858[0x13] * local_858[7],0);
        auVar80._0_8_ = dVar132;
        auVar80._12_4_ = (int)((ulong)(local_858[0x13] * local_858[7]) >> 0x20);
        dVar108 = dVar123 * dVar106;
        dVar106 = dVar106 * local_858[7];
        auVar81._8_4_ = SUB84(local_858[0x13] * local_858[8],0);
        auVar81._0_8_ = dVar106;
        auVar81._12_4_ = (int)((ulong)(local_858[0x13] * local_858[8]) >> 0x20);
        dVar107 = dVar120 * dVar123 * dVar106 -
                  (dVar120 - ((h_RT[9] + h_RT[9]) - (h_RT[10] + h_RT[7])) * dVar135) * dVar105 *
                  dVar132;
        dVar114 = dVar105 * -2.0 * local_858[9];
        dVar120 = dVar123 * local_858[7];
        pdVar6[0xa1] = pdVar6[0xa1] - dVar108;
        pdVar6[0xa3] = dVar108 + dVar108 + pdVar6[0xa3];
        pdVar6[0xa4] = pdVar6[0xa4] - dVar108;
        pdVar6[0xcd] = pdVar6[0xcd] - dVar114;
        pdVar6[0xcf] = dVar114 + dVar114 + pdVar6[0xcf];
        pdVar6[0xd0] = pdVar6[0xd0] - dVar114;
        pdVar6[0xe3] = pdVar6[0xe3] - dVar120;
        pdVar6[0xe5] = dVar120 + dVar120 + pdVar6[0xe5];
        pdVar6[0xe6] = pdVar6[0xe6] - dVar120;
        pdVar6[0x1d5] = pdVar6[0x1d5] - dVar107;
        pdVar6[0x1d7] = dVar107 + dVar107 + pdVar6[0x1d7];
        dVar120 = dVar135 * -301.929999482832 + dVar119;
        local_4f8._8_8_ = 0;
        local_4f8._0_8_ = dVar120;
        pdVar6[0x1d8] = pdVar6[0x1d8] - dVar107;
        dVar114 = dVar50 * 301.929999482832 + dVar122;
        dVar112 = ((((double)uVar85 - dVar124) - local_a48) + dVar131) - (double)local_888._0_8_;
        dVar120 = exp(dVar120);
        dVar120 = dVar120 * 15000000.0;
        dVar108 = exp((double)local_548._0_8_);
        RVar87 = h_RT[8];
        dVar109 = local_858[0x14];
        dVar107 = local_858[7];
        dVar108 = dVar120 / dVar108;
        dStack_a00 = auVar80._8_8_;
        dStack_b00 = auVar81._8_8_;
        local_548._0_8_ = dVar123 * dVar106 - dVar132 * dVar105;
        local_548._8_8_ = dVar120 * dStack_b00 - dStack_a00 * dVar108;
        auVar17._8_4_ = SUB84(local_978[10] - (double)local_548._0_8_,0);
        auVar17._0_8_ = local_978[9] - dVar133;
        auVar17._12_4_ = (int)((ulong)(local_978[10] - (double)local_548._0_8_) >> 0x20);
        local_978[10] = auVar17._8_8_;
        auVar68._8_4_ = (int)local_548._8_8_;
        auVar68._0_8_ = local_548._0_8_;
        auVar68._12_4_ = (int)((ulong)local_548._8_8_ >> 0x20);
        local_978[9] = (double)local_548._0_8_ + (double)local_548._0_8_ + (local_978[9] - dVar133);
        dVar105 = dStack_b00 * dVar114 * dVar120 -
                  dStack_a00 *
                  (dVar114 - ((h_RT[0x13] + RVar86) - (h_RT[8] + h_RT[0x13])) * dVar135) * dVar108;
        local_548._0_8_ = local_978[7] - (double)local_548._0_8_;
        local_548._8_8_ = local_978[8] - (double)local_548._8_8_;
        dVar123 = dVar120 * dVar110;
        dVar110 = dVar110 * -dVar108;
        pdVar6[0xa1] = pdVar6[0xa1] + dVar110;
        pdVar6[0xa2] = pdVar6[0xa2] - dVar110;
        pdVar6[0xb7] = dVar123 + pdVar6[0xb7];
        pdVar6[0xb8] = pdVar6[0xb8] - dVar123;
        dVar123 = dVar134 * dVar120 + -dVar108 * local_858[7];
        pdVar6[0x1a9] = pdVar6[0x1a9] + dVar123;
        pdVar6[0x1aa] = pdVar6[0x1aa] - dVar123;
        pdVar6[0x1d5] = pdVar6[0x1d5] + dVar105;
        pdVar6[0x1d6] = pdVar6[0x1d6] - dVar105;
        dVar123 = exp((double)local_4f8._0_8_);
        dVar123 = dVar123 * 9000000.0;
        dVar120 = dVar107 * dVar109;
        dVar105 = exp((double)local_898._0_8_);
        dVar106 = local_858[8];
        dVar105 = dVar123 / dVar105;
        local_4f8._8_4_ = extraout_XMM0_Dc_11;
        local_4f8._0_8_ = -dVar105;
        local_4f8._12_4_ = extraout_XMM0_Dd_11 ^ 0x80000000;
        dVar134 = dVar109 * dVar134;
        local_898._8_4_ = SUB84(local_858[8] * local_858[3],0);
        local_898._0_8_ = dVar134;
        local_898._12_4_ = (int)((ulong)(local_858[8] * local_858[3]) >> 0x20);
        dVar134 = dVar114 * dVar123 * dVar134 -
                  (dVar114 - ((h_RT[0x14] + h_RT[7]) - (RVar87 + h_RT[0x14])) * dVar135) * dVar105 *
                  dVar120;
        dVar108 = dVar109 * -dVar105;
        pdVar6[0xa1] = pdVar6[0xa1] + dVar108;
        pdVar6[0xa2] = pdVar6[0xa2] - dVar108;
        pdVar6[0xb7] = dVar123 * dVar109 + pdVar6[0xb7];
        pdVar6[0xb8] = pdVar6[0xb8] - dVar123 * dVar109;
        dVar105 = dVar123 * local_858[8] - dVar105 * dVar107;
        pdVar6[0x1bf] = pdVar6[0x1bf] + dVar105;
        pdVar6[0x1c0] = pdVar6[0x1c0] - dVar105;
        pdVar6[0x1d5] = pdVar6[0x1d5] + dVar134;
        pdVar6[0x1d6] = pdVar6[0x1d6] - dVar134;
        dVar105 = exp(dVar129);
        dVar110 = local_858[0xb];
        dVar132 = local_858[4];
        dVar114 = local_858[1];
        dVar105 = dVar105 * 28000000.0;
        dVar134 = local_858[1] * local_858[4] * local_858[0xb];
        dVar108 = exp(dVar112);
        dVar107 = local_858[8];
        dVar117 = dVar105 / (dVar117 * dVar108);
        dVar108 = -dVar117;
        dVar123 = dVar123 * (double)local_898._0_8_ + (double)local_4f8._0_8_ * dVar120;
        dVar120 = dVar105 * (double)local_898._8_8_ + dVar108 * dVar134;
        dStack_ae0 = auVar68._8_8_;
        local_978[1] = local_978[1] + dVar120;
        local_978[3] = local_978[3] - dVar120;
        local_978[4] = local_978[4] + dVar120;
        local_978[7] = (double)local_548._0_8_ + dStack_ae0 + dVar123;
        dVar123 = ((double)local_548._8_8_ - dVar123) - dVar120;
        auVar82._8_4_ = SUB84(dVar123,0);
        auVar82._0_8_ = local_978[7];
        auVar82._12_4_ = (int)((ulong)dVar123 >> 0x20);
        local_978[8] = auVar82._8_8_;
        local_978[0xb] = local_978[0xb] + dVar120;
        dVar123 = dVar132 * dVar108 * dVar110;
        pdVar6[0x17] = pdVar6[0x17] + dVar123;
        pdVar6[0x19] = pdVar6[0x19] - dVar123;
        pdVar6[0x1a] = pdVar6[0x1a] + dVar123;
        pdVar6[0x1e] = pdVar6[0x1e] - dVar123;
        pdVar6[0x21] = dVar123 + pdVar6[0x21];
        dVar106 = dVar106 * dVar105;
        pdVar6[0x43] = pdVar6[0x43] + dVar106;
        pdVar6[0x45] = pdVar6[0x45] - dVar106;
        pdVar6[0x46] = pdVar6[0x46] + dVar106;
        pdVar6[0x4a] = pdVar6[0x4a] - dVar106;
        pdVar6[0x4d] = dVar106 + pdVar6[0x4d];
        dVar110 = dVar108 * dVar114 * dVar110;
        pdVar6[0x59] = pdVar6[0x59] + dVar110;
        pdVar6[0x5b] = pdVar6[0x5b] - dVar110;
        pdVar6[0x5c] = pdVar6[0x5c] + dVar110;
        pdVar6[0x60] = pdVar6[0x60] - dVar110;
        pdVar6[99] = dVar110 + pdVar6[99];
        dVar123 = dVar105 * local_858[3];
        pdVar6[0xb1] = pdVar6[0xb1] + dVar123;
        pdVar6[0xb3] = pdVar6[0xb3] - dVar123;
        pdVar6[0xb4] = pdVar6[0xb4] + dVar123;
        pdVar6[0xb8] = pdVar6[0xb8] - dVar123;
        pdVar6[0xbb] = dVar123 + pdVar6[0xbb];
        dVar123 = local_858[1] * dVar108 * local_858[4];
        pdVar6[0xf3] = pdVar6[0xf3] + dVar123;
        pdVar6[0xf5] = pdVar6[0xf5] - dVar123;
        pdVar6[0xf6] = pdVar6[0xf6] + dVar123;
        pdVar6[0xfa] = pdVar6[0xfa] - dVar123;
        dVar117 = (double)local_898._8_8_ * dVar20 * dVar105 -
                  (dVar20 - (((h_RT[1] + h_RT[4] + h_RT[0xb]) - (h_RT[3] + h_RT[8])) + -1.0) *
                            dVar135) * dVar117 * dVar134;
        pdVar6[0xfd] = dVar123 + pdVar6[0xfd];
        pdVar6[0x1cf] = pdVar6[0x1cf] + dVar117;
        pdVar6[0x1d1] = pdVar6[0x1d1] - dVar117;
        pdVar6[0x1d2] = pdVar6[0x1d2] + dVar117;
        pdVar6[0x1d6] = pdVar6[0x1d6] - dVar117;
        pdVar6[0x1d9] = dVar117 + pdVar6[0x1d9];
        dVar132 = local_858[3] * local_858[8];
        dVar117 = exp(dVar129);
        dVar108 = local_858[0xb];
        dVar105 = local_858[5];
        dVar117 = dVar117 * 12000000.0;
        dVar123 = local_858[5] * local_858[0xb];
        dVar120 = exp((((double)uVar85 - dVar118) + dVar131) - (double)local_888._0_8_);
        dVar114 = local_858[8];
        dVar120 = dVar117 / dVar120;
        dVar134 = dVar117 * dVar132 - dVar123 * dVar120;
        local_978[3] = local_978[3] - dVar134;
        local_978[5] = local_978[5] + dVar134;
        local_978[8] = local_978[8] - dVar134;
        local_978[0xb] = dVar134 + local_978[0xb];
        dVar107 = dVar107 * dVar117;
        pdVar6[0x45] = pdVar6[0x45] - dVar107;
        pdVar6[0x47] = pdVar6[0x47] + dVar107;
        pdVar6[0x4a] = pdVar6[0x4a] - dVar107;
        pdVar6[0x4d] = dVar107 + pdVar6[0x4d];
        dVar108 = dVar108 * -dVar120;
        pdVar6[0x71] = pdVar6[0x71] - dVar108;
        pdVar6[0x73] = pdVar6[0x73] + dVar108;
        pdVar6[0x76] = pdVar6[0x76] - dVar108;
        dVar123 = dVar20 * dVar117 * dVar132 -
                  (dVar20 - ((h_RT[5] + h_RT[0xb]) - (h_RT[3] + h_RT[8])) * dVar135) * dVar120 *
                  dVar123;
        pdVar6[0x79] = dVar108 + pdVar6[0x79];
        dVar117 = dVar117 * local_858[3];
        pdVar6[0xb3] = pdVar6[0xb3] - dVar117;
        pdVar6[0xb5] = pdVar6[0xb5] + dVar117;
        pdVar6[0xb8] = pdVar6[0xb8] - dVar117;
        pdVar6[0xbb] = dVar117 + pdVar6[0xbb];
        dVar105 = -dVar120 * dVar105;
        pdVar6[0xf5] = pdVar6[0xf5] - dVar105;
        pdVar6[0xf7] = pdVar6[0xf7] + dVar105;
        pdVar6[0xfa] = pdVar6[0xfa] - dVar105;
        pdVar6[0xfd] = dVar105 + pdVar6[0xfd];
        pdVar6[0x1d1] = pdVar6[0x1d1] - dVar123;
        pdVar6[0x1d3] = pdVar6[0x1d3] + dVar123;
        pdVar6[0x1d6] = pdVar6[0x1d6] - dVar123;
        pdVar6[0x1d9] = dVar123 + pdVar6[0x1d9];
        dVar117 = local_858[0] * local_858[8];
        dVar123 = exp(dVar129);
        dVar123 = dVar123 * 70000000.0;
        dVar120 = local_858[1] * local_858[9];
        dVar105 = exp(((double)local_788._0_8_ + dVar131) - (double)local_868._0_8_);
        dVar132 = local_858[8];
        dVar134 = local_858[5];
        dVar108 = local_858[1];
        dVar105 = dVar123 / dVar105;
        dVar106 = dVar123 * dVar117 - dVar120 * dVar105;
        local_978[0] = local_978[0] - dVar106;
        local_978[1] = local_978[1] + dVar106;
        local_978[8] = local_978[8] - dVar106;
        local_978[9] = dVar106 + local_978[9];
        dVar114 = dVar114 * dVar123;
        *pdVar6 = *pdVar6 - dVar114;
        pdVar6[1] = pdVar6[1] + dVar114;
        pdVar6[8] = pdVar6[8] - dVar114;
        pdVar6[9] = dVar114 + pdVar6[9];
        dVar114 = local_858[9] * -dVar105;
        pdVar6[0x16] = pdVar6[0x16] - dVar114;
        pdVar6[0x17] = pdVar6[0x17] + dVar114;
        pdVar6[0x1e] = pdVar6[0x1e] - dVar114;
        pdVar6[0x1f] = dVar114 + pdVar6[0x1f];
        dVar114 = dVar123 * local_858[0];
        pdVar6[0xb0] = pdVar6[0xb0] - dVar114;
        pdVar6[0xb1] = pdVar6[0xb1] + dVar114;
        pdVar6[0xb8] = pdVar6[0xb8] - dVar114;
        dVar123 = dVar20 * dVar123 * dVar117 -
                  (dVar20 - ((h_RT[1] + h_RT[9]) - (h_RT[0] + h_RT[8])) * dVar135) * dVar105 *
                  dVar120;
        pdVar6[0xb9] = dVar114 + pdVar6[0xb9];
        dVar117 = -dVar105 * local_858[1];
        pdVar6[0xc6] = pdVar6[0xc6] - dVar117;
        pdVar6[199] = pdVar6[199] + dVar117;
        pdVar6[0xce] = pdVar6[0xce] - dVar117;
        pdVar6[0xcf] = dVar117 + pdVar6[0xcf];
        pdVar6[0x1ce] = pdVar6[0x1ce] - dVar123;
        pdVar6[0x1cf] = pdVar6[0x1cf] + dVar123;
        pdVar6[0x1d6] = pdVar6[0x1d6] - dVar123;
        pdVar6[0x1d7] = dVar123 + pdVar6[0x1d7];
        dVar120 = local_858[5] * local_858[8];
        dVar117 = exp(dVar129);
        dVar114 = local_858[7];
        dVar117 = dVar117 * 30000000.0;
        dVar105 = dVar134 * local_858[7];
        dVar123 = exp(((dVar118 - dVar118) - (double)local_878._0_8_) + dVar131);
        RVar86 = h_RT[8];
        dVar106 = local_858[9];
        dVar123 = dVar117 / dVar123;
        dVar118 = dVar117 * dVar120 - dVar105 * dVar123;
        dVar120 = dVar20 * dVar117 * dVar120 -
                  (dVar20 - ((h_RT[5] + h_RT[7]) - (h_RT[5] + h_RT[8])) * dVar135) * dVar123 *
                  dVar105;
        local_978[7] = local_978[7] + dVar118;
        dVar118 = local_978[8] - dVar118;
        dVar105 = dVar117 * dVar132 - dVar123 * dVar114;
        pdVar6[0x75] = pdVar6[0x75] + dVar105;
        pdVar6[0x76] = pdVar6[0x76] - dVar105;
        pdVar6[0xa1] = -dVar123 * dVar134 + pdVar6[0xa1];
        pdVar6[0xa2] = pdVar6[0xa2] - -dVar123 * dVar134;
        pdVar6[0xb7] = pdVar6[0xb7] + dVar117 * dVar134;
        pdVar6[0xb8] = pdVar6[0xb8] - dVar117 * dVar134;
        pdVar6[0x1d5] = pdVar6[0x1d5] + dVar120;
        pdVar6[0x1d6] = pdVar6[0x1d6] - dVar120;
        dVar132 = dVar132 * local_858[9];
        dVar117 = dVar135 * 286.8334995086904 + dVar119;
        dVar123 = exp(dVar117);
        dVar105 = local_858[0x10];
        dVar123 = dVar123 * 12000000.0;
        local_878._8_8_ = 0;
        local_878._0_8_ = dVar50 * -286.8334995086904 + dVar122;
        dVar108 = dVar108 * local_858[0x10];
        dVar120 = exp(((dVar131 - dVar124) + (double)local_868._0_8_) - (double)local_558._0_8_);
        dVar124 = local_858[10];
        dVar134 = local_858[8];
        dVar120 = dVar123 / dVar120;
        dVar114 = dVar123 * dVar132 - dVar108 * dVar120;
        local_978[1] = local_978[1] + dVar114;
        local_978[8] = dVar118 - dVar114;
        local_978[9] = local_978[9] - dVar114;
        local_8f8._0_8_ = dVar114 + (double)local_8f8._0_8_;
        dVar118 = (double)local_878._0_8_ * dVar123 * dVar132 -
                  ((double)local_878._0_8_ - ((h_RT[1] + h_RT[0x10]) - (RVar86 + h_RT[9])) * dVar135
                  ) * dVar120 * dVar108;
        dVar105 = -dVar120 * dVar105;
        pdVar6[0x17] = pdVar6[0x17] + dVar105;
        pdVar6[0x1e] = pdVar6[0x1e] - dVar105;
        pdVar6[0x1f] = pdVar6[0x1f] - dVar105;
        pdVar6[0x26] = dVar105 + pdVar6[0x26];
        dVar106 = dVar106 * dVar123;
        pdVar6[0xb1] = pdVar6[0xb1] + dVar106;
        auVar69._8_4_ = SUB84(pdVar6[0xb9] - dVar106,0);
        auVar69._0_8_ = pdVar6[0xb8] - dVar106;
        auVar69._12_4_ = (int)((ulong)(pdVar6[0xb9] - dVar106) >> 0x20);
        *(undefined1 (*) [16])(pdVar6 + 0xb8) = auVar69;
        pdVar6[0xc0] = dVar106 + pdVar6[0xc0];
        dVar123 = dVar123 * local_858[8];
        pdVar6[199] = pdVar6[199] + dVar123;
        auVar70._8_4_ = SUB84(pdVar6[0xcf] - dVar123,0);
        auVar70._0_8_ = pdVar6[0xce] - dVar123;
        auVar70._12_4_ = (int)((ulong)(pdVar6[0xcf] - dVar123) >> 0x20);
        *(undefined1 (*) [16])(pdVar6 + 0xce) = auVar70;
        pdVar6[0xd6] = dVar123 + pdVar6[0xd6];
        dVar123 = local_858[1] * -dVar120;
        pdVar6[0x161] = pdVar6[0x161] + dVar123;
        auVar45._8_4_ = SUB84(pdVar6[0x169] - dVar123,0);
        auVar45._0_8_ = pdVar6[0x168] - dVar123;
        auVar45._12_4_ = (int)((ulong)(pdVar6[0x169] - dVar123) >> 0x20);
        *(undefined1 (*) [16])(pdVar6 + 0x168) = auVar45;
        pdVar6[0x170] = dVar123 + pdVar6[0x170];
        pdVar6[0x1cf] = pdVar6[0x1cf] + dVar118;
        pdVar6[0x1d6] = pdVar6[0x1d6] - dVar118;
        pdVar6[0x1d7] = pdVar6[0x1d7] - dVar118;
        pdVar6[0x1de] = dVar118 + pdVar6[0x1de];
        dVar132 = local_858[8] * local_858[10];
        dVar117 = exp(dVar117);
        dVar118 = local_858[9];
        dVar117 = dVar117 * 16000000.0;
        dVar123 = local_858[9] * local_858[9];
        dVar120 = exp((double)local_798._0_8_ + dVar131 + dStack_690);
        RVar87 = h_RT[8];
        dVar114 = local_858[0xb];
        dVar108 = local_858[8];
        dVar120 = dVar117 / dVar120;
        dVar105 = dVar117 * dVar132 - dVar123 * dVar120;
        dVar133 = local_978[8] - dVar105;
        local_978[10] = local_978[10] - dVar105;
        local_978[9] = dVar105 + dVar105 + local_978[9];
        dVar124 = dVar124 * dVar117;
        pdVar6[0xb8] = pdVar6[0xb8] - dVar124;
        pdVar6[0xb9] = dVar124 + dVar124 + pdVar6[0xb9];
        pdVar6[0xba] = pdVar6[0xba] - dVar124;
        dVar118 = dVar120 * -2.0 * dVar118;
        pdVar6[0xce] = pdVar6[0xce] - dVar118;
        pdVar6[0xcf] = dVar118 + dVar118 + pdVar6[0xcf];
        pdVar6[0xd0] = pdVar6[0xd0] - dVar118;
        dVar134 = dVar117 * dVar134;
        pdVar6[0xe4] = pdVar6[0xe4] - dVar134;
        dVar117 = (double)local_878._0_8_ * dVar117 * dVar132 -
                  ((double)local_878._0_8_ - ((h_RT[9] + h_RT[9]) - (h_RT[10] + h_RT[8])) * dVar135)
                  * dVar120 * dVar123;
        pdVar6[0xe5] = dVar134 + dVar134 + pdVar6[0xe5];
        pdVar6[0xe6] = pdVar6[0xe6] - dVar134;
        pdVar6[0x1d6] = pdVar6[0x1d6] - dVar117;
        pdVar6[0x1d7] = dVar117 + dVar117 + pdVar6[0x1d7];
        pdVar6[0x1d8] = pdVar6[0x1d8] - dVar117;
        dVar117 = local_858[8] * local_858[0xb];
        dVar123 = exp(dVar129);
        dVar123 = dVar123 * 9000000.0;
        local_878._0_8_ = local_858[7];
        dVar120 = local_858[7] * dVar114;
        dVar118 = exp(((double)local_888._0_8_ + dVar115) - (double)local_888._0_8_);
        RVar86 = h_RT[7];
        dVar105 = local_858[0xc];
        dVar118 = dVar123 / dVar118;
        dVar112 = dVar123 * dVar117 - dVar120 * dVar118;
        dVar124 = dVar112 + local_978[7];
        pdVar6[0xa1] = pdVar6[0xa1] + -dVar118 * dVar114;
        pdVar6[0xa2] = pdVar6[0xa2] - -dVar118 * dVar114;
        dVar117 = dVar20 * dVar123 * dVar117 -
                  (dVar20 - ((h_RT[0xb] + h_RT[7]) - (RVar87 + h_RT[0xb])) * dVar135) * dVar118 *
                  dVar120;
        pdVar6[0xb7] = dVar114 * dVar123 + pdVar6[0xb7];
        pdVar6[0xb8] = pdVar6[0xb8] - dVar114 * dVar123;
        dVar123 = dVar123 * dVar108 - dVar118 * (double)local_878._0_8_;
        pdVar6[0xf9] = pdVar6[0xf9] + dVar123;
        pdVar6[0xfa] = pdVar6[0xfa] - dVar123;
        pdVar6[0x1d5] = pdVar6[0x1d5] + dVar117;
        pdVar6[0x1d6] = pdVar6[0x1d6] - dVar117;
        dVar108 = dVar108 * local_858[0xc];
        dVar117 = exp(dVar129);
        dVar117 = dVar117 * 7000000.0;
        dVar123 = (double)local_878._0_8_ * dVar105;
        dVar120 = exp((dVar115 + local_698) - local_698);
        dVar118 = local_858[8];
        dVar120 = dVar117 / dVar120;
        dVar134 = h_RT[8] + h_RT[0xc];
        dVar115 = dVar117 * dVar108 - dVar123 * dVar120;
        dVar123 = dVar20 * dVar117 * dVar108 -
                  (dVar20 - ((h_RT[0xc] + RVar86) - dVar134) * dVar135) * dVar120 * dVar123;
        local_978[7] = dVar124 + dVar115;
        pdVar6[0xa1] = pdVar6[0xa1] + -dVar120 * dVar105;
        pdVar6[0xa2] = pdVar6[0xa2] - -dVar120 * dVar105;
        pdVar6[0xb7] = dVar117 * dVar105 + pdVar6[0xb7];
        pdVar6[0xb8] = pdVar6[0xb8] - dVar117 * dVar105;
        dVar117 = dVar117 * local_858[8] - dVar120 * (double)local_878._0_8_;
        pdVar6[0x10f] = pdVar6[0x10f] + dVar117;
        pdVar6[0x110] = pdVar6[0x110] - dVar117;
        pdVar6[0x1d5] = pdVar6[0x1d5] + dVar123;
        pdVar6[0x1d6] = pdVar6[0x1d6] - dVar123;
        dVar117 = exp(dVar129);
        dVar114 = local_858[0xe];
        dVar108 = local_858[0xb];
        local_878._8_4_ = extraout_XMM0_Dc_12;
        local_878._0_8_ = dVar117;
        local_878._12_4_ = extraout_XMM0_Dd_12;
        dVar123 = exp(((dVar131 - (double)local_888._0_8_) + local_698) - local_678);
        dVar109 = local_858[9];
        dVar110 = local_858[3];
        uVar84 = auStack_910._8_8_;
        dVar107 = local_978[0xc];
        dVar106 = local_978[0xb];
        local_788._0_8_ = pdVar6[0xfa];
        uVar103 = local_878._12_4_;
        dVar132 = local_878._0_8_ * 14000000.0;
        dVar124 = dVar108 * dVar114;
        local_878._8_4_ = local_878._8_4_;
        local_878._0_8_ = dVar132;
        local_878._12_4_ = uVar103;
        dVar120 = dVar132 * dVar105;
        dVar105 = dVar105 * dVar118;
        auVar46._8_4_ = SUB84(local_858[9] * local_858[3],0);
        auVar46._0_8_ = dVar105;
        auVar46._12_4_ = (int)((ulong)(local_858[9] * local_858[3]) >> 0x20);
        dVar131 = dVar20 * dVar132 * dVar105 -
                  (dVar132 / dVar123) * (dVar20 - ((h_RT[0xb] + h_RT[0xe]) - dVar134) * dVar135) *
                  dVar124;
        local_548._0_8_ = pdVar6[0x13c];
        dVar117 = pdVar6[0x140];
        local_798._0_8_ = pdVar6[0x1d6];
        pdVar6[0xb8] = pdVar6[0xb8] - dVar120;
        pdVar6[0xbb] = pdVar6[0xbb] + dVar120;
        pdVar6[0xbc] = pdVar6[0xbc] - dVar120;
        pdVar6[0xbe] = pdVar6[0xbe] + dVar120;
        dVar120 = -(dVar132 / dVar123);
        dVar114 = dVar114 * dVar120;
        pdVar6[0xfa] = (double)local_788._0_8_ - dVar114;
        pdVar6[0xfd] = pdVar6[0xfd] + dVar114;
        pdVar6[0xfe] = pdVar6[0xfe] - dVar114;
        pdVar6[0x100] = pdVar6[0x100] + dVar114;
        dVar118 = dVar118 * dVar132;
        pdVar6[0x110] = pdVar6[0x110] - dVar118;
        pdVar6[0x113] = pdVar6[0x113] + dVar118;
        pdVar6[0x114] = pdVar6[0x114] - dVar118;
        pdVar6[0x116] = pdVar6[0x116] + dVar118;
        dVar108 = dVar108 * dVar120;
        pdVar6[0x13c] = pdVar6[0x13c] - dVar108;
        pdVar6[0x13f] = pdVar6[0x13f] + dVar108;
        pdVar6[0x140] = dVar117 - dVar108;
        pdVar6[0x142] = pdVar6[0x142] + dVar108;
        pdVar6[0x1d6] = (double)local_798._0_8_ - dVar131;
        pdVar6[0x1d9] = pdVar6[0x1d9] + dVar131;
        pdVar6[0x1da] = pdVar6[0x1da] - dVar131;
        pdVar6[0x1dc] = pdVar6[0x1dc] + dVar131;
        dVar118 = dVar50 * 14492.639975175936 + dVar122;
        dVar123 = (((double)uVar85 - local_ae8) + (double)local_868._0_8_) - (double)local_598._0_8_
        ;
        local_898._0_8_ = dVar117;
        dVar117 = exp(dVar135 * -14492.639975175936 + dVar119);
        dVar114 = local_858[0xf];
        dVar134 = local_858[2];
        dVar117 = dVar117 * 26750000.0;
        local_788._8_8_ = 0;
        local_788._0_8_ = local_858[2] * local_858[0xf];
        dVar123 = exp(dVar123);
        dVar132 = local_858[9];
        dVar108 = local_858[3];
        dVar131 = -(dVar117 / dVar123);
        dStack_a40 = auVar46._8_8_;
        local_978[8] = (double)local_878._0_8_ * dVar105 + dVar120 * dVar124;
        dVar120 = dVar117 * dStack_a40 + dVar131 * (double)local_788._0_8_;
        local_978[0xb] = dVar106 + local_978[8];
        local_978[0xc] = dVar107 - local_978[8];
        auStack_910._8_8_ = (double)uVar84 + local_978[8];
        local_978[2] = local_978[2] + dVar120;
        local_978[3] = local_978[3] - dVar120;
        local_978[8] = ((dVar133 - dVar112) - dVar115) - local_978[8];
        local_978[9] = local_978[9] - dVar120;
        dStack_900 = dStack_900 + dVar120;
        dVar114 = dVar114 * dVar131;
        pdVar6[0x2e] = pdVar6[0x2e] + dVar114;
        pdVar6[0x2f] = pdVar6[0x2f] - dVar114;
        pdVar6[0x35] = pdVar6[0x35] - dVar114;
        pdVar6[0x3b] = dVar114 + pdVar6[0x3b];
        dVar109 = dVar109 * dVar117;
        pdVar6[0x44] = pdVar6[0x44] + dVar109;
        pdVar6[0x45] = pdVar6[0x45] - dVar109;
        pdVar6[0x4b] = pdVar6[0x4b] - dVar109;
        pdVar6[0x51] = dVar109 + pdVar6[0x51];
        dVar110 = dVar117 * dVar110;
        pdVar6[200] = pdVar6[200] + dVar110;
        pdVar6[0xc9] = pdVar6[0xc9] - dVar110;
        pdVar6[0xcf] = pdVar6[0xcf] - dVar110;
        dVar117 = dStack_a40 * dVar118 * dVar117 -
                  (dVar118 - ((h_RT[2] + h_RT[0xf]) - (h_RT[3] + h_RT[9])) * dVar135) *
                  (dVar117 / dVar123) * (double)local_788._0_8_;
        pdVar6[0xd5] = dVar110 + pdVar6[0xd5];
        dVar131 = dVar131 * dVar134;
        pdVar6[0x14c] = pdVar6[0x14c] + dVar131;
        pdVar6[0x14d] = pdVar6[0x14d] - dVar131;
        pdVar6[0x153] = pdVar6[0x153] - dVar131;
        pdVar6[0x159] = dVar131 + pdVar6[0x159];
        pdVar6[0x1d0] = pdVar6[0x1d0] + dVar117;
        pdVar6[0x1d1] = pdVar6[0x1d1] - dVar117;
        pdVar6[0x1d7] = pdVar6[0x1d7] - dVar117;
        pdVar6[0x1dd] = dVar117 + pdVar6[0x1dd];
        dVar117 = exp(dVar135 * -4498.756992294197 + dVar119);
        dVar120 = local_858[0xe];
        dVar118 = local_858[4];
        local_878._8_8_ = 0;
        local_878._0_8_ = dVar50 * 4498.756992294197 + dVar122;
        dVar123 = exp((((double)uVar85 - local_a48) + (double)local_868._0_8_) - local_678);
        dVar109 = local_858[9];
        dVar110 = local_978[9];
        dVar107 = local_978[4];
        dVar106 = local_978[3];
        dVar124 = dVar135 * 0.1 + dVar50 * 5334.096657530033;
        uVar103 = local_868._12_4_;
        dStack_690 = local_868._0_8_ - dStack_690;
        local_868._8_4_ = local_868._8_4_;
        local_868._0_8_ = dStack_690;
        local_868._12_4_ = uVar103;
        dVar131 = dVar108 * dVar132;
        dVar117 = dVar117 * 36000.0;
        dVar114 = dVar118 * dVar120;
        dVar105 = (double)local_878._0_8_ * dVar117 * dVar131 -
                  (dVar117 / dVar123) *
                  ((double)local_878._0_8_ - ((h_RT[4] + h_RT[0xe]) - (h_RT[3] + h_RT[9])) * dVar135
                  ) * dVar114;
        dVar132 = dVar132 * dVar117;
        local_798._0_8_ = pdVar6[0x45] - dVar132;
        local_898._0_8_ = pdVar6[0x137];
        pdVar6[0x45] = pdVar6[0x45] - dVar132;
        pdVar6[0x46] = pdVar6[0x46] + dVar132;
        pdVar6[0x4b] = pdVar6[0x4b] - dVar132;
        pdVar6[0x50] = pdVar6[0x50] + dVar132;
        dVar123 = -(dVar117 / dVar123);
        dVar120 = dVar120 * dVar123;
        pdVar6[0x5b] = pdVar6[0x5b] - dVar120;
        pdVar6[0x5c] = pdVar6[0x5c] + dVar120;
        pdVar6[0x61] = pdVar6[0x61] - dVar120;
        pdVar6[0x66] = pdVar6[0x66] + dVar120;
        dVar108 = dVar108 * dVar117;
        pdVar6[0xc9] = pdVar6[0xc9] - dVar108;
        pdVar6[0xca] = pdVar6[0xca] + dVar108;
        pdVar6[0xcf] = pdVar6[0xcf] - dVar108;
        pdVar6[0xd4] = pdVar6[0xd4] + dVar108;
        dVar118 = dVar118 * dVar123;
        pdVar6[0x137] = pdVar6[0x137] - dVar118;
        pdVar6[0x138] = pdVar6[0x138] + dVar118;
        pdVar6[0x13d] = pdVar6[0x13d] - dVar118;
        pdVar6[0x142] = pdVar6[0x142] + dVar118;
        pdVar6[0x1d1] = pdVar6[0x1d1] - dVar105;
        pdVar6[0x1d2] = pdVar6[0x1d2] + dVar105;
        pdVar6[0x1d7] = pdVar6[0x1d7] - dVar105;
        local_878._0_8_ = local_858[9] * local_858[9];
        dVar120 = (dVar111 + (double)local_538._0_8_) - (double)local_588._0_8_;
        pdVar6[0x1dc] = pdVar6[0x1dc] + dVar105;
        local_788._0_8_ = (dStack_690 - (double)local_888._0_8_) + (double)local_7a8._0_8_;
        dVar118 = exp(dVar121 * 0.1 + dVar135 * -5334.096657530033);
        dVar134 = local_858[0x11];
        dVar108 = local_858[1];
        dVar118 = dVar118 * 4990000.0;
        dVar105 = local_858[1] * local_858[0x11];
        dVar120 = exp(dVar120);
        RVar86 = h_RT[9];
        dVar132 = local_858[0xd];
        dVar120 = dVar118 / dVar120;
        dVar134 = dVar134 * -dVar120;
        pdVar6[0x17] = pdVar6[0x17] + dVar134;
        pdVar6[0x1f] = pdVar6[0x1f] - (dVar134 + dVar134);
        pdVar6[0x27] = dVar134 + pdVar6[0x27];
        dVar134 = (dVar118 + dVar118) * dVar109;
        pdVar6[199] = pdVar6[199] + dVar134;
        pdVar6[0xcf] = pdVar6[0xcf] - (dVar134 + dVar134);
        pdVar6[0xd7] = dVar134 + pdVar6[0xd7];
        dVar108 = -dVar120 * dVar108;
        pdVar6[0x177] = pdVar6[0x177] + dVar108;
        pdVar6[0x17f] = pdVar6[0x17f] - (dVar108 + dVar108);
        dVar134 = dVar124 * dVar118 * (double)local_878._0_8_ -
                  (dVar124 - ((h_RT[1] + h_RT[0x11]) - (h_RT[9] + h_RT[9])) * dVar135) * dVar120 *
                  dVar105;
        pdVar6[0x187] = dVar108 + pdVar6[0x187];
        pdVar6[0x1cf] = pdVar6[0x1cf] + dVar134;
        pdVar6[0x1d7] = pdVar6[0x1d7] - (dVar134 + dVar134);
        pdVar6[0x1df] = dVar134 + pdVar6[0x1df];
        dVar109 = dVar109 * local_858[0xd];
        dVar108 = exp(dVar129);
        dVar115 = local_858[0xb];
        dVar133 = local_858[10];
        dVar108 = dVar108 * 26480000.0;
        dVar134 = local_858[10] * local_858[0xb];
        dVar124 = exp((double)local_788._0_8_);
        dVar112 = local_858[0xe];
        dVar111 = -(dVar108 / dVar124);
        dVar129 = dVar109 * dVar108 + dVar111 * dVar134;
        dVar117 = dVar131 * dVar117 + dVar123 * dVar114;
        local_978[3] = dVar106 - dVar117;
        local_978[4] = dVar107 + dVar117;
        dVar131 = dVar118 * (double)local_878._0_8_ - dVar120 * dVar105;
        local_978[1] = local_978[1] + dVar131;
        local_8f8._8_8_ = dVar131 + (double)local_8f8._8_8_;
        dVar123 = dVar20 * dVar108 * dVar109 -
                  (dVar20 - ((h_RT[10] + h_RT[0xb]) - (RVar86 + h_RT[0xd])) * dVar135) *
                  (dVar108 / dVar124) * dVar134;
        local_978[9] = ((dVar110 - dVar117) - (dVar131 + dVar131)) - dVar129;
        local_978[10] = dVar129 + local_978[10];
        auVar71._8_4_ = SUB84(dVar129 + local_978[0xb],0);
        auVar71._0_8_ = local_978[10];
        auVar71._12_4_ = (int)((ulong)(dVar129 + local_978[0xb]) >> 0x20);
        local_978[0xb] = auVar71._8_8_;
        dVar117 = dVar117 + (double)auStack_910._8_8_;
        auStack_910._8_4_ = SUB84(dVar117,0);
        auStack_910._0_8_ = (double)auStack_910._0_8_ - dVar129;
        auStack_910._12_4_ = (int)((ulong)dVar117 >> 0x20);
        dVar132 = dVar132 * dVar108;
        pdVar6[0xcf] = pdVar6[0xcf] - dVar132;
        auVar83._8_4_ = SUB84(dVar132 + pdVar6[0xd1],0);
        auVar83._0_8_ = dVar132 + pdVar6[0xd0];
        auVar83._12_4_ = (int)((ulong)(dVar132 + pdVar6[0xd1]) >> 0x20);
        *(undefined1 (*) [16])(pdVar6 + 0xd0) = auVar83;
        pdVar6[0xd3] = pdVar6[0xd3] - dVar132;
        dVar115 = dVar115 * dVar111;
        pdVar6[0xe5] = pdVar6[0xe5] - dVar115;
        auVar72._8_4_ = SUB84(dVar115 + pdVar6[0xe7],0);
        auVar72._0_8_ = dVar115 + pdVar6[0xe6];
        auVar72._12_4_ = (int)((ulong)(dVar115 + pdVar6[0xe7]) >> 0x20);
        *(undefined1 (*) [16])(pdVar6 + 0xe6) = auVar72;
        pdVar6[0xe9] = pdVar6[0xe9] - dVar115;
        dVar111 = dVar111 * dVar133;
        pdVar6[0xfb] = pdVar6[0xfb] - dVar111;
        auVar73._8_4_ = SUB84(dVar111 + pdVar6[0xfd],0);
        auVar73._0_8_ = dVar111 + pdVar6[0xfc];
        auVar73._12_4_ = (int)((ulong)(dVar111 + pdVar6[0xfd]) >> 0x20);
        *(undefined1 (*) [16])(pdVar6 + 0xfc) = auVar73;
        pdVar6[0xff] = pdVar6[0xff] - dVar111;
        dVar108 = dVar108 * local_858[9];
        pdVar6[0x127] = pdVar6[0x127] - dVar108;
        auVar47._8_4_ = SUB84(dVar108 + pdVar6[0x129],0);
        auVar47._0_8_ = dVar108 + pdVar6[0x128];
        auVar47._12_4_ = (int)((ulong)(dVar108 + pdVar6[0x129]) >> 0x20);
        *(undefined1 (*) [16])(pdVar6 + 0x128) = auVar47;
        pdVar6[299] = pdVar6[299] - dVar108;
        pdVar6[0x1d7] = pdVar6[0x1d7] - dVar123;
        auVar48._8_4_ = SUB84(dVar123 + pdVar6[0x1d9],0);
        auVar48._0_8_ = dVar123 + pdVar6[0x1d8];
        auVar48._12_4_ = (int)((ulong)(dVar123 + pdVar6[0x1d9]) >> 0x20);
        *(undefined1 (*) [16])(pdVar6 + 0x1d8) = auVar48;
        pdVar6[0x1db] = pdVar6[0x1db] - dVar123;
        dVar108 = local_858[9] * local_858[0xe];
        dVar117 = exp(dVar121 * 2.81 + dVar135 * -2948.8496616156594);
        dVar20 = local_858[0xd];
        dVar105 = local_858[10];
        dVar117 = dVar117 * 0.00332;
        dVar118 = dVar135 * 2.81 + dVar50 * 2948.8496616156594;
        dVar123 = local_858[10] * local_858[0xd];
        dVar131 = exp(((double)local_868._0_8_ - (double)local_7a8._0_8_) + local_678);
        dVar120 = local_858[0x12];
        dVar134 = local_858[9];
        dVar131 = dVar117 / dVar131;
        local_878._0_8_ = dVar117 * dVar108 - dVar123 * dVar131;
        dVar123 = dVar118 * dVar117 * dVar108 -
                  (dVar118 - ((h_RT[10] + h_RT[0xd]) - (h_RT[9] + h_RT[0xe])) * dVar135) * dVar131 *
                  dVar123;
        local_878._8_8_ = 0;
        local_978[9] = local_978[9] - (double)local_878._0_8_;
        local_978[10] = local_978[10] + (double)local_878._0_8_;
        dVar112 = dVar112 * dVar117;
        pdVar6[0xcf] = pdVar6[0xcf] - dVar112;
        pdVar6[0xd0] = pdVar6[0xd0] + dVar112;
        pdVar6[0xd3] = dVar112 + pdVar6[0xd3];
        pdVar6[0xd4] = pdVar6[0xd4] - dVar112;
        dVar20 = dVar20 * -dVar131;
        pdVar6[0xe5] = pdVar6[0xe5] - dVar20;
        pdVar6[0xe6] = pdVar6[0xe6] + dVar20;
        pdVar6[0xe9] = pdVar6[0xe9] + dVar20;
        pdVar6[0xea] = pdVar6[0xea] - dVar20;
        dVar105 = -dVar131 * dVar105;
        pdVar6[0x127] = pdVar6[0x127] - dVar105;
        pdVar6[0x128] = pdVar6[0x128] + dVar105;
        pdVar6[299] = pdVar6[299] + dVar105;
        pdVar6[300] = pdVar6[300] - dVar105;
        dVar117 = dVar117 * local_858[9];
        pdVar6[0x13d] = pdVar6[0x13d] - dVar117;
        pdVar6[0x13e] = pdVar6[0x13e] + dVar117;
        pdVar6[0x141] = pdVar6[0x141] + dVar117;
        pdVar6[0x142] = pdVar6[0x142] - dVar117;
        pdVar6[0x1d7] = pdVar6[0x1d7] - dVar123;
        pdVar6[0x1d8] = pdVar6[0x1d8] + dVar123;
        pdVar6[0x1db] = pdVar6[0x1db] + dVar123;
        pdVar6[0x1dc] = pdVar6[0x1dc] - dVar123;
        auStack_910._0_8_ = (double)auStack_910._0_8_ + (double)local_878._0_8_;
        dVar117 = exp(dVar121 * 1.74 + dVar135 * -5258.6141576593245);
        dVar105 = local_858[0x11];
        dVar131 = local_858[10];
        dVar118 = dVar135 * 1.74 + dVar50 * 5258.6141576593245;
        dVar123 = exp(((double)local_868._0_8_ - (double)local_588._0_8_) + (double)local_578._0_8_)
        ;
        dVar20 = local_858[3];
        dVar111 = local_8e8;
        uVar85 = local_8f8._8_8_;
        dVar124 = local_978[9];
        local_578._0_8_ = pdVar6[0xe5];
        dVar108 = dVar130 - (double)local_888._0_8_;
        local_888._8_8_ = 0;
        local_888._0_8_ = local_858[0xd];
        dVar108 = dVar108 + (double)local_7a8._0_8_;
        dVar117 = dVar117 * 6.14;
        dVar129 = dVar117 * dVar120;
        dVar120 = dVar120 * dVar134;
        auVar18._8_4_ = SUB84(local_858[0xd] * local_858[3],0);
        auVar18._0_8_ = dVar120;
        auVar18._12_4_ = (int)((ulong)(local_858[0xd] * local_858[3]) >> 0x20);
        local_7a8._0_8_ = dVar131 * dVar105;
        local_7a8._8_8_ = 0;
        dVar118 = dVar118 * dVar117 * dVar120 -
                  (dVar117 / dVar123) *
                  (dVar118 - ((h_RT[10] + h_RT[0x11]) - (h_RT[9] + h_RT[0x12])) * dVar135) *
                  (double)local_7a8._0_8_;
        pdVar6[0xcf] = pdVar6[0xcf] - dVar129;
        pdVar6[0xd0] = pdVar6[0xd0] + dVar129;
        pdVar6[0xd7] = pdVar6[0xd7] + dVar129;
        pdVar6[0xd8] = pdVar6[0xd8] - dVar129;
        dVar123 = -(dVar117 / dVar123);
        dVar105 = dVar105 * dVar123;
        local_868._8_4_ = extraout_XMM0_Dc_13;
        local_868._0_8_ = dVar123;
        local_868._12_4_ = extraout_XMM0_Dd_13 ^ 0x80000000;
        pdVar6[0xe5] = pdVar6[0xe5] - dVar105;
        pdVar6[0xe6] = pdVar6[0xe6] + dVar105;
        pdVar6[0xed] = pdVar6[0xed] + dVar105;
        pdVar6[0xee] = pdVar6[0xee] - dVar105;
        dVar131 = dVar131 * dVar123;
        pdVar6[0x17f] = pdVar6[0x17f] - dVar131;
        pdVar6[0x180] = pdVar6[0x180] + dVar131;
        pdVar6[0x187] = pdVar6[0x187] + dVar131;
        pdVar6[0x188] = pdVar6[0x188] - dVar131;
        dVar123 = local_858[9] * dVar117;
        pdVar6[0x195] = pdVar6[0x195] - dVar123;
        pdVar6[0x196] = pdVar6[0x196] + dVar123;
        pdVar6[0x19d] = pdVar6[0x19d] + dVar123;
        pdVar6[0x19e] = pdVar6[0x19e] - dVar123;
        pdVar6[0x1d7] = pdVar6[0x1d7] - dVar118;
        pdVar6[0x1d8] = pdVar6[0x1d8] + dVar118;
        pdVar6[0x1df] = pdVar6[0x1df] + dVar118;
        pdVar6[0x1e0] = pdVar6[0x1e0] - dVar118;
        dVar105 = dVar50 * 201.28666632188802 + dVar122;
        dVar123 = exp(dVar135 * -201.28666632188802 + dVar119);
        dVar134 = local_858[0xb];
        dVar129 = local_858[6];
        local_578._8_4_ = extraout_XMM0_Dc_14;
        local_578._0_8_ = dVar123 * 7600000.0;
        local_578._12_4_ = extraout_XMM0_Dd_14;
        dVar123 = local_858[6] * local_858[0xb];
        dVar131 = exp(dVar108);
        dVar118 = -((double)local_578._0_8_ / dVar131);
        dStack_9a0 = auVar18._8_8_;
        dVar117 = dVar117 * dVar120 + (double)local_868._0_8_ * (double)local_7a8._0_8_;
        dVar120 = (double)local_578._0_8_ * dStack_9a0 + dVar118 * dVar123;
        local_978[9] = dVar124 - dVar117;
        local_8f8._8_8_ = (double)uVar85 + dVar117;
        local_8e8 = dVar111 - dVar117;
        local_978[3] = local_978[3] - dVar120;
        local_978[6] = local_978[6] + dVar120;
        local_978[10] = local_978[10] + dVar117;
        auVar74._8_4_ = SUB84(local_978[0xb] + dVar120,0);
        auVar74._0_8_ = local_978[10];
        auVar74._12_4_ = (int)((ulong)(local_978[0xb] + dVar120) >> 0x20);
        local_978[0xb] = auVar74._8_8_;
        local_878._0_8_ = (double)auStack_910._8_8_ - (double)local_878._0_8_;
        auStack_910._8_4_ = (int)local_878._0_8_;
        auStack_910._0_8_ = (double)auStack_910._0_8_ - dVar120;
        auStack_910._12_4_ = (int)((ulong)local_878._0_8_ >> 0x20);
        dVar117 = (double)local_888._0_8_ * (double)local_578._0_8_;
        pdVar6[0x45] = pdVar6[0x45] - dVar117;
        pdVar6[0x48] = pdVar6[0x48] + dVar117;
        dVar123 = dStack_9a0 * dVar105 * (double)local_578._0_8_ -
                  (dVar105 - ((h_RT[6] + h_RT[0xb]) - (h_RT[3] + h_RT[0xd])) * dVar135) *
                  ((double)local_578._0_8_ / dVar131) * dVar123;
        pdVar6[0x4d] = dVar117 + pdVar6[0x4d];
        pdVar6[0x4f] = pdVar6[0x4f] - dVar117;
        dVar134 = dVar134 * dVar118;
        pdVar6[0x87] = pdVar6[0x87] - dVar134;
        pdVar6[0x8a] = pdVar6[0x8a] + dVar134;
        pdVar6[0x8f] = pdVar6[0x8f] + dVar134;
        pdVar6[0x91] = pdVar6[0x91] - dVar134;
        dVar118 = dVar118 * dVar129;
        pdVar6[0xf5] = pdVar6[0xf5] - dVar118;
        pdVar6[0xf8] = pdVar6[0xf8] + dVar118;
        pdVar6[0xfd] = pdVar6[0xfd] + dVar118;
        pdVar6[0xff] = pdVar6[0xff] - dVar118;
        dVar20 = (double)local_578._0_8_ * dVar20;
        pdVar6[0x121] = pdVar6[0x121] - dVar20;
        pdVar6[0x124] = pdVar6[0x124] + dVar20;
        pdVar6[0x129] = pdVar6[0x129] + dVar20;
        pdVar6[299] = pdVar6[299] - dVar20;
        pdVar6[0x1d1] = pdVar6[0x1d1] - dVar123;
        pdVar6[0x1d4] = pdVar6[0x1d4] + dVar123;
        pdVar6[0x1d9] = pdVar6[0x1d9] + dVar123;
        pdVar6[0x1db] = pdVar6[0x1db] - dVar123;
        local_868._8_8_ = 0;
        local_868._0_8_ = local_858[3];
        local_878._8_8_ = 0;
        local_878._0_8_ = local_858[0xf];
        dVar121 = exp(dVar121 * 7.6 + dVar135 * 1776.3548302906618);
        dVar118 = local_858[0xe];
        dVar123 = local_858[6];
        dVar131 = dVar135 * 7.6 + dVar50 * -1776.3548302906618;
        dVar117 = exp((dVar130 - local_678) + (double)local_598._0_8_);
        dVar108 = local_858[0x11];
        dVar20 = local_858[3];
        local_888._0_8_ = local_978[3];
        local_7a8._0_8_ = local_978[6];
        uVar85 = auStack_910._8_8_;
        dVar105 = (dVar130 - (double)local_558._0_8_) + (double)local_588._0_8_;
        dVar121 = dVar121 * 4.28e-19;
        dVar134 = dVar121 * (double)local_878._0_8_;
        local_878._0_8_ = (double)local_868._0_8_ * (double)local_878._0_8_;
        local_878._8_4_ = SUB84(local_858[0x11] * local_858[3],0);
        local_878._12_4_ = (int)((ulong)(local_858[0x11] * local_858[3]) >> 0x20);
        dVar120 = dVar123 * dVar118;
        dVar131 = dVar131 * dVar121 * (double)local_878._0_8_ -
                  (dVar121 / dVar117) *
                  (dVar131 - ((h_RT[6] + h_RT[0xe]) - (h_RT[3] + h_RT[0xf])) * dVar135) * dVar120;
        local_558._0_8_ = pdVar6[0x143];
        local_588._0_8_ = pdVar6[0x1dd];
        pdVar6[0x45] = pdVar6[0x45] - dVar134;
        pdVar6[0x48] = pdVar6[0x48] + dVar134;
        pdVar6[0x50] = pdVar6[0x50] + dVar134;
        pdVar6[0x51] = pdVar6[0x51] - dVar134;
        dVar117 = -(dVar121 / dVar117);
        dVar118 = dVar118 * dVar117;
        pdVar6[0x87] = pdVar6[0x87] - dVar118;
        pdVar6[0x8a] = pdVar6[0x8a] + dVar118;
        pdVar6[0x92] = pdVar6[0x92] + dVar118;
        pdVar6[0x93] = pdVar6[0x93] - dVar118;
        dVar123 = dVar123 * dVar117;
        pdVar6[0x137] = pdVar6[0x137] - dVar123;
        pdVar6[0x13a] = pdVar6[0x13a] + dVar123;
        pdVar6[0x142] = pdVar6[0x142] + dVar123;
        pdVar6[0x143] = pdVar6[0x143] - dVar123;
        dVar123 = (double)local_868._0_8_ * dVar121;
        pdVar6[0x14d] = pdVar6[0x14d] - dVar123;
        pdVar6[0x150] = pdVar6[0x150] + dVar123;
        pdVar6[0x158] = pdVar6[0x158] + dVar123;
        pdVar6[0x159] = pdVar6[0x159] - dVar123;
        pdVar6[0x1d1] = pdVar6[0x1d1] - dVar131;
        pdVar6[0x1d4] = pdVar6[0x1d4] + dVar131;
        pdVar6[0x1dc] = pdVar6[0x1dc] + dVar131;
        pdVar6[0x1dd] = pdVar6[0x1dd] - dVar131;
        dVar123 = exp(dVar135 * -1949.96457999329 + dVar119);
        dVar119 = local_858[6];
        local_868._0_8_ = local_858[0x10];
        dVar131 = exp(dVar105);
        dVar122 = dVar50 * 1949.96457999329 + dVar122;
        dVar123 = dVar123 * 840000.0;
        dVar118 = dVar119 * (double)local_868._0_8_;
        dVar50 = -(dVar123 / dVar131);
        dVar117 = dVar121 * (double)local_878._0_8_ + dVar117 * dVar120;
        dVar120 = dVar123 * (double)local_878._8_8_ + dVar50 * dVar118;
        auStack_910._8_8_ = (double)uVar85 + dVar117;
        dVar121 = (double)local_878._8_8_ * dVar122 * dVar123 -
                  (dVar122 - ((h_RT[6] + h_RT[0x10]) - (h_RT[3] + h_RT[0x11])) * dVar135) *
                  (dVar123 / dVar131) * dVar118;
        local_978[3] = ((double)local_888._0_8_ - dVar117) - dVar120;
        local_978[6] = (double)local_7a8._0_8_ + dVar117 + dVar120;
        dStack_900 = dStack_900 - dVar117;
        local_8f8._8_8_ = (double)local_8f8._8_8_ - dVar120;
        local_8f8._0_8_ = dVar120 + (double)local_8f8._0_8_;
        dVar108 = dVar108 * dVar123;
        pdVar6[0x45] = pdVar6[0x45] - dVar108;
        pdVar6[0x48] = pdVar6[0x48] + dVar108;
        pdVar6[0x52] = dVar108 + pdVar6[0x52];
        pdVar6[0x53] = pdVar6[0x53] - dVar108;
        dVar117 = (double)local_868._0_8_ * dVar50;
        pdVar6[0x87] = pdVar6[0x87] - dVar117;
        pdVar6[0x8a] = pdVar6[0x8a] + dVar117;
        pdVar6[0x94] = pdVar6[0x94] + dVar117;
        pdVar6[0x95] = pdVar6[0x95] - dVar117;
        dVar50 = dVar50 * dVar119;
        pdVar6[0x163] = pdVar6[0x163] - dVar50;
        pdVar6[0x166] = pdVar6[0x166] + dVar50;
        pdVar6[0x170] = pdVar6[0x170] + dVar50;
        pdVar6[0x171] = pdVar6[0x171] - dVar50;
        dVar123 = dVar123 * dVar20;
        pdVar6[0x179] = pdVar6[0x179] - dVar123;
        pdVar6[0x17c] = pdVar6[0x17c] + dVar123;
        pdVar6[0x186] = pdVar6[0x186] + dVar123;
        pdVar6[0x187] = pdVar6[0x187] - dVar123;
        pdVar6[0x1d1] = pdVar6[0x1d1] - dVar121;
        pdVar6[0x1d4] = pdVar6[0x1d4] + dVar121;
        pdVar6[0x1de] = pdVar6[0x1de] + dVar121;
        pdVar6[0x1df] = pdVar6[0x1df] - dVar121;
        if (local_50c == 2) {
          if (1000.0 <= dVar49) {
            c_R[0] = local_508 * 2.00255376e-14 +
                     dVar136 * -1.79566394e-10 +
                     dVar137 * 4.99456778e-07 + dVar49 * -4.94024731e-05 + 3.3372792;
            c_R[1] = local_508 * 4.98197357e-22 +
                     dVar136 * -4.73515235e-18 +
                     dVar137 * 1.61561948e-14 + dVar49 * -2.30842973e-11 + 2.50000001;
            c_R[2] = local_508 * 1.22833691e-15 +
                     dVar136 * -1.00177799e-11 +
                     dVar137 * 4.19484589e-08 + dVar49 * -8.59741137e-05 + 2.56942078;
            c_R[3] = local_508 * -2.16717794e-14 +
                     dVar136 * 2.09470555e-10 +
                     dVar137 * -7.57966669e-07 + dVar49 * 0.00148308754 + 3.28253784;
            c_R[4] = local_508 * 1.17412376e-14 +
                     dVar136 * -8.79461556e-11 +
                     dVar137 * 1.26505228e-07 + dVar49 * 0.000548429716 + 3.09288767;
            c_R[5] = local_508 * 1.68200992e-14 +
                     dVar136 * -9.7041987e-11 +
                     dVar137 * -1.64072518e-07 + dVar49 * 0.00217691804 + 3.03399249;
            c_R[6] = local_508 * -1.07908535e-14 +
                     dVar136 * 1.1424637e-10 +
                     dVar137 * -6.3365815e-07 + dVar49 * 0.00223982013 + 4.0172109;
            c_R[7] = local_508 * -1.87727567e-14 +
                     dVar136 * 2.60179549e-10 +
                     dVar137 * -1.40894597e-06 + dVar49 * 0.00365639292 + 2.87410113;
            c_R[8] = local_508 * -3.39716365e-14 +
                     dVar136 * 4.17906e-10 +
                     dVar137 * -2.01191947e-06 + dVar49 * 0.00465588637 + 2.29203842;
            c_R[9] = local_508 * -4.67154394e-14 +
                     dVar136 * 5.95684644e-10 +
                     dVar137 * -2.98714348e-06 + dVar49 * 0.00723990037 + 2.28571772;
            c_R[10] = local_508 * -1.0181523e-13 +
                      dVar136 * 1.22292535e-09 +
                      dVar137 * -5.73285809e-06 + dVar49 * 0.0133909467 + 0.074851495;
            c_R[0xb] = local_508 * -2.03647716e-14 +
                       dVar136 * 2.30053008e-10 +
                       dVar137 * -9.98825771e-07 + dVar49 * 0.00206252743 + 2.71518561;
            c_R[0xc] = local_508 * -4.72084164e-14 +
                       dVar136 * 5.23490188e-10 +
                       dVar137 * -2.21481404e-06 + dVar49 * 0.00441437026 + 3.85746029;
            c_R[0xd] = local_508 * -5.33508711e-14 +
                       dVar136 * 5.89161778e-10 +
                       dVar137 * -2.48445613e-06 + dVar49 * 0.00495695526 + 2.77217438;
            c_R[0xe] = local_508 * -8.8385564e-14 +
                       dVar136 * 1.00641212e-09 +
                       dVar137 * -4.42258813e-06 + dVar49 * 0.00920000082 + 1.76069008;
            c_R[0xf] = local_508 * -2.112616e-14 +
                       dVar136 * 3.944431e-10 +
                       dVar137 * -2.656384e-06 + dVar49 * 0.007871497 + 3.770799;
            c_R[0x10] = local_508 * -1.25706061e-13 +
                        dVar136 * 1.47222923e-09 +
                        dVar137 * -6.71077915e-06 + dVar49 * 0.0146454151 + 2.03611116;
            c_R[0x11] = local_508 * -1.49641576e-13 +
                        dVar136 * 1.75217689e-09 +
                        dVar137 * -7.98206668e-06 + dVar49 * 0.0173972722 + 1.95465642;
            c_R[0x12] = local_508 * -1.9000289e-13 +
                        dVar136 * 2.21412001e-09 +
                        dVar137 * -1.00256067e-05 + dVar49 * 0.0216852677 + 1.0718815;
            dVar121 = dVar136 * 1.0097038e-10 +
                      dVar137 * -5.68476e-07 + dVar49 * 0.0014879768 + 2.92664;
            dVar117 = local_508 * -6.753351e-15;
          }
          else {
            c_R[0] = local_508 * -7.37611761e-12 +
                     dVar136 * 2.01572094e-08 +
                     dVar137 * -1.9478151e-05 + dVar49 * 0.00798052075 + 2.34433112;
            c_R[1] = local_508 * -9.27732332e-22 +
                     dVar136 * 2.30081632e-18 +
                     dVar137 * -1.99591964e-15 + dVar49 * 7.05332819e-13 + 2.5;
            c_R[2] = local_508 * 2.11265971e-12 +
                     dVar136 * -6.12806624e-09 +
                     dVar137 * 6.64306396e-06 + dVar49 * -0.00327931884 + 3.1682671;
            c_R[3] = local_508 * 3.24372837e-12 +
                     dVar136 * -9.68129509e-09 +
                     dVar137 * 9.84730201e-06 + dVar49 * -0.00299673416 + 3.78245636;
            c_R[4] = local_508 * 1.3641147e-12 +
                     dVar136 * -3.88113333e-09 +
                     dVar137 * 4.61793841e-06 + dVar49 * -0.00240131752 + 3.99201543;
            c_R[5] = local_508 * 1.77197817e-12 +
                     dVar136 * -5.48797062e-09 +
                     dVar137 * 6.52040211e-06 + dVar49 * -0.0020364341 + 4.19864056;
            c_R[6] = local_508 * 9.29225124e-12 +
                     dVar136 * -2.42763894e-08 +
                     dVar137 * 2.11582891e-05 + dVar49 * -0.00474912051 + 4.30179801;
            c_R[7] = local_508 * 1.68741719e-12 +
                     dVar136 * -3.85091153e-09 +
                     dVar137 * 2.79489841e-06 + dVar49 * 0.000968872143 + 3.76267867;
            c_R[8] = local_508 * 1.94314737e-12 +
                     dVar136 * -6.68815981e-09 +
                     dVar137 * 8.2329622e-06 + dVar49 * -0.00236661419 + 4.19860411;
            c_R[9] = local_508 * 2.54385734e-12 +
                     dVar136 * -6.87117425e-09 +
                     dVar137 * 5.73021856e-06 + dVar49 * 0.00201095175 + 3.6735904;
            c_R[10] = local_508 * 1.66693956e-11 +
                      dVar136 * -4.84743026e-08 +
                      dVar137 * 4.91800599e-05 + dVar49 * -0.0136709788 + 5.14987613;
            c_R[0xb] = local_508 * -9.04424499e-13 +
                       dVar136 * 9.07005884e-10 +
                       dVar137 * 1.01681433e-06 + dVar49 * -0.00061035368 + 3.57953347;
            c_R[0xc] = local_508 * -1.43699548e-13 +
                       dVar136 * 2.45919022e-09 +
                       dVar137 * -7.12356269e-06 + dVar49 * 0.00898459677 + 2.35677352;
            c_R[0xd] = local_508 * 4.33768865e-12 +
                       dVar136 * -1.33144093e-08 +
                       dVar137 * 1.37799446e-05 + dVar49 * -0.00324392532 + 4.22118584;
            c_R[0xe] = local_508 * 1.31772652e-11 +
                       dVar136 * -3.79285261e-08 +
                       dVar137 * 3.73220008e-05 + dVar49 * -0.00990833369 + 4.79372315;
            c_R[0xf] = local_508 * 2.07561e-12 +
                       dVar136 * -7.377636e-09 +
                       dVar137 * 5.338472e-06 + dVar49 * 0.007216595 + 2.106204;
            c_R[0x10] = local_508 * 2.69884373e-11 +
                        dVar136 * -6.91588753e-08 +
                        dVar137 * 5.70990292e-05 + dVar49 * -0.00757052247 + 3.95920148;
            c_R[0x11] = local_508 * 2.30509004e-11 +
                        dVar136 * -5.99126606e-08 +
                        dVar137 * 4.97142807e-05 + dVar49 * -0.00418658892 + 4.30646568;
            c_R[0x12] = local_508 * 2.68685771e-11 +
                        dVar136 * -7.08466285e-08 +
                        dVar137 * 5.99438288e-05 + dVar49 * -0.0055015427 + 4.29142492;
            dVar121 = dVar136 * 5.641515e-09 +
                      dVar137 * -3.963222e-06 + dVar49 * 0.0014082404 + 3.298677;
            dVar117 = local_508 * -2.444854e-12;
          }
          c_R[0x13] = dVar117 + dVar121;
          c_R[0x14] = dVar139 + dVar19 + 2.5 + dVar138 + local_4d8;
          if (1000.0 <= dVar49) {
            dcRdT[0] = dVar136 * 8.01021504e-14 +
                       dVar137 * -5.38699182e-10 + dVar49 * 9.98913556e-07 + -4.94024731e-05;
            dcRdT[1] = dVar136 * 1.99278943e-21 +
                       dVar137 * -1.42054571e-17 + dVar49 * 3.23123896e-14 + -2.30842973e-11;
            dcRdT[2] = dVar136 * 4.91334764e-15 +
                       dVar137 * -3.00533397e-11 + dVar49 * 8.38969178e-08 + -8.59741137e-05;
            dcRdT[3] = dVar136 * -8.66871176e-14 +
                       dVar137 * 6.28411665e-10 + dVar49 * -1.51593334e-06 + 0.00148308754;
            dcRdT[4] = dVar136 * 4.69649504e-14 +
                       dVar137 * -2.63838467e-10 + dVar49 * 2.53010456e-07 + 0.000548429716;
            dcRdT[5] = dVar136 * 6.72803968e-14 +
                       dVar137 * -2.91125961e-10 + dVar49 * -3.28145036e-07 + 0.00217691804;
            dcRdT[6] = dVar136 * -4.3163414e-14 +
                       dVar137 * 3.4273911e-10 + dVar49 * -1.2673163e-06 + 0.00223982013;
            dcRdT[7] = dVar136 * -7.50910268e-14 +
                       dVar137 * 7.80538647e-10 + dVar49 * -2.81789194e-06 + 0.00365639292;
            dcRdT[8] = dVar136 * -1.35886546e-13 +
                       dVar137 * 1.253718e-09 + dVar49 * -4.02383894e-06 + 0.00465588637;
            dcRdT[9] = dVar136 * -1.86861758e-13 +
                       dVar137 * 1.78705393e-09 + dVar49 * -5.97428696e-06 + 0.00723990037;
            dcRdT[10] = dVar136 * -4.0726092e-13 +
                        dVar137 * 3.66877605e-09 + dVar49 * -1.14657162e-05 + 0.0133909467;
            dcRdT[0xb] = dVar136 * -8.14590864e-14 +
                         dVar137 * 6.90159024e-10 + dVar49 * -1.99765154e-06 + 0.00206252743;
            dcRdT[0xc] = dVar136 * -1.88833666e-13 +
                         dVar137 * 1.57047056e-09 + dVar49 * -4.42962808e-06 + 0.00441437026;
            dcRdT[0xd] = dVar136 * -2.13403484e-13 +
                         dVar137 * 1.76748533e-09 + dVar49 * -4.96891226e-06 + 0.00495695526;
            dcRdT[0xe] = dVar136 * -3.53542256e-13 +
                         dVar137 * 3.01923636e-09 + dVar49 * -8.84517626e-06 + 0.00920000082;
            dcRdT[0xf] = dVar136 * -8.450464e-14 +
                         dVar137 * 1.1833293e-09 + dVar49 * -5.312768e-06 + 0.007871497;
            dcRdT[0x10] = dVar136 * -5.02824244e-13 +
                          dVar137 * 4.41668769e-09 + dVar49 * -1.34215583e-05 + 0.0146454151;
            dVar121 = dVar136 * -5.98566304e-13 +
                      dVar137 * 5.25653067e-09 + dVar49 * -1.59641334e-05 + 0.0173972722;
            auVar76._8_4_ = SUB84(dVar121,0);
            auVar76._0_8_ = dcRdT[0x10];
            auVar76._12_4_ = (int)((ulong)dVar121 >> 0x20);
            dcRdT[0x11] = (Real)auVar76._8_8_;
            dcRdT[0x12] = dVar136 * -7.6001156e-13 +
                          dVar137 * 6.64236003e-09 + dVar49 * -2.00512134e-05 + 0.0216852677;
            dVar121 = dVar137 * 3.0291114e-10 + dVar49 * -1.136952e-06 + 0.0014879768;
            dVar136 = dVar136 * -2.7013404e-14;
          }
          else {
            dcRdT[0] = dVar136 * -2.95044704e-11 +
                       dVar137 * 6.04716282e-08 + dVar49 * -3.8956302e-05 + 0.00798052075;
            dcRdT[1] = dVar136 * -3.71092933e-21 +
                       dVar137 * 6.90244896e-18 + dVar49 * -3.99183928e-15 + 7.05332819e-13;
            dcRdT[2] = dVar136 * 8.45063884e-12 +
                       dVar137 * -1.83841987e-08 + dVar49 * 1.32861279e-05 + -0.00327931884;
            dcRdT[3] = dVar136 * 1.29749135e-11 +
                       dVar137 * -2.90438853e-08 + dVar49 * 1.9694604e-05 + -0.00299673416;
            dcRdT[4] = dVar136 * 5.4564588e-12 +
                       dVar137 * -1.16434e-08 + dVar49 * 9.23587682e-06 + -0.00240131752;
            dcRdT[5] = dVar136 * 7.08791268e-12 +
                       dVar137 * -1.64639119e-08 + dVar49 * 1.30408042e-05 + -0.0020364341;
            dcRdT[6] = dVar136 * 3.7169005e-11 +
                       dVar137 * -7.28291682e-08 + dVar49 * 4.23165782e-05 + -0.00474912051;
            dcRdT[7] = dVar136 * 6.74966876e-12 +
                       dVar137 * -1.15527346e-08 + dVar49 * 5.58979682e-06 + 0.000968872143;
            dcRdT[8] = dVar136 * 7.77258948e-12 +
                       dVar137 * -2.00644794e-08 + dVar49 * 1.64659244e-05 + -0.00236661419;
            dcRdT[9] = dVar136 * 1.01754294e-11 +
                       dVar137 * -2.06135228e-08 + dVar49 * 1.14604371e-05 + 0.00201095175;
            dcRdT[10] = dVar136 * 6.66775824e-11 +
                        dVar137 * -1.45422908e-07 + dVar49 * 9.83601198e-05 + -0.0136709788;
            dcRdT[0xb] = dVar136 * -3.617698e-12 +
                         dVar137 * 2.72101765e-09 + dVar49 * 2.03362866e-06 + -0.00061035368;
            dcRdT[0xc] = dVar136 * -5.74798192e-13 +
                         dVar137 * 7.37757066e-09 + dVar49 * -1.42471254e-05 + 0.00898459677;
            dcRdT[0xd] = dVar136 * 1.73507546e-11 +
                         dVar137 * -3.99432279e-08 + dVar49 * 2.75598892e-05 + -0.00324392532;
            dcRdT[0xe] = dVar136 * 5.27090608e-11 +
                         dVar137 * -1.13785578e-07 + dVar49 * 7.46440016e-05 + -0.00990833369;
            dcRdT[0xf] = dVar136 * 8.30244e-12 +
                         dVar137 * -2.2132908e-08 + dVar49 * 1.0676944e-05 + 0.007216595;
            dcRdT[0x10] = dVar136 * 1.07953749e-10 +
                          dVar137 * -2.07476626e-07 + dVar49 * 0.000114198058 + -0.00757052247;
            dVar121 = dVar136 * 9.22036016e-11 +
                      dVar137 * -1.79737982e-07 + dVar49 * 9.94285614e-05 + -0.00418658892;
            auVar75._8_4_ = SUB84(dVar121,0);
            auVar75._0_8_ = dcRdT[0x10];
            auVar75._12_4_ = (int)((ulong)dVar121 >> 0x20);
            dcRdT[0x11] = (Real)auVar75._8_8_;
            dcRdT[0x12] = dVar136 * 1.07474308e-10 +
                          dVar137 * -2.12539886e-07 + dVar49 * 0.000119887658 + -0.0055015427;
            dVar121 = dVar137 * 1.6924545e-08 + dVar49 * -7.926444e-06 + 0.0014082404;
            dVar136 = dVar136 * -9.779416e-12;
          }
          dcRdT[0x13] = dVar136 + dVar121;
          dcRdT[0x14] = local_4d8 + dVar138 + dVar19 + 0.0;
          pRVar94 = h_RT;
        }
        else {
          if (1000.0 <= dVar49) {
            c_R[0] = local_508 * 2.00255376e-14 +
                     dVar136 * -1.79566394e-10 +
                     dVar137 * 4.99456778e-07 + dVar49 * -4.94024731e-05 + 2.3372792;
            c_R[1] = local_508 * 4.98197357e-22 +
                     dVar136 * -4.73515235e-18 +
                     dVar137 * 1.61561948e-14 + dVar49 * -2.30842973e-11 + 1.50000001;
            c_R[2] = local_508 * 1.22833691e-15 +
                     dVar136 * -1.00177799e-11 +
                     dVar137 * 4.19484589e-08 + dVar49 * -8.59741137e-05 + 1.56942078;
            c_R[3] = local_508 * -2.16717794e-14 +
                     dVar136 * 2.09470555e-10 +
                     dVar137 * -7.57966669e-07 + dVar49 * 0.00148308754 + 2.28253784;
            c_R[4] = local_508 * 1.17412376e-14 +
                     dVar136 * -8.79461556e-11 +
                     dVar137 * 1.26505228e-07 + dVar49 * 0.000548429716 + 2.09288767;
            c_R[5] = local_508 * 1.68200992e-14 +
                     dVar136 * -9.7041987e-11 +
                     dVar137 * -1.64072518e-07 + dVar49 * 0.00217691804 + 2.03399249;
            c_R[6] = local_508 * -1.07908535e-14 +
                     dVar136 * 1.1424637e-10 +
                     dVar137 * -6.3365815e-07 + dVar49 * 0.00223982013 + 3.0172109;
            c_R[7] = local_508 * -1.87727567e-14 +
                     dVar136 * 2.60179549e-10 +
                     dVar137 * -1.40894597e-06 + dVar49 * 0.00365639292 + 1.87410113;
            c_R[8] = local_508 * -3.39716365e-14 +
                     dVar136 * 4.17906e-10 +
                     dVar137 * -2.01191947e-06 + dVar49 * 0.00465588637 + 1.29203842;
            c_R[9] = local_508 * -4.67154394e-14 +
                     dVar136 * 5.95684644e-10 +
                     dVar137 * -2.98714348e-06 + dVar49 * 0.00723990037 + 1.28571772;
            c_R[10] = local_508 * -1.0181523e-13 +
                      dVar136 * 1.22292535e-09 +
                      dVar137 * -5.73285809e-06 + dVar49 * 0.0133909467 + -0.925148505;
            c_R[0xb] = local_508 * -2.03647716e-14 +
                       dVar136 * 2.30053008e-10 +
                       dVar137 * -9.98825771e-07 + dVar49 * 0.00206252743 + 1.71518561;
            c_R[0xc] = local_508 * -4.72084164e-14 +
                       dVar136 * 5.23490188e-10 +
                       dVar137 * -2.21481404e-06 + dVar49 * 0.00441437026 + 2.85746029;
            c_R[0xd] = local_508 * -5.33508711e-14 +
                       dVar136 * 5.89161778e-10 +
                       dVar137 * -2.48445613e-06 + dVar49 * 0.00495695526 + 1.77217438;
            c_R[0xe] = local_508 * -8.8385564e-14 +
                       dVar136 * 1.00641212e-09 +
                       dVar137 * -4.42258813e-06 + dVar49 * 0.00920000082 + 0.76069008;
            c_R[0xf] = local_508 * -2.112616e-14 +
                       dVar136 * 3.944431e-10 +
                       dVar137 * -2.656384e-06 + dVar49 * 0.007871497 + 2.770799;
            c_R[0x10] = local_508 * -1.25706061e-13 +
                        dVar136 * 1.47222923e-09 +
                        dVar137 * -6.71077915e-06 + dVar49 * 0.0146454151 + 1.03611116;
            c_R[0x11] = local_508 * -1.49641576e-13 +
                        dVar136 * 1.75217689e-09 +
                        dVar137 * -7.98206668e-06 + dVar49 * 0.0173972722 + 0.95465642;
            c_R[0x12] = local_508 * -1.9000289e-13 +
                        dVar136 * 2.21412001e-09 +
                        dVar137 * -1.00256067e-05 + dVar49 * 0.0216852677 + 0.0718815;
            dVar117 = dVar136 * 1.0097038e-10 +
                      dVar137 * -5.68476e-07 + dVar49 * 0.0014879768 + 1.92664;
            dVar121 = local_508 * -6.753351e-15;
          }
          else {
            c_R[0] = local_508 * -7.37611761e-12 +
                     dVar136 * 2.01572094e-08 +
                     dVar137 * -1.9478151e-05 + dVar49 * 0.00798052075 + 1.34433112;
            c_R[1] = local_508 * -9.27732332e-22 +
                     dVar136 * 2.30081632e-18 +
                     dVar137 * -1.99591964e-15 + dVar49 * 7.05332819e-13 + 1.5;
            c_R[2] = local_508 * 2.11265971e-12 +
                     dVar136 * -6.12806624e-09 +
                     dVar137 * 6.64306396e-06 + dVar49 * -0.00327931884 + 2.1682671;
            c_R[3] = local_508 * 3.24372837e-12 +
                     dVar136 * -9.68129509e-09 +
                     dVar137 * 9.84730201e-06 + dVar49 * -0.00299673416 + 2.78245636;
            c_R[4] = local_508 * 1.3641147e-12 +
                     dVar136 * -3.88113333e-09 +
                     dVar137 * 4.61793841e-06 + dVar49 * -0.00240131752 + 2.99201543;
            c_R[5] = local_508 * 1.77197817e-12 +
                     dVar136 * -5.48797062e-09 +
                     dVar137 * 6.52040211e-06 + dVar49 * -0.0020364341 + 3.19864056;
            c_R[6] = local_508 * 9.29225124e-12 +
                     dVar136 * -2.42763894e-08 +
                     dVar137 * 2.11582891e-05 + dVar49 * -0.00474912051 + 3.30179801;
            c_R[7] = local_508 * 1.68741719e-12 +
                     dVar136 * -3.85091153e-09 +
                     dVar137 * 2.79489841e-06 + dVar49 * 0.000968872143 + 2.76267867;
            c_R[8] = local_508 * 1.94314737e-12 +
                     dVar136 * -6.68815981e-09 +
                     dVar137 * 8.2329622e-06 + dVar49 * -0.00236661419 + 3.19860411;
            c_R[9] = local_508 * 2.54385734e-12 +
                     dVar136 * -6.87117425e-09 +
                     dVar137 * 5.73021856e-06 + dVar49 * 0.00201095175 + 2.6735904;
            c_R[10] = local_508 * 1.66693956e-11 +
                      dVar136 * -4.84743026e-08 +
                      dVar137 * 4.91800599e-05 + dVar49 * -0.0136709788 + 4.14987613;
            c_R[0xb] = local_508 * -9.04424499e-13 +
                       dVar136 * 9.07005884e-10 +
                       dVar137 * 1.01681433e-06 + dVar49 * -0.00061035368 + 2.57953347;
            c_R[0xc] = local_508 * -1.43699548e-13 +
                       dVar136 * 2.45919022e-09 +
                       dVar137 * -7.12356269e-06 + dVar49 * 0.00898459677 + 1.35677352;
            c_R[0xd] = local_508 * 4.33768865e-12 +
                       dVar136 * -1.33144093e-08 +
                       dVar137 * 1.37799446e-05 + dVar49 * -0.00324392532 + 3.22118584;
            c_R[0xe] = local_508 * 1.31772652e-11 +
                       dVar136 * -3.79285261e-08 +
                       dVar137 * 3.73220008e-05 + dVar49 * -0.00990833369 + 3.79372315;
            c_R[0xf] = local_508 * 2.07561e-12 +
                       dVar136 * -7.377636e-09 +
                       dVar137 * 5.338472e-06 + dVar49 * 0.007216595 + 1.106204;
            c_R[0x10] = local_508 * 2.69884373e-11 +
                        dVar136 * -6.91588753e-08 +
                        dVar137 * 5.70990292e-05 + dVar49 * -0.00757052247 + 2.95920148;
            c_R[0x11] = local_508 * 2.30509004e-11 +
                        dVar136 * -5.99126606e-08 +
                        dVar137 * 4.97142807e-05 + dVar49 * -0.00418658892 + 3.30646568;
            c_R[0x12] = local_508 * 2.68685771e-11 +
                        dVar136 * -7.08466285e-08 +
                        dVar137 * 5.99438288e-05 + dVar49 * -0.0055015427 + 3.29142492;
            dVar117 = dVar136 * 5.641515e-09 +
                      dVar137 * -3.963222e-06 + dVar49 * 0.0014082404 + 2.298677;
            dVar121 = local_508 * -2.444854e-12;
          }
          c_R[0x13] = dVar121 + dVar117;
          c_R[0x14] = dVar19 + 1.5 + dVar138 + local_4d8 + dVar139;
          if (1000.0 <= dVar49) {
            dcRdT[0] = dVar136 * 8.01021504e-14 +
                       dVar137 * -5.38699182e-10 + dVar49 * 9.98913556e-07 + -4.94024731e-05;
            dcRdT[1] = dVar136 * 1.99278943e-21 +
                       dVar137 * -1.42054571e-17 + dVar49 * 3.23123896e-14 + -2.30842973e-11;
            dcRdT[2] = dVar136 * 4.91334764e-15 +
                       dVar137 * -3.00533397e-11 + dVar49 * 8.38969178e-08 + -8.59741137e-05;
            dcRdT[3] = dVar136 * -8.66871176e-14 +
                       dVar137 * 6.28411665e-10 + dVar49 * -1.51593334e-06 + 0.00148308754;
            dcRdT[4] = dVar136 * 4.69649504e-14 +
                       dVar137 * -2.63838467e-10 + dVar49 * 2.53010456e-07 + 0.000548429716;
            dcRdT[5] = dVar136 * 6.72803968e-14 +
                       dVar137 * -2.91125961e-10 + dVar49 * -3.28145036e-07 + 0.00217691804;
            dcRdT[6] = dVar136 * -4.3163414e-14 +
                       dVar137 * 3.4273911e-10 + dVar49 * -1.2673163e-06 + 0.00223982013;
            dcRdT[7] = dVar136 * -7.50910268e-14 +
                       dVar137 * 7.80538647e-10 + dVar49 * -2.81789194e-06 + 0.00365639292;
            dcRdT[8] = dVar136 * -1.35886546e-13 +
                       dVar137 * 1.253718e-09 + dVar49 * -4.02383894e-06 + 0.00465588637;
            dcRdT[9] = dVar136 * -1.86861758e-13 +
                       dVar137 * 1.78705393e-09 + dVar49 * -5.97428696e-06 + 0.00723990037;
            dcRdT[10] = dVar136 * -4.0726092e-13 +
                        dVar137 * 3.66877605e-09 + dVar49 * -1.14657162e-05 + 0.0133909467;
            dcRdT[0xb] = dVar136 * -8.14590864e-14 +
                         dVar137 * 6.90159024e-10 + dVar49 * -1.99765154e-06 + 0.00206252743;
            dcRdT[0xc] = dVar136 * -1.88833666e-13 +
                         dVar137 * 1.57047056e-09 + dVar49 * -4.42962808e-06 + 0.00441437026;
            dcRdT[0xd] = dVar136 * -2.13403484e-13 +
                         dVar137 * 1.76748533e-09 + dVar49 * -4.96891226e-06 + 0.00495695526;
            dcRdT[0xe] = dVar136 * -3.53542256e-13 +
                         dVar137 * 3.01923636e-09 + dVar49 * -8.84517626e-06 + 0.00920000082;
            dcRdT[0xf] = dVar136 * -8.450464e-14 +
                         dVar137 * 1.1833293e-09 + dVar49 * -5.312768e-06 + 0.007871497;
            dcRdT[0x10] = dVar136 * -5.02824244e-13 +
                          dVar137 * 4.41668769e-09 + dVar49 * -1.34215583e-05 + 0.0146454151;
            dVar121 = dVar136 * -5.98566304e-13 +
                      dVar137 * 5.25653067e-09 + dVar49 * -1.59641334e-05 + 0.0173972722;
            auVar78._8_4_ = SUB84(dVar121,0);
            auVar78._0_8_ = dcRdT[0x10];
            auVar78._12_4_ = (int)((ulong)dVar121 >> 0x20);
            dcRdT[0x11] = (Real)auVar78._8_8_;
            dcRdT[0x12] = dVar136 * -7.6001156e-13 +
                          dVar137 * 6.64236003e-09 + dVar49 * -2.00512134e-05 + 0.0216852677;
            dVar117 = dVar137 * 3.0291114e-10 + dVar49 * -1.136952e-06 + 0.0014879768;
            dVar121 = dVar136 * -2.7013404e-14;
          }
          else {
            dcRdT[0] = dVar136 * -2.95044704e-11 +
                       dVar137 * 6.04716282e-08 + dVar49 * -3.8956302e-05 + 0.00798052075;
            dcRdT[1] = dVar136 * -3.71092933e-21 +
                       dVar137 * 6.90244896e-18 + dVar49 * -3.99183928e-15 + 7.05332819e-13;
            dcRdT[2] = dVar136 * 8.45063884e-12 +
                       dVar137 * -1.83841987e-08 + dVar49 * 1.32861279e-05 + -0.00327931884;
            dcRdT[3] = dVar136 * 1.29749135e-11 +
                       dVar137 * -2.90438853e-08 + dVar49 * 1.9694604e-05 + -0.00299673416;
            dcRdT[4] = dVar136 * 5.4564588e-12 +
                       dVar137 * -1.16434e-08 + dVar49 * 9.23587682e-06 + -0.00240131752;
            dcRdT[5] = dVar136 * 7.08791268e-12 +
                       dVar137 * -1.64639119e-08 + dVar49 * 1.30408042e-05 + -0.0020364341;
            dcRdT[6] = dVar136 * 3.7169005e-11 +
                       dVar137 * -7.28291682e-08 + dVar49 * 4.23165782e-05 + -0.00474912051;
            dcRdT[7] = dVar136 * 6.74966876e-12 +
                       dVar137 * -1.15527346e-08 + dVar49 * 5.58979682e-06 + 0.000968872143;
            dcRdT[8] = dVar136 * 7.77258948e-12 +
                       dVar137 * -2.00644794e-08 + dVar49 * 1.64659244e-05 + -0.00236661419;
            dcRdT[9] = dVar136 * 1.01754294e-11 +
                       dVar137 * -2.06135228e-08 + dVar49 * 1.14604371e-05 + 0.00201095175;
            dcRdT[10] = dVar136 * 6.66775824e-11 +
                        dVar137 * -1.45422908e-07 + dVar49 * 9.83601198e-05 + -0.0136709788;
            dcRdT[0xb] = dVar136 * -3.617698e-12 +
                         dVar137 * 2.72101765e-09 + dVar49 * 2.03362866e-06 + -0.00061035368;
            dcRdT[0xc] = dVar136 * -5.74798192e-13 +
                         dVar137 * 7.37757066e-09 + dVar49 * -1.42471254e-05 + 0.00898459677;
            dcRdT[0xd] = dVar136 * 1.73507546e-11 +
                         dVar137 * -3.99432279e-08 + dVar49 * 2.75598892e-05 + -0.00324392532;
            dcRdT[0xe] = dVar136 * 5.27090608e-11 +
                         dVar137 * -1.13785578e-07 + dVar49 * 7.46440016e-05 + -0.00990833369;
            dcRdT[0xf] = dVar136 * 8.30244e-12 +
                         dVar137 * -2.2132908e-08 + dVar49 * 1.0676944e-05 + 0.007216595;
            dcRdT[0x10] = dVar136 * 1.07953749e-10 +
                          dVar137 * -2.07476626e-07 + dVar49 * 0.000114198058 + -0.00757052247;
            dVar121 = dVar136 * 9.22036016e-11 +
                      dVar137 * -1.79737982e-07 + dVar49 * 9.94285614e-05 + -0.00418658892;
            auVar77._8_4_ = SUB84(dVar121,0);
            auVar77._0_8_ = dcRdT[0x10];
            auVar77._12_4_ = (int)((ulong)dVar121 >> 0x20);
            dcRdT[0x11] = (Real)auVar77._8_8_;
            dcRdT[0x12] = dVar136 * 1.07474308e-10 +
                          dVar137 * -2.12539886e-07 + dVar49 * 0.000119887658 + -0.0055015427;
            dVar117 = dVar137 * 1.6924545e-08 + dVar49 * -7.926444e-06 + 0.0014082404;
            dVar121 = dVar136 * -9.779416e-12;
          }
          dcRdT[0x13] = dVar121 + dVar117;
          dcRdT[0x14] = dVar19 + 0.0 + dVar138 + local_4d8;
          if (1000.0 <= dVar49) {
            dVar121 = dVar135 * 25473.6599 +
                      local_508 * 9.96394714e-23 +
                      dVar136 * -1.18378809e-18 +
                      dVar137 * 5.38539827e-15 + dVar49 * -1.15421486e-11 + 1.50000001;
            local_2e8._8_4_ = SUB84(dVar121,0);
            local_2e8._0_8_ =
                 dVar135 * -950.158922 +
                 local_508 * 4.00510752e-15 +
                 dVar136 * -4.48915985e-11 +
                 dVar137 * 1.66485593e-07 + dVar49 * -2.47012365e-05 + 2.3372792;
            local_2e8._12_4_ = (int)((ulong)dVar121 >> 0x20);
            local_2d8 = dVar135 * 29217.5791 +
                        local_508 * 2.45667382e-16 +
                        dVar136 * -2.50444497e-12 +
                        dVar137 * 1.39828196e-08 + dVar49 * -4.29870569e-05 + 1.56942078;
            dStack_2d0 = dVar135 * -1088.45772 +
                         local_508 * -4.33435588e-15 +
                         dVar136 * 5.23676387e-11 +
                         dVar137 * -2.52655556e-07 + dVar49 * 0.00074154377 + 2.28253784;
            local_2c8 = dVar135 * 3858.657 +
                        local_508 * 2.34824752e-15 +
                        dVar136 * -2.19865389e-11 +
                        dVar137 * 4.21684093e-08 + dVar49 * 0.000274214858 + 2.09288767;
            dStack_2c0 = dVar135 * -30004.2971 +
                         local_508 * 3.36401984e-15 +
                         dVar136 * -2.42604967e-11 +
                         dVar137 * -5.46908393e-08 + dVar49 * 0.00108845902 + 2.03399249;
            local_2b8 = dVar135 * 111.856713 +
                        local_508 * -2.1581707e-15 +
                        dVar136 * 2.85615925e-11 +
                        dVar137 * -2.11219383e-07 + dVar49 * 0.00111991006 + 3.0172109;
            dStack_2b0 = dVar135 * 46263.604 +
                         local_508 * -3.75455134e-15 +
                         dVar136 * 6.50448872e-11 +
                         dVar137 * -4.69648657e-07 + dVar49 * 0.00182819646 + 1.87410113;
            local_2a8 = dVar135 * 50925.9997 +
                        local_508 * -6.7943273e-15 +
                        dVar136 * 1.044765e-10 +
                        dVar137 * -6.70639823e-07 + dVar49 * 0.00232794318 + 1.29203842;
            dStack_2a0 = dVar135 * 16775.5843 +
                         local_508 * -9.34308788e-15 +
                         dVar136 * 1.48921161e-10 +
                         dVar137 * -9.95714493e-07 + dVar49 * 0.00361995018 + 1.28571772;
            local_298 = dVar135 * -9468.34459 +
                        local_508 * -2.0363046e-14 +
                        dVar136 * 3.05731338e-10 +
                        dVar137 * -1.9109527e-06 + dVar49 * 0.00669547335 + -0.925148505;
            dStack_290 = dVar135 * -14151.8724 +
                         local_508 * -4.07295432e-15 +
                         dVar136 * 5.7513252e-11 +
                         dVar137 * -3.32941924e-07 + dVar49 * 0.00103126372 + 1.71518561;
            local_288 = dVar135 * -48759.166 +
                        local_508 * -9.44168328e-15 +
                        dVar136 * 1.30872547e-10 +
                        dVar137 * -7.38271347e-07 + dVar49 * 0.00220718513 + 2.85746029;
            dStack_280 = dVar135 * 4011.91815 +
                         local_508 * -1.06701742e-14 +
                         dVar136 * 1.47290445e-10 +
                         dVar137 * -8.28152043e-07 + dVar49 * 0.00247847763 + 1.77217438;
            local_278 = dVar135 * -13995.8323 +
                        local_508 * -1.76771128e-14 +
                        dVar136 * 2.5160303e-10 +
                        dVar137 * -1.47419604e-06 + dVar49 * 0.00460000041 + 0.76069008;
            dStack_270 = dVar135 * 127.83252 +
                         local_508 * -4.225232e-15 +
                         dVar136 * 9.8610775e-11 +
                         dVar137 * -8.85461333e-07 + dVar49 * 0.0039357485 + 2.770799;
            local_268 = dVar135 * 4939.88614 +
                        local_508 * -2.51412122e-14 +
                        dVar136 * 3.68057308e-10 +
                        dVar137 * -2.23692638e-06 + dVar49 * 0.00732270755 + 1.03611116;
            dStack_260 = dVar135 * 12857.52 +
                         local_508 * -2.99283152e-14 +
                         dVar136 * 4.38044223e-10 +
                         dVar137 * -2.66068889e-06 + dVar49 * 0.0086986361 + 0.95465642;
            local_258 = dVar135 * -11426.3932 +
                        local_508 * -3.8000578e-14 +
                        dVar136 * 5.53530003e-10 +
                        dVar137 * -3.3418689e-06 + dVar49 * 0.0108426339 + 0.0718815;
            dVar117 = local_508 * -1.3506702e-15 +
                      dVar136 * 2.5242595e-11 +
                      dVar137 * -1.89492e-07 + dVar49 * 0.0007439884 + 1.92664;
            dVar121 = dVar135 * -922.7977;
          }
          else {
            dVar121 = dVar135 * 25473.6599 +
                      local_508 * -1.85546466e-22 +
                      dVar136 * 5.7520408e-19 +
                      dVar137 * -6.65306547e-16 + dVar49 * 3.52666409e-13 + 1.5;
            local_2e8._8_4_ = SUB84(dVar121,0);
            local_2e8._0_8_ =
                 dVar135 * -917.935173 +
                 local_508 * -1.47522352e-12 +
                 dVar136 * 5.03930235e-09 +
                 dVar137 * -6.492717e-06 + dVar49 * 0.00399026037 + 1.34433112;
            local_2e8._12_4_ = (int)((ulong)dVar121 >> 0x20);
            local_2d8 = dVar135 * 29122.2592 +
                        local_508 * 4.22531942e-13 +
                        dVar136 * -1.53201656e-09 +
                        dVar137 * 2.21435465e-06 + dVar49 * -0.00163965942 + 2.1682671;
            dStack_2d0 = dVar135 * -1063.94356 +
                         local_508 * 6.48745674e-13 +
                         dVar136 * -2.42032377e-09 +
                         dVar137 * 3.282434e-06 + dVar49 * -0.00149836708 + 2.78245636;
            local_2c8 = dVar135 * 3615.08056 +
                        local_508 * 2.7282294e-13 +
                        dVar136 * -9.70283332e-10 +
                        dVar137 * 1.5393128e-06 + dVar49 * -0.00120065876 + 2.99201543;
            dStack_2c0 = dVar135 * -30293.7267 +
                         local_508 * 3.54395634e-13 +
                         dVar136 * -1.37199266e-09 +
                         dVar137 * 2.17346737e-06 + dVar49 * -0.00101821705 + 3.19864056;
            local_2b8 = dVar135 * 294.80804 +
                        local_508 * 1.85845025e-12 +
                        dVar136 * -6.06909735e-09 +
                        dVar137 * 7.05276303e-06 + dVar49 * -0.00237456025 + 3.30179801;
            dStack_2b0 = dVar135 * 46004.0401 +
                         local_508 * 3.37483438e-13 +
                         dVar136 * -9.62727883e-10 +
                         dVar137 * 9.31632803e-07 + dVar49 * 0.000484436072 + 2.76267867;
            local_2a8 = dVar135 * 50496.8163 +
                        local_508 * 3.88629474e-13 +
                        dVar136 * -1.67203995e-09 +
                        dVar137 * 2.74432073e-06 + dVar49 * -0.0011833071 + 3.19860411;
            dStack_2a0 = dVar135 * 16444.9988 +
                         local_508 * 5.08771468e-13 +
                         dVar136 * -1.71779356e-09 +
                         dVar137 * 1.91007285e-06 + dVar49 * 0.00100547588 + 2.6735904;
            local_298 = dVar135 * -10246.6476 +
                        local_508 * 3.33387912e-12 +
                        dVar136 * -1.21185757e-08 +
                        dVar137 * 1.63933533e-05 + dVar49 * -0.0068354894 + 4.14987613;
            dStack_290 = dVar135 * -14344.086 +
                         local_508 * -1.808849e-13 +
                         dVar136 * 2.26751471e-10 +
                         dVar137 * 3.3893811e-07 + dVar49 * -0.00030517684 + 2.57953347;
            local_288 = dVar135 * -48371.9697 +
                        local_508 * -2.87399096e-14 +
                        dVar136 * 6.14797555e-10 +
                        dVar137 * -2.3745209e-06 + dVar49 * 0.00449229839 + 1.35677352;
            dStack_280 = dVar135 * 3839.56496 +
                         local_508 * 8.6753773e-13 +
                         dVar136 * -3.32860233e-09 +
                         dVar137 * 4.59331487e-06 + dVar49 * -0.00162196266 + 3.22118584;
            local_278 = dVar135 * -14308.9567 +
                        local_508 * 2.63545304e-12 +
                        dVar136 * -9.48213152e-09 +
                        dVar137 * 1.24406669e-05 + dVar49 * -0.00495416684 + 3.79372315;
            dStack_270 = dVar135 * 978.6011 +
                         local_508 * 4.15122e-13 +
                         dVar136 * -1.844409e-09 +
                         dVar137 * 1.77949067e-06 + dVar49 * 0.0036082975 + 1.106204;
            local_268 = dVar135 * 5089.77593 +
                        local_508 * 5.39768746e-12 +
                        dVar136 * -1.72897188e-08 +
                        dVar137 * 1.90330097e-05 + dVar49 * -0.00378526124 + 2.95920148;
            dStack_260 = dVar135 * 12841.6265 +
                         local_508 * 4.61018008e-12 +
                         dVar136 * -1.49781651e-08 +
                         dVar137 * 1.65714269e-05 + dVar49 * -0.00209329446 + 3.30646568;
            local_258 = dVar135 * -11522.2055 +
                        local_508 * 5.37371542e-12 +
                        dVar136 * -1.77116571e-08 +
                        dVar137 * 1.99812763e-05 + dVar49 * -0.00275077135 + 3.29142492;
            dVar117 = local_508 * -4.889708e-13 +
                      dVar136 * 1.41037875e-09 +
                      dVar137 * -1.321074e-06 + dVar49 * 0.0007041202 + 2.298677;
            dVar121 = dVar135 * -1020.8999;
          }
          local_250 = dVar121 + dVar117;
          local_248 = dVar135 * -745.375 + dVar139 + local_4d8 + dVar138 + dVar19 + 1.5;
          pRVar94 = (Real *)local_2e8;
        }
        dVar121 = 0.0;
        dVar117 = 0.0;
        dVar123 = 0.0;
        dVar136 = 0.0;
        for (lVar90 = 0; lVar90 != 0xa8; lVar90 = lVar90 + 8) {
          dVar123 = dVar123 + *(double *)((long)dcRdT + lVar90) *
                              *(double *)((long)local_858 + lVar90);
          dVar131 = *(double *)((long)pRVar94 + lVar90);
          dVar121 = dVar121 + *(double *)((long)local_858 + lVar90) *
                              *(double *)((long)c_R + lVar90);
          dVar117 = dVar117 + *(double *)((long)local_978 + lVar90) * dVar131;
          dVar136 = dVar136 + (*(double *)((long)c_R + lVar90) - dVar131) * dVar135 *
                              *(double *)((long)local_978 + lVar90) +
                              dVar131 * *(double *)((long)pdVar6 + lVar90 + 0xe70);
        }
        dVar117 = dVar117 * (1.0 / dVar121);
        dVar121 = (1.0 / dVar121) * dVar49;
        dVar131 = dVar117 * dVar121;
        dVar121 = -dVar121;
        pdVar93 = pdVar6 + 0x15;
        pdVar92 = pdVar6;
        for (lVar90 = 0; lVar90 != 0x15; lVar90 = lVar90 + 1) {
          dVar135 = 0.0;
          for (lVar97 = 0; lVar97 != 0x15; lVar97 = lVar97 + 1) {
            dVar135 = dVar135 + pRVar94[lVar97] * pdVar92[lVar97];
          }
          pdVar93[lVar90 * 0x16] = c_R[lVar90] * dVar131 + dVar135 * dVar121;
          pdVar92 = pdVar92 + 0x16;
        }
        pdVar6[0x1e3] = dVar121 * dVar136 + (dVar131 * dVar123 - dVar117);
        for (lVar90 = 0; lVar90 != 0x15; lVar90 = lVar90 + 1) {
          pdVar6[lVar90 + 0x1ce] = pdVar6[lVar90 + 0x1ce] * 1e-06;
          *pdVar93 = *pdVar93 * 1000000.0;
          pdVar93 = pdVar93 + 0x16;
        }
        pdVar6 = *(double **)(lVar3 + uVar98 * 8);
        pdVar93 = pdVar6;
        for (lVar90 = 0; lVar90 != 0x15; lVar90 = lVar90 + 1) {
          dVar121 = local_238[lVar90];
          pdVar92 = pdVar93;
          for (lVar97 = 0; lVar97 != 0x15; lVar97 = lVar97 + 1) {
            *pdVar92 = (dVar121 / local_238[lVar97]) * *pdVar92;
            pdVar92 = pdVar92 + 0x16;
          }
          pdVar6[lVar90 * 0x16 + 0x15] = pdVar6[lVar90 * 0x16 + 0x15] / dVar121;
          pdVar93 = pdVar93 + 1;
        }
        for (lVar90 = 0; local_a98 = dVar49, lVar90 != 0x15; lVar90 = lVar90 + 1) {
          pdVar6[lVar90 + 0x1ce] = local_238[lVar90] * pdVar6[lVar90 + 0x1ce];
        }
      }
      local_4c8 = local_4c8 + 0x16;
      dVar121 = (double)local_4e8._0_8_;
    }
    uVar95 = 1;
  }
  else {
    uVar95 = 0;
    if ((int)uVar1 < 1) {
      uVar1 = uVar95;
    }
    uVar102 = (ulong)uVar1;
  }
  *jcurPtr = uVar95;
  lVar90 = *local_4c0;
  for (lVar97 = 1; lVar97 != 0x17; lVar97 = lVar97 + 1) {
    iVar2 = *(int *)(lVar90 + -4 + lVar97 * 4);
    iVar100 = *(int *)(lVar90 + lVar97 * 4) - iVar2;
    iVar101 = 0;
    if (iVar100 < 1) {
      iVar100 = iVar101;
    }
    for (; iVar101 != iVar100; iVar101 = iVar101 + 1) {
      uVar1 = *(uint *)(*plVar4 + (long)(iVar2 + iVar101) * 4);
      for (uVar98 = 0; uVar102 != uVar98; uVar98 = uVar98 + 1) {
        lVar96 = *(long *)(lVar3 + uVar98 * 8);
        if (lVar97 - 1U == (ulong)uVar1) {
          dVar49 = *(double *)(lVar96 + (long)(int)uVar1 * 0xb8) * -dVar121 + 1.0;
        }
        else {
          dVar49 = *(double *)(lVar96 + (lVar97 - 1U) * 8 + (long)(int)uVar1 * 0xb0) * -dVar121;
        }
        *(double *)
         (*(long *)(lVar5 + uVar98 * 8) +
         ((long)*(int *)(local_4c0[uVar98] + -4 + lVar97 * 4) + (long)iVar101) * 8) = dVar49;
      }
    }
  }
  return 0;
}

Assistant:

int
Precond_custom(
  amrex::Real /* tn */,
  N_Vector u,
  N_Vector /* fu */,
  booleantype jok,
  booleantype* jcurPtr,
  amrex::Real gamma,
  void* user_data)
{
  BL_PROFILE("Pele::ReactorCvode::Precond_custom()");
  // Make local copies of pointers to input data
  amrex::Real* u_d = N_VGetArrayPointer(u);

  // Make local copies of pointers in user_data
  auto* udata = static_cast<CVODEUserData*>(user_data);
  auto ncells = udata->ncells;
  auto reactor_type = udata->reactor_type;
  auto* JSPSmat = udata->JSPSmat;
  auto* rowPtrs = udata->rowPtrs;
  auto* colVals = udata->colVals;
  auto* Jdata = udata->Jdata;

  // MW CGS
  amrex::Real mw[NUM_SPECIES] = {0.0};
  get_mw(mw);

  // Check if Jac is stale
  if (jok != 0) {
    // jok = SUNTRUE: Copy Jbd to P
    *jcurPtr = SUNFALSE;
  } else {
    // Save Jac from cell to cell if more than one
    amrex::Real temp_save_lcl = 0.0;
    for (int tid = 0; tid < ncells; tid++) {
      // Offset in case several cells
      int offset = tid * (NUM_SPECIES + 1);
      // rho MKS
      amrex::Real rho = 0.0;
      for (int i = 0; i < NUM_SPECIES; i++) {
        rho = rho + u_d[offset + i];
      }
      // Yks
      amrex::Real massfrac[NUM_SPECIES] = {0.0};
      amrex::Real rhoinv = 1.0 / rho;
      for (int i = 0; i < NUM_SPECIES; i++) {
        massfrac[i] = u_d[offset + i] * rhoinv;
      }
      amrex::Real temp = u_d[offset + NUM_SPECIES];
      // Activities
      amrex::Real activity[NUM_SPECIES] = {0.0};
      auto eos = pele::physics::PhysicsType::eos();
      eos.RTY2C(rho, temp, massfrac, activity);

      // Do we recompute Jac ?
      if (fabs(temp - temp_save_lcl) > 1.0) {
        // Formalism
        int consP =
          static_cast<int>(reactor_type == ReactorTypes::h_reactor_type);
        DWDOT_SIMPLIFIED(JSPSmat[tid], activity, &temp, &consP);

        for (int i = 0; i < NUM_SPECIES; i++) {
          for (int k = 0; k < NUM_SPECIES; k++) {
            (JSPSmat[tid])[k * (NUM_SPECIES + 1) + i] *= mw[i] / mw[k];
          }
          (JSPSmat[tid])[i * (NUM_SPECIES + 1) + NUM_SPECIES] /= mw[i];
        }
        for (int i = 0; i < NUM_SPECIES; i++) {
          (JSPSmat[tid])[NUM_SPECIES * (NUM_SPECIES + 1) + i] *= mw[i];
        }
        temp_save_lcl = temp;
      } else {
        // if not: copy the one from prev cell
        for (int i = 0; i < NUM_SPECIES + 1; i++) {
          for (int k = 0; k < NUM_SPECIES + 1; k++) {
            (JSPSmat[tid])[k * (NUM_SPECIES + 1) + i] =
              (JSPSmat[tid - 1])[k * (NUM_SPECIES + 1) + i];
          }
        }
      }
    }
    *jcurPtr = SUNTRUE;
  }

  for (int i = 1; i < NUM_SPECIES + 2; i++) {
    // nb non zeros elem should be the same for all cells
    int nbVals = rowPtrs[0][i] - rowPtrs[0][i - 1];
    for (int j = 0; j < nbVals; j++) {
      // row of non zero elem should be the same for all cells
      int idx = colVals[0][rowPtrs[0][i - 1] + j];
      // Scale by -gamma
      // Add identity matrix
      for (int tid = 0; tid < ncells; tid++) {
        if (idx == (i - 1)) {
          Jdata[tid][rowPtrs[tid][i - 1] + j] =
            1.0 - gamma * (JSPSmat[tid])[idx * (NUM_SPECIES + 1) + idx];
        } else {
          Jdata[tid][rowPtrs[tid][i - 1] + j] =
            -gamma * (JSPSmat[tid])[(i - 1) + (NUM_SPECIES + 1) * idx];
        }
      }
    }
  }

  return (0);
}